

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint *puVar1;
  symbol_codec *this;
  uint8 **ppuVar2;
  uint8 **ppuVar3;
  unsigned_short *puVar4;
  byte bVar5;
  ushort uVar6;
  ulong *puVar7;
  undefined1 *puVar8;
  long lVar9;
  long lVar10;
  byte *__dest;
  uint8 *puVar11;
  size_t sVar12;
  symbol_codec *psVar13;
  lzham_decompress_status_t lVar14;
  uint uVar15;
  ushort *puVar16;
  ulong uVar17;
  uint64 uVar18;
  adaptive_bit_model *paVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 uVar23;
  uint uVar24;
  undefined1 *puVar25;
  decoder_tables *pdVar26;
  undefined1 *puVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  char cVar31;
  void *pvVar32;
  byte *pbVar33;
  byte *pbVar34;
  undefined1 uVar35;
  int iVar36;
  lzham_decompressor *pState;
  quasi_adaptive_huffman_data_model *pqVar37;
  undefined4 uVar38;
  uint uVar39;
  lzham_decompressor *plVar40;
  lzham_decompressor *plVar41;
  uint uVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  bit_buf_t bVar47;
  bit_buf_t bVar48;
  int iVar49;
  size_t sVar50;
  long lVar51;
  size_t sVar52;
  uint uVar53;
  bool bVar54;
  int iStack_a4;
  undefined8 uStack_a0;
  int iStack_8c;
  uint uStack_88;
  uint uStack_84;
  undefined8 uStack_80;
  undefined8 uStack_78;
  uint uStack_6c;
  undefined8 uStack_68;
  undefined8 uStack_58;
  uint uStack_4c;
  ulong uStack_40;
  
  if (((((p == (lzham_decompress_state_ptr)0x0) || (pOut_buf_size == (size_t *)0x0)) ||
       (pIn_buf_size == (size_t *)0x0)) || (*(int *)((long)p + 0x13c) == 0)) ||
     (((pIn_buf == (lzham_uint8 *)0x0 && (*pIn_buf_size != 0)) ||
      ((pOut_buf == (lzham_uint8 *)0x0 && (*pOut_buf_size != 0)))))) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  *(lzham_uint8 **)((long)p + 0x100) = pIn_buf;
  *(size_t **)((long)p + 0x108) = pIn_buf_size;
  *(lzham_uint8 **)((long)p + 0x110) = pOut_buf;
  *(size_t **)((long)p + 0x118) = pOut_buf_size;
  *(bool *)((long)p + 0x120) = no_more_input_bytes_flag != 0;
  if ((*(uint *)((long)p + 0x144) & 1) != 0) {
    if (*(lzham_uint8 **)((long)p + 0x128) == (lzham_uint8 *)0x0) {
      *(lzham_uint8 **)((long)p + 0x128) = pOut_buf;
      *(size_t *)((long)p + 0x130) = *pOut_buf_size;
    }
    else {
      if (*(lzham_uint8 **)((long)p + 0x128) != pOut_buf) {
        return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }
      if (*(size_t *)((long)p + 0x130) != *pOut_buf_size) {
        return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }
    }
    if ((*(uint *)((long)p + 0x144) & 1) == 0) {
      lVar14 = lzham_decompressor::decompress<false>((lzham_decompressor *)p);
      return lVar14;
    }
    puVar7 = *(ulong **)((long)p + 0x118);
    uVar43 = *puVar7;
    puVar8 = *(undefined1 **)((long)p + 0x110);
    iVar45 = *(int *)((long)p + 8);
    if (iVar45 < 0x318) {
      if (iVar45 < 0x22b) {
        if (iVar45 < 0x1e2) {
          if (iVar45 < 0x19a) {
            if (iVar45 == 0) {
              bVar54 = symbol_codec::start_decoding
                                 ((symbol_codec *)((long)p + 0x18),*(uint8 **)((long)p + 0x100),
                                  **(size_t **)((long)p + 0x108),*(bool *)((long)p + 0x120),
                                  (need_bytes_func_ptr)0x0,(void *)0x0);
              uStack_40 = 0;
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              uStack_68 = *(ulong *)((long)p + 0xb8);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              uVar28 = 0;
              uVar23 = 0;
              uVar38 = 0;
              iVar36 = 0;
              iVar45 = 0;
              uStack_80 = (uint *)0x0;
              uStack_84 = 0;
              uStack_78._0_4_ = 0;
              uStack_78._4_4_ = 0;
              if ((*(byte *)((long)p + 0x144) & 4) != 0) goto LAB_0010941f;
LAB_0010957d:
              uVar15 = *(uint *)((long)p + 0x158);
              uVar53 = *(uint *)((long)p + 0x15c);
              if (uVar53 == 0 && uVar15 == 0) {
                uVar28 = *(uint *)((long)p + 0x140);
                uVar29 = 0x14;
                if (uVar28 < 0x14) {
                  uVar29 = uVar28;
                }
                uVar22 = 7;
                if (uVar28 != 0) {
                  uVar22 = (ulong)(uVar29 - 1);
                }
                uVar15 = (uint)*(ushort *)(g_table_update_settings + uVar22 * 4);
                uVar53 = (uint)*(ushort *)(g_table_update_settings + uVar22 * 4 + 2);
              }
              bVar54 = quasi_adaptive_huffman_data_model::init2
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x168),*p,false,
                                  0x100,uVar15,uVar53,(uint16 *)0x0);
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar54 = quasi_adaptive_huffman_data_model::assign
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x1f8),
                                  (quasi_adaptive_huffman_data_model *)((long)p + 0x168));
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar54 = quasi_adaptive_huffman_data_model::init2
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x288),*p,false,
                                  *(int *)((long)p + 0x14) * 8 - 6,uVar15,uVar53,(uint16 *)0x0);
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar54 = quasi_adaptive_huffman_data_model::init2
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x318),*p,false,
                                  0x101,uVar15,uVar53,(uint16 *)0x0);
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar54 = quasi_adaptive_huffman_data_model::assign
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x3a8),
                                  (quasi_adaptive_huffman_data_model *)((long)p + 0x318));
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar54 = quasi_adaptive_huffman_data_model::init2
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x438),*p,false,
                                  0xfa,uVar15,uVar53,(uint16 *)0x0);
              if (!bVar54) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar54 = quasi_adaptive_huffman_data_model::assign
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x4c8),
                                  (quasi_adaptive_huffman_data_model *)((long)p + 0x438));
              if (bVar54) {
                bVar54 = quasi_adaptive_huffman_data_model::init2
                                   ((quasi_adaptive_huffman_data_model *)((long)p + 0x558),*p,false,
                                    0x10,uVar15,uVar53,(uint16 *)0x0);
                if (bVar54) goto LAB_0010a117;
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            if (iVar45 == 0x188) {
              lVar51 = *(long *)((long)p + 0x100);
              lVar9 = **(long **)((long)p + 0x108);
              *(long *)((long)p + 0x20) = lVar51;
              *(long *)((long)p + 0x28) = lVar51;
              *(long *)((long)p + 0x38) = lVar9;
              *(long *)((long)p + 0x30) = lVar51 + lVar9;
              *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
              if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
                iVar45 = *(int *)((long)p + 0x690);
                iVar36 = *(int *)((long)p + 0x694);
                uVar38 = *(undefined4 *)((long)p + 0x698);
                uVar23 = *(undefined4 *)((long)p + 0x69c);
                uVar28 = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uStack_68._0_4_ = *(undefined4 *)((long)p + 0xb8);
                uStack_68._4_4_ = *(undefined4 *)((long)p + 0xbc);
                uStack_58 = *(uint **)((long)p + 0x28);
                uVar21 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                do {
                  if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109451;
                  uVar22 = 0;
                  while( true ) {
                    cVar31 = (char)uVar46;
                    uVar46 = uVar46 + 8;
                    uVar21 = uVar21 | uVar22 << (0x38U - cVar31 & 0x3f);
LAB_0010941f:
                    if (7 < (int)uVar46) {
                      *(uint *)((long)p + 0x710) = (uint)(byte)(uVar21 >> 0x38);
                      uVar21 = uVar21 << 8;
                      iVar44 = uVar46 - 8;
                      goto LAB_001094e3;
                    }
                    if (uStack_58 == *(uint **)((long)p + 0x30)) break;
LAB_00109451:
                    uVar22 = (ulong)(byte)*uStack_58;
                    uStack_58 = (uint *)((long)uStack_58 + 1);
                  }
                } while (*(char *)((long)p + 0x40) != '\0');
                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                *(ulong *)((long)p + 0x58) = uVar21;
                *(uint *)((long)p + 0x60) = uVar46;
                *(uint **)((long)p + 0x28) = uStack_58;
                *(int *)((long)p + 0x690) = iVar45;
                *(int *)((long)p + 0x694) = iVar36;
                *(undefined4 *)((long)p + 0x698) = uVar38;
                *(undefined4 *)((long)p + 0x69c) = uVar23;
                *(uint *)((long)p + 0x6a0) = uVar28;
                *(int *)((long)p + 0x678) = (int)uStack_40;
              }
              **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x188;
            }
            else {
              if (iVar45 != 0x189) goto switchD_00105f66_caseD_458;
              lVar51 = *(long *)((long)p + 0x100);
              lVar9 = **(long **)((long)p + 0x108);
              *(long *)((long)p + 0x20) = lVar51;
              *(long *)((long)p + 0x28) = lVar51;
              *(long *)((long)p + 0x38) = lVar9;
              *(long *)((long)p + 0x30) = lVar51 + lVar9;
              *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
              if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
                iVar45 = *(int *)((long)p + 0x690);
                iVar36 = *(int *)((long)p + 0x694);
                uVar38 = *(undefined4 *)((long)p + 0x698);
                uVar23 = *(undefined4 *)((long)p + 0x69c);
                uVar28 = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uStack_68._0_4_ = *(undefined4 *)((long)p + 0xb8);
                uStack_68._4_4_ = *(undefined4 *)((long)p + 0xbc);
                uStack_58 = *(uint **)((long)p + 0x28);
                uVar21 = *(ulong *)((long)p + 0x58);
                iVar44 = *(int *)((long)p + 0x60);
                do {
                  if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010974c;
                  uVar22 = 0;
                  while( true ) {
                    cVar31 = (char)iVar44;
                    iVar44 = iVar44 + 8;
                    uVar21 = uVar21 | uVar22 << (0x38U - cVar31 & 0x3f);
LAB_001094e3:
                    if (7 < iVar44) {
                      uVar46 = (uint)(byte)(uVar21 >> 0x38);
                      *(uint *)((long)p + 0x714) = uVar46;
                      if ((*(uint *)((long)p + 0x710) & 0xf) != 0xe) {
                        return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                      }
                      if ((*(uint *)((long)p + 0x710) << 8 | uVar46) % 0x1f != 0) {
                        return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                      }
                      if ((uVar21 >> 0x38 & 0x20) != 0) {
                        return LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES;
                      }
                      uVar46 = iVar44 - 8;
                      uVar21 = uVar21 << 8;
                      uStack_80 = (uint *)CONCAT44(uVar23,uVar38);
                      uStack_84 = iVar36;
                      uStack_78._0_4_ = iVar45;
                      uStack_78._4_4_ = uVar28;
                      goto LAB_0010957d;
                    }
                    if (uStack_58 == *(uint **)((long)p + 0x30)) break;
LAB_0010974c:
                    uVar22 = (ulong)(byte)*uStack_58;
                    uStack_58 = (uint *)((long)uStack_58 + 1);
                  }
                } while (*(char *)((long)p + 0x40) != '\0');
                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                *(ulong *)((long)p + 0x58) = uVar21;
                *(int *)((long)p + 0x60) = iVar44;
                *(uint **)((long)p + 0x28) = uStack_58;
                *(int *)((long)p + 0x690) = iVar45;
                *(int *)((long)p + 0x694) = iVar36;
                *(undefined4 *)((long)p + 0x698) = uVar38;
                *(undefined4 *)((long)p + 0x69c) = uVar23;
                *(uint *)((long)p + 0x6a0) = uVar28;
                *(int *)((long)p + 0x678) = (int)uStack_40;
              }
              **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x189;
            }
          }
          else if (iVar45 < 0x1d8) {
            if (iVar45 == 0x19a) {
              lVar51 = *(long *)((long)p + 0x100);
              lVar9 = **(long **)((long)p + 0x108);
              cVar31 = *(char *)((long)p + 0x120);
              *(long *)((long)p + 0x20) = lVar51;
              *(long *)((long)p + 0x28) = lVar51;
              *(long *)((long)p + 0x38) = lVar9;
              *(long *)((long)p + 0x30) = lVar51 + lVar9;
              *(char *)((long)p + 0x40) = cVar31;
              if ((cVar31 != '\0') || (lVar9 != 0)) {
                uStack_78._0_4_ = *(int *)((long)p + 0x690);
                uStack_84 = *(int *)((long)p + 0x694);
                uStack_80 = *(uint **)((long)p + 0x698);
                uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uStack_68 = *(ulong *)((long)p + 0xb8);
                uVar22 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                uStack_58 = *(uint **)((long)p + 0x28);
                uVar28 = *(uint *)((long)p + 0x718);
                uVar29 = *(uint *)((long)p + 0x71c);
                do {
                  uVar30 = uVar29;
                  if (*(uint **)((long)p + 0x30) <= uStack_58) {
                    uVar21 = 0;
                    goto LAB_00107fce;
                  }
                  do {
                    uVar21 = (ulong)(byte)*uStack_58;
                    uStack_58 = (uint *)((long)uStack_58 + 1);
LAB_00107fce:
                    uVar22 = uVar21 << (0x38U - (char)uVar46 & 0x3f) | uVar22;
                    bVar54 = -1 < (int)uVar46;
                    uVar39 = uVar46;
                    uVar46 = uVar46 + 8;
                    if (bVar54) {
                      do {
                        uVar46 = uVar39;
                        uVar21 = uVar22 << 8;
                        uVar28 = uVar28 << 8 | (uint)(byte)(uVar22 >> 0x38);
                        uVar29 = uVar30 + 1;
                        if (3 < uVar29) {
                          *(uint *)((long)p + 0x718) = uVar28;
                          *(uint *)((long)p + 0x71c) = uVar30 + 1;
                          uVar15 = adler32(*(void **)((long)p + 0x150),
                                           (ulong)*(uint *)((long)p + 0x148),1);
                          if (uVar15 != *(uint *)((long)p + 0x718)) {
                            return LZHAM_DECOMP_STATUS_FAILED_BAD_SEED_BYTES;
                          }
                          goto LAB_0010957d;
                        }
                        uVar22 = uVar21;
                        uVar39 = uVar46 - 8;
                        uVar30 = uVar29;
                      } while (0xf < (int)(uVar46 + 8));
                      *(uint *)((long)p + 0x718) = uVar28;
                      *(uint *)((long)p + 0x71c) = uVar29;
                    }
                  } while (uStack_58 != *(uint **)((long)p + 0x30));
                } while (cVar31 != '\0');
                *(ulong *)((long)p + 0x58) = uVar22;
                *(uint *)((long)p + 0x60) = uVar46;
                *(uint **)((long)p + 0x28) = uStack_58;
              }
              **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x19a;
            }
            else {
              if (iVar45 != 0x1d2) goto switchD_00105f66_caseD_458;
              lVar51 = *(long *)((long)p + 0x100);
              lVar9 = **(long **)((long)p + 0x108);
              *(long *)((long)p + 0x20) = lVar51;
              *(long *)((long)p + 0x28) = lVar51;
              *(long *)((long)p + 0x38) = lVar9;
              *(long *)((long)p + 0x30) = lVar51 + lVar9;
              *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
              if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
                uStack_78._0_4_ = *(int *)((long)p + 0x690);
                uStack_84 = *(int *)((long)p + 0x694);
                uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
                uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
                uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
                uStack_58 = *(uint **)((long)p + 0x28);
                uVar21 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                goto LAB_001079e3;
              }
LAB_00105e6e:
              **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x1d2;
            }
          }
          else if (iVar45 == 0x1d8) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              goto LAB_0010809e;
            }
LAB_00106fe2:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1d8;
          }
          else {
            if (iVar45 != 0x1e0) goto switchD_00105f66_caseD_458;
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar22 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              goto LAB_00107a56;
            }
LAB_00106917:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1e0;
          }
        }
        else {
          if (0x1f0 < iVar45) {
            if (iVar45 < 0x213) {
              if (iVar45 == 0x1f1) {
LAB_00109fc9:
                *(undefined4 *)((long)p + 8) = 0x1f1;
                return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
              }
              if (iVar45 == 0x1fc) {
                lVar51 = *(long *)((long)p + 0x100);
                lVar9 = **(long **)((long)p + 0x108);
                *(long *)((long)p + 0x20) = lVar51;
                *(long *)((long)p + 0x28) = lVar51;
                *(long *)((long)p + 0x38) = lVar9;
                *(long *)((long)p + 0x30) = lVar51 + lVar9;
                *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                pvVar32 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
                *(void **)((long)p + 0x6b0) = pvVar32;
                uVar21 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
                *(ulong *)((long)p + 0x6b8) = uVar21;
                if (uVar21 != 0) {
                  uVar43 = *puVar7;
                  if (uVar21 < *puVar7) {
                    uVar43 = uVar21;
                  }
                  *(ulong *)((long)p + 0x6c0) = uVar43;
                  if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                    memcpy(puVar8,pvVar32,uVar43);
                  }
                  else {
                    uVar43 = *(ulong *)((long)p + 0x6c0);
                    if (uVar43 != 0) {
                      uVar21 = 0;
                      do {
                        sVar50 = uVar43 - uVar21;
                        if (0x1fff < sVar50) {
                          sVar50 = 0x2000;
                        }
                        memcpy((void *)(*(long *)((long)p + 0x110) + uVar21),
                               (void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50);
                        uVar15 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50,
                                         *(uint *)((long)p + 0xf8));
                        *(uint *)((long)p + 0xf8) = uVar15;
                        uVar21 = uVar21 + sVar50;
                        uVar43 = *(ulong *)((long)p + 0x6c0);
                      } while (uVar21 < uVar43);
                    }
                  }
                  **(long **)((long)p + 0x108) =
                       *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                  **(undefined8 **)((long)p + 0x118) = *(undefined8 *)((long)p + 0x6c0);
                  *(undefined4 *)((long)p + 8) = 0x1fc;
                  goto LAB_00108ab8;
                }
                uVar46 = *(uint *)((long)p + 0x678);
                uStack_78._0_4_ = *(int *)((long)p + 0x690);
                uStack_84 = *(int *)((long)p + 0x694);
                uStack_80 = *(uint **)((long)p + 0x698);
                uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
LAB_0010707c:
                uStack_40 = (ulong)uVar46;
                uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
                uStack_58 = *(uint **)((long)p + 0x28);
                uVar21 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                goto LAB_0010bcc3;
              }
            }
            else {
              if (iVar45 == 0x213) {
                uStack_78._0_4_ = *(int *)((long)p + 0x690);
                uStack_84 = *(int *)((long)p + 0x694);
                uStack_80 = *(uint **)((long)p + 0x698);
                uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
                uVar46 = *(uint *)((long)p + 0x678);
                lVar51 = *(long *)((long)p + 0x100);
                lVar9 = **(long **)((long)p + 0x108);
                *(long *)((long)p + 0x20) = lVar51;
                *(long *)((long)p + 0x28) = lVar51;
                *(long *)((long)p + 0x38) = lVar9;
                *(long *)((long)p + 0x30) = lVar51 + lVar9;
                *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                goto LAB_0010707c;
              }
              if (iVar45 == 0x228) {
                lVar51 = *(long *)((long)p + 0x100);
                lVar9 = **(long **)((long)p + 0x108);
                *(long *)((long)p + 0x20) = lVar51;
                *(long *)((long)p + 0x28) = lVar51;
                *(long *)((long)p + 0x38) = lVar9;
                *(long *)((long)p + 0x30) = lVar51 + lVar9;
                *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
                if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
                  uVar28 = *(uint *)((long)p + 0x6f0);
                  uStack_78._0_4_ = *(int *)((long)p + 0x690);
                  uStack_84 = *(int *)((long)p + 0x694);
                  uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
                  uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
                  uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
                  uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                  uStack_68._0_4_ = *(undefined4 *)((long)p + 0xb8);
                  uStack_68._4_4_ = *(undefined4 *)((long)p + 0xbc);
                  uStack_58 = *(uint **)((long)p + 0x28);
                  uVar21 = *(ulong *)((long)p + 0x58);
                  uVar46 = *(uint *)((long)p + 0x60);
                  goto LAB_00107ac3;
                }
LAB_001069a1:
                **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20)
                ;
                **(undefined8 **)((long)p + 0x118) = 0;
                *(undefined4 *)((long)p + 8) = 0x228;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
            }
            goto switchD_00105f66_caseD_458;
          }
          if (iVar45 == 0x1e2) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar22 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              goto LAB_0010840f;
            }
LAB_00107511:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1e2;
          }
          else {
            if (iVar45 == 0x1e8) {
LAB_0010aad2:
              *(undefined4 *)((long)p + 8) = 0x1e8;
              return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
            }
            if (iVar45 != 0x1eb) goto switchD_00105f66_caseD_458;
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar17 = *(ulong *)((long)p + 0x58);
              iVar45 = *(int *)((long)p + 0x60);
              goto LAB_001081de;
            }
LAB_0010656d:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1eb;
          }
        }
      }
      else if (iVar45 < 0x283) {
        if (0x249 < iVar45) {
          if (iVar45 < 0x26b) {
            if (iVar45 == 0x24a) {
LAB_00109c86:
              *(undefined4 *)((long)p + 8) = 0x24a;
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            if (iVar45 == 0x252) {
              lVar51 = *(long *)((long)p + 0x100);
              lVar9 = **(long **)((long)p + 0x108);
              *(long *)((long)p + 0x20) = lVar51;
              *(long *)((long)p + 0x28) = lVar51;
              *(long *)((long)p + 0x38) = lVar9;
              *(long *)((long)p + 0x30) = lVar51 + lVar9;
              *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
              pvVar32 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
              *(void **)((long)p + 0x6b0) = pvVar32;
              uVar21 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
              *(ulong *)((long)p + 0x6b8) = uVar21;
              if (uVar21 == 0) {
                uVar28 = *(uint *)((long)p + 0x6f0);
                uStack_78._0_4_ = *(int *)((long)p + 0x690);
                uStack_84 = *(int *)((long)p + 0x694);
                uStack_80 = *(uint **)((long)p + 0x698);
                uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
                uStack_68 = *(ulong *)((long)p + 0xb8);
                uStack_58 = *(uint **)((long)p + 0x28);
                uVar21 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                uStack_40 = 0;
                goto LAB_00108ed6;
              }
              uVar43 = *puVar7;
              if (uVar21 < *puVar7) {
                uVar43 = uVar21;
              }
              *(ulong *)((long)p + 0x6c0) = uVar43;
              if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                memcpy(puVar8,pvVar32,uVar43);
              }
              else {
                uVar43 = *(ulong *)((long)p + 0x6c0);
                if (uVar43 != 0) {
                  uVar21 = 0;
                  do {
                    sVar50 = uVar43 - uVar21;
                    if (0x1fff < sVar50) {
                      sVar50 = 0x2000;
                    }
                    memcpy((void *)(*(long *)((long)p + 0x110) + uVar21),
                           (void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50);
                    uVar15 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50,
                                     *(uint *)((long)p + 0xf8));
                    *(uint *)((long)p + 0xf8) = uVar15;
                    uVar21 = uVar21 + sVar50;
                    uVar43 = *(ulong *)((long)p + 0x6c0);
                  } while (uVar21 < uVar43);
                }
              }
              **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
              **(undefined8 **)((long)p + 0x118) = *(undefined8 *)((long)p + 0x6c0);
              *(undefined4 *)((long)p + 8) = 0x252;
              goto LAB_00108ab8;
            }
          }
          else {
            if (iVar45 == 0x26b) {
LAB_00108bca:
              *(undefined4 *)((long)p + 8) = 0x26b;
              return LZHAM_DECOMP_STATUS_FAILED_EXPECTED_MORE_RAW_BYTES;
            }
            if (iVar45 == 0x26f) {
              uVar28 = *(uint *)((long)p + 0x6f0);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80 = *(uint **)((long)p + 0x698);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uVar22 = (ulong)*(uint *)((long)p + 0x678);
              lVar51 = *(long *)((long)p + 0x100);
              uVar21 = **(ulong **)((long)p + 0x108);
              *(long *)((long)p + 0x20) = lVar51;
              *(long *)((long)p + 0x28) = lVar51;
              *(ulong *)((long)p + 0x38) = uVar21;
              *(ulong *)((long)p + 0x30) = lVar51 + uVar21;
              *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
              uVar21 = **(ulong **)((long)p + 0x108);
              lVar51 = 0;
              goto LAB_00108afe;
            }
          }
          goto switchD_00105f66_caseD_458;
        }
        if (iVar45 == 0x22b) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar22 = (ulong)*(uint *)((long)p + 0x6f0);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(undefined4 *)((long)p + 0xb8);
            uStack_68._4_4_ = *(undefined4 *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            goto LAB_0010824a;
          }
LAB_001072a8:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x22b;
        }
        else {
          if (iVar45 == 0x235) {
LAB_00109af2:
            *(undefined4 *)((long)p + 8) = 0x235;
            return LZHAM_DECOMP_STATUS_FAILED_BAD_RAW_BLOCK;
          }
          if (iVar45 != 0x23b) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar28 = *(uint *)((long)p + 0x6f0);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(undefined4 *)((long)p + 0xb8);
            uStack_68._4_4_ = *(undefined4 *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar17 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_00107f15;
          }
LAB_0010644a:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x23b;
        }
      }
      else if (iVar45 < 0x2cd) {
        if (iVar45 < 0x2a3) {
          if (iVar45 == 0x283) {
LAB_00108bf4:
            *(undefined4 *)((long)p + 8) = 0x283;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          if (iVar45 == 0x294) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar32 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar32;
            uVar21 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar21;
            if (uVar21 == 0) {
              uVar28 = *(uint *)((long)p + 0x6f0);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80 = *(uint **)((long)p + 0x698);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = 0;
              goto LAB_00108adc;
            }
            uVar43 = *puVar7;
            if (uVar21 < *puVar7) {
              uVar43 = uVar21;
            }
            *(ulong *)((long)p + 0x6c0) = uVar43;
            if ((*(byte *)((long)p + 0x144) & 2) == 0) {
              memcpy(puVar8,pvVar32,uVar43);
            }
            else {
              uVar43 = *(ulong *)((long)p + 0x6c0);
              if (uVar43 != 0) {
                uVar21 = 0;
                do {
                  sVar50 = uVar43 - uVar21;
                  if (0x1fff < sVar50) {
                    sVar50 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x110) + uVar21),
                         (void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50);
                  uVar15 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50,
                                   *(uint *)((long)p + 0xf8));
                  *(uint *)((long)p + 0xf8) = uVar15;
                  uVar21 = uVar21 + sVar50;
                  uVar43 = *(ulong *)((long)p + 0x6c0);
                } while (uVar21 < uVar43);
              }
            }
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = *(undefined8 *)((long)p + 0x6c0);
            *(undefined4 *)((long)p + 8) = 0x294;
LAB_00108ab8:
            return (uint)(*(long *)((long)p + 0x6c0) == 0);
          }
          goto switchD_00105f66_caseD_458;
        }
        if (iVar45 == 0x2a3) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uVar28 = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar22 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            goto LAB_001085fc;
          }
LAB_0010765d:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x2a3;
        }
        else {
          if (iVar45 != 0x2ae) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uVar22 = (ulong)*(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar17 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
LAB_001084a5:
            uVar21 = 0;
            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010a0f0;
            do {
              cVar31 = (char)uVar46;
              uVar46 = uVar46 + 8;
              uVar17 = uVar17 | uVar21 << (0x38U - cVar31 & 0x3f);
LAB_0010abc7:
              if (1 < (int)uVar46) {
                uVar21 = uVar17 << 2;
                uVar46 = uVar46 - 2;
                if (uVar17 >> 0x3e == 2) {
                  lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                }
                else if ((uint)(uVar17 >> 0x3e) == 1) {
                  lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
                }
LAB_00109240:
                uVar30 = (uint)uVar22;
                puVar16 = (ushort *)((long)p + uVar22 * 2 + 0x5e8);
                for (; uStack_68._4_4_ < 0x1000000; uStack_68._4_4_ = uStack_68._4_4_ << 8) {
                  *(ushort **)((long)p + 0xd0) = puVar16;
                  uVar22 = uVar21;
                  for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                    if (uStack_58 == *(uint **)((long)p + 0x30)) {
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                        *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                        *(ulong *)((long)p + 0x58) = uVar22;
                        *(uint *)((long)p + 0x60) = uVar46;
                        *(uint **)((long)p + 0x28) = uStack_58;
                        *(int *)((long)p + 0x690) = (int)uStack_78;
                        *(uint *)((long)p + 0x694) = uStack_84;
                        *(int *)((long)p + 0x698) = (int)uStack_80;
                        *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar30;
                        *(int *)((long)p + 0x678) = (int)uStack_40;
                        goto LAB_001075f0;
                      }
LAB_0010859b:
                      uVar21 = 0;
                      if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010b026;
                    }
                    else {
LAB_0010b026:
                      uVar21 = (ulong)(byte)*uStack_58;
                      uStack_58 = (uint *)((long)uStack_58 + 1);
                    }
                    uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                  }
                  uVar21 = uVar22 << 8;
                  uVar46 = uVar46 - 8;
                  puVar16 = *(ushort **)((long)p + 0xd0);
                  uStack_68._0_4_ = (uint)uStack_68 << 8 | (uint)(byte)(uVar22 >> 0x38);
                }
                uVar6 = *puVar16;
                uVar28 = (uStack_68._4_4_ >> 0xb) * (uint)uVar6;
                if ((uint)uStack_68 < uVar28) {
                  *puVar16 = (short)(0x800 - uVar6 >> 5) + uVar6;
                  if (uVar43 <= (uStack_40 & 0xffffffff)) {
                    *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                    *(uint *)((long)p + 0xbc) = uVar28;
                    *(ulong *)((long)p + 0x58) = uVar21;
                    *(uint *)((long)p + 0x60) = uVar46;
                    *(uint **)((long)p + 0x28) = uStack_58;
                    **(long **)((long)p + 0x108) = (long)uStack_58 - *(long *)((long)p + 0x20);
                    **(undefined8 **)((long)p + 0x118) = 0;
                    goto LAB_0010621c;
                  }
                  uStack_68._4_4_ = uVar28;
                  if (uVar30 < 7) {
                    pqVar37 = (quasi_adaptive_huffman_data_model *)((long)p + 0x168);
                    pdVar26 = *(decoder_tables **)((long)p + 0x1d0);
                    if ((int)uVar46 < 0x18) {
                      if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                        uVar28 = *uStack_58;
                        uVar46 = uVar46 + 0x20;
                        uVar21 = uVar21 | (ulong)(uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                                  (uVar28 & 0xff00) << 8 | uVar28 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        uStack_58 = uStack_58 + 1;
                      }
                      else {
                        for (; uStack_68._4_4_ = uVar28, (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uVar28;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uVar30;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_0010b14e;
                          }
LAB_0010b0d1:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) {
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                      }
                    }
                    uVar28 = (uint)(ushort)(uVar21 >> 0x30);
                    if (uVar28 < pdVar26->m_table_max_code) {
                      uVar39 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar28 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar45 = pdVar26->m_decode_start_code_size - 0x41;
                      do {
                        iVar36 = iVar45;
                        iVar45 = iVar36 + 1;
                      } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar28);
                      uVar29 = (int)(uVar21 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                               pdVar26->m_val_ptrs[iVar36 + 0x40U];
                      uVar28 = 0;
                      if (uVar29 < pqVar37->m_total_syms) {
                        uVar28 = uVar29;
                      }
                      uVar39 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar28];
                      uVar28 = iVar36 + 0x41;
                    }
                    uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
                    puVar4 = (pqVar37->m_sym_freq).m_p + uVar39;
                    *puVar4 = *puVar4 + 1;
                    uVar46 = uVar46 - uVar28;
                    puVar1 = &pqVar37->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    uStack_78._4_4_ = uVar30;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                    }
                  }
                  else {
                    uVar28 = (uint)(byte)puVar8[(uint)((int)uStack_40 - (int)uStack_78)];
                    pqVar37 = (quasi_adaptive_huffman_data_model *)((long)p + 0x1f8);
                    pdVar26 = *(decoder_tables **)((long)p + 0x260);
                    uStack_78._4_4_ = uVar30;
                    if ((int)uVar46 < 0x18) {
                      if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                        uVar29 = *uStack_58;
                        uVar46 = uVar46 + 0x20;
                        uVar21 = uVar21 | (ulong)(uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 |
                                                  (uVar29 & 0xff00) << 8 | uVar29 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        uStack_58 = uStack_58 + 1;
                      }
                      else {
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d0) = uVar28;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_0010913d;
                          }
LAB_00109096:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) {
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                      }
                    }
                    uVar29 = (uint)(ushort)(uVar21 >> 0x30);
                    if (uVar29 < pdVar26->m_table_max_code) {
                      uVar39 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar29 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar45 = pdVar26->m_decode_start_code_size - 0x41;
                      do {
                        iVar36 = iVar45;
                        iVar45 = iVar36 + 1;
                      } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar29);
                      uVar30 = (int)(uVar21 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                               pdVar26->m_val_ptrs[iVar36 + 0x40U];
                      uVar29 = 0;
                      if (uVar30 < pqVar37->m_total_syms) {
                        uVar29 = uVar30;
                      }
                      uVar39 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar29];
                      uVar29 = iVar36 + 0x41;
                    }
                    uVar21 = uVar21 << ((byte)uVar29 & 0x3f);
                    puVar4 = (pqVar37->m_sym_freq).m_p + uVar39;
                    *puVar4 = *puVar4 + 1;
                    uVar46 = uVar46 - uVar29;
                    puVar1 = &pqVar37->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                    }
                    uVar39 = uVar39 ^ uVar28;
                  }
                  puVar8[uStack_40 & 0xffffffff] = (char)uVar39;
                  uVar22 = (ulong)(byte)s_literal_next_state[uStack_78._4_4_];
                  uStack_40 = (ulong)((int)uStack_40 + 1);
                  goto LAB_00109240;
                }
                *puVar16 = uVar6 - (uVar6 >> 5);
                puVar16 = (ushort *)((long)p + (ulong)uVar30 * 2 + 0x600);
                uVar29 = 1;
                uStack_68._0_4_ = (uint)uStack_68 - uVar28;
                for (uVar39 = uStack_68._4_4_ - uVar28; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                  *(ushort **)((long)p + 0xd0) = puVar16;
                  uVar22 = uVar21;
                  for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                    if (uStack_58 == *(uint **)((long)p + 0x30)) {
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                        *(uint *)((long)p + 0xbc) = uVar39;
                        *(ulong *)((long)p + 0x58) = uVar22;
                        *(uint *)((long)p + 0x60) = uVar46;
                        *(uint **)((long)p + 0x28) = uStack_58;
                        *(uint *)((long)p + 0x6d4) = uVar29;
                        *(int *)((long)p + 0x690) = (int)uStack_78;
                        *(uint *)((long)p + 0x694) = uStack_84;
                        *(int *)((long)p + 0x698) = (int)uStack_80;
                        *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar30;
                        *(int *)((long)p + 0x678) = (int)uStack_40;
                        goto LAB_00107315;
                      }
LAB_001082bf:
                      uVar21 = 0;
                      if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010b29b;
                    }
                    else {
LAB_0010b29b:
                      uVar21 = (ulong)(byte)*uStack_58;
                      uStack_58 = (uint *)((long)uStack_58 + 1);
                    }
                    uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                  }
                  uVar21 = uVar22 << 8;
                  uVar46 = uVar46 - 8;
                  puVar16 = *(ushort **)((long)p + 0xd0);
                  uStack_68._0_4_ = (uint)uStack_68 << 8 | (uint)(byte)(uVar22 >> 0x38);
                }
                uVar6 = *puVar16;
                uStack_68._4_4_ = (uVar39 >> 0xb) * (uint)uVar6;
                uVar28 = (uint)uStack_68 - uStack_68._4_4_;
                if ((uint)uStack_68 < uStack_68._4_4_) {
                  *puVar16 = (short)(0x800 - uVar6 >> 5) + uVar6;
                  pqVar37 = (quasi_adaptive_huffman_data_model *)((long)p + 0x288);
                  pdVar26 = *(decoder_tables **)((long)p + 0x2f0);
                  uStack_78._4_4_ = uVar30;
                  if ((int)uVar46 < 0x18) {
                    if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                      uVar28 = *uStack_58;
                      uVar46 = uVar46 + 0x20;
                      uVar21 = uVar21 | (ulong)(uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                                (uVar28 & 0xff00) << 8 | uVar28 << 0x18) <<
                                        (-(char)uVar46 & 0x3fU);
                      uStack_58 = uStack_58 + 1;
                    }
                    else {
                      for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          *(uint *)((long)p + 0x6d4) = uVar29;
                          *(int *)((long)p + 0x690) = (int)uStack_78;
                          *(uint *)((long)p + 0x694) = uStack_84;
                          *(int *)((long)p + 0x698) = (int)uStack_80;
                          *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                          *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          goto LAB_0010bb4c;
                        }
LAB_0010ba41:
                        uVar22 = 0;
                        if (uStack_58 < *(uint **)((long)p + 0x30)) {
                          uVar22 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                      }
                    }
                  }
                  uVar28 = (uint)(ushort)(uVar21 >> 0x30);
                  if (uVar28 < pdVar26->m_table_max_code) {
                    uVar30 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                             0xffff;
                    uVar28 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >>
                             0x10;
                  }
                  else {
                    iVar45 = pdVar26->m_decode_start_code_size - 0x41;
                    do {
                      iVar36 = iVar45;
                      iVar45 = iVar36 + 1;
                    } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar28);
                    uVar29 = (int)(uVar21 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                             pdVar26->m_val_ptrs[iVar36 + 0x40U];
                    uVar28 = 0;
                    if (uVar29 < pqVar37->m_total_syms) {
                      uVar28 = uVar29;
                    }
                    uVar30 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar28];
                    uVar28 = iVar36 + 0x41;
                  }
                  uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
                  puVar4 = (pqVar37->m_sym_freq).m_p + uVar30;
                  *puVar4 = *puVar4 + 1;
                  uVar46 = uVar46 - uVar28;
                  puVar1 = &pqVar37->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                  }
                  if (uVar30 < 2) {
                    uVar22 = 0;
                    if (uVar30 != 0) {
                      uStack_80 = (uint *)0x100000001;
                      uStack_84 = 1;
                      uStack_78._0_4_ = 1;
                      goto LAB_00109240;
                    }
                    if ((uVar46 & 7) != 0) {
                      for (; (int)uVar46 < 0; uVar46 = uVar46 + 8) {
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00106b6d;
                          }
LAB_001086ae:
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010bd1d;
                          uVar22 = 0;
                        }
                        else {
LAB_0010bd1d:
                          uVar22 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar21 = uVar21 << ((byte)uVar46 & 7);
                      uVar46 = uVar46 & 0x7ffffff8;
                    }
LAB_0010bcc3:
                    do {
                      *(int *)((long)p + 0x68c) = *(int *)((long)p + 0x68c) + 1;
                      if (*(int *)((long)p + 0x160) != 0) goto LAB_0010bce2;
LAB_0010a117:
                      while( true ) {
                        if (1 < (int)uVar46) break;
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00105e6e;
                          }
LAB_001079e3:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010995f;
                        }
                        else {
LAB_0010995f:
                          uVar22 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        cVar31 = (char)uVar46;
                        uVar46 = uVar46 + 8;
                        uVar21 = uVar21 | uVar22 << (0x38U - cVar31 & 0x3f);
                      }
                      uVar22 = uVar21 >> 0x3e;
                      *(uint *)((long)p + 0x6a8) = (uint)(uVar21 >> 0x3e);
                      uVar21 = uVar21 << 2;
                      uVar46 = uVar46 - 2;
                      uVar28 = 0;
                      switch(uVar22) {
                      case 1:
                        goto switchD_0010a165_caseD_1;
                      case 2:
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6f0) = uVar28;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_001069a1;
                            }
LAB_00107ac3:
                            uVar22 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010999b;
                          }
                          else {
LAB_0010999b:
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                        uVar22 = uVar21 >> 0x28;
                        uVar21 = uVar21 << 0x18;
                        uVar46 = uVar46 - 0x18;
                        while( true ) {
                          uVar28 = (uint)uVar22;
                          if (7 < (int)uVar46) break;
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6f0) = uVar28;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_001072a8;
                            }
LAB_0010824a:
                            uVar17 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109b0a;
                          }
                          else {
LAB_00109b0a:
                            uVar17 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          cVar31 = (char)uVar46;
                          uVar46 = uVar46 + 8;
                          uVar21 = uVar21 | uVar17 << (0x38U - cVar31 & 0x3f);
                        }
                        uVar17 = uVar21 << 8;
                        uVar29 = uVar46 - 8;
                        if ((((uint)(uVar22 >> 0x10) ^ (uint)(uVar22 >> 8) ^ uVar28) & 0xff) !=
                            (uint)(byte)(uVar21 >> 0x38)) {
                          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                          *(ulong *)((long)p + 0x58) = uVar17;
                          *(uint *)((long)p + 0x60) = uVar29;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          **(long **)((long)p + 0x108) = (long)uStack_58 - *(long *)((long)p + 0x20)
                          ;
                          **(undefined8 **)((long)p + 0x118) = 0;
                          goto LAB_00109af2;
                        }
                        uVar28 = uVar28 + 1;
                        if ((uVar46 & 7) != 0) {
                          for (; (int)uVar29 < 0; uVar29 = uVar29 + 8) {
                            if (uStack_58 == *(uint **)((long)p + 0x30)) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                                *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                                *(ulong *)((long)p + 0x58) = uVar17;
                                *(uint *)((long)p + 0x60) = uVar29;
                                *(uint **)((long)p + 0x28) = uStack_58;
                                *(uint *)((long)p + 0x6f0) = uVar28;
                                *(int *)((long)p + 0x690) = (int)uStack_78;
                                *(uint *)((long)p + 0x694) = uStack_84;
                                *(int *)((long)p + 0x698) = (int)uStack_80;
                                *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                                *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                                *(int *)((long)p + 0x678) = (int)uStack_40;
                                goto LAB_0010644a;
                              }
LAB_00107f15:
                              uVar21 = 0;
                              if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109c9e;
                            }
                            else {
LAB_00109c9e:
                              uVar21 = (ulong)(byte)*uStack_58;
                              uStack_58 = (uint *)((long)uStack_58 + 1);
                            }
                            uVar17 = uVar17 | uVar21 << (0x38U - (char)uVar29 & 0x3f);
                          }
                          uVar17 = uVar17 << ((byte)uVar29 & 7);
                          uVar29 = uVar29 & 0x7ffffff8;
                        }
                        do {
                          uVar21 = uVar17 << 8;
                          uVar46 = uVar29 - 8;
                          if ((int)uVar29 < 8) goto LAB_00109bf4;
                          uVar22 = uStack_40 & 0xffffffff;
                          if (uVar43 <= uVar22) {
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            **(long **)((long)p + 0x108) =
                                 (long)uStack_58 - *(long *)((long)p + 0x20);
                            **(undefined8 **)((long)p + 0x118) = 0;
                            goto LAB_00109c86;
                          }
                          uVar35 = 0xff;
                          if (7 < (int)uVar29) {
                            uVar35 = (char)(uVar17 >> 0x38);
                          }
                          uStack_40 = (ulong)((int)uStack_40 + 1);
                          puVar8[uVar22] = uVar35;
LAB_00108ed6:
                          uVar28 = uVar28 - 1;
                          uVar17 = uVar21;
                          uVar29 = uVar46;
                        } while (uVar28 != 0);
                        uVar28 = 0;
LAB_00109bf4:
                        *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                        *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                        *(ulong *)((long)p + 0x58) = uVar17;
                        *(uint *)((long)p + 0x60) = uVar29;
                        *(uint **)((long)p + 0x28) = uStack_58;
LAB_00108adc:
                        for (; uVar28 != 0; uVar28 = uVar28 - (int)uVar17) {
                          lVar51 = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                          uVar21 = **(long **)((long)p + 0x108) - lVar51;
                          uVar22 = uStack_40;
LAB_00108afe:
                          if (uVar21 == 0) {
                            **(long **)((long)p + 0x108) = lVar51;
                            **(undefined8 **)((long)p + 0x118) = 0;
                            if (*(char *)((long)p + 0x120) != '\x01') {
                              *(uint *)((long)p + 0x6f0) = uVar28;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uVar22;
                              *(undefined4 *)((long)p + 8) = 0x26f;
                              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                            }
                            goto LAB_00108bca;
                          }
                          uVar17 = (ulong)uVar28;
                          if (uVar21 < uVar28) {
                            uVar17 = uVar21;
                          }
                          uStack_40 = (ulong)(uint)((int)uVar22 + (int)uVar17);
                          if (uVar43 < uStack_40) {
                            **(long **)((long)p + 0x108) = lVar51;
                            **(undefined8 **)((long)p + 0x118) = 0;
                            goto LAB_00108bf4;
                          }
                          memcpy(puVar8 + (uVar22 & 0xffffffff),
                                 (void *)(*(long *)((long)p + 0x100) + lVar51),uVar17);
                          lVar9 = *(long *)((long)p + 0x100);
                          lVar10 = **(long **)((long)p + 0x108);
                          *(long *)((long)p + 0x20) = lVar9;
                          *(ulong *)((long)p + 0x28) = lVar51 + lVar9 + uVar17;
                          *(long *)((long)p + 0x38) = lVar10;
                          *(long *)((long)p + 0x30) = lVar9 + lVar10;
                          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                        }
                        uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                        uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
                        uStack_58 = *(uint **)((long)p + 0x28);
                        uVar21 = *(ulong *)((long)p + 0x58);
                        uVar46 = *(uint *)((long)p + 0x60);
                        break;
                      case 3:
                        *(undefined4 *)((long)p + 0x160) = 3;
                        break;
                      default:
                        for (; (int)uVar46 < 2; uVar46 = uVar46 + 8) {
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_00106fe2;
                            }
LAB_0010809e:
                            uVar22 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010a2e9;
                          }
                          else {
LAB_0010a2e9:
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                        uVar28 = (uint)(uVar21 >> 0x3e);
                        *(uint *)((long)p + 0x71c) = uVar28;
                        uVar22 = uVar21 << 2;
                        uVar46 = uVar46 - 2;
                        if (uVar21 >> 0x3e == 2) {
                          lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                        }
                        else if (uVar28 == 1) {
                          lzham_decompressor::reset_huffman_table_update_rates
                                    ((lzham_decompressor *)p);
                        }
                        if ((uVar46 & 7) != 0) {
                          for (; (int)uVar46 < 0; uVar46 = uVar46 + 8) {
                            if (uStack_58 == *(uint **)((long)p + 0x30)) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                                *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                                *(ulong *)((long)p + 0x58) = uVar22;
                                *(uint *)((long)p + 0x60) = uVar46;
                                *(uint **)((long)p + 0x28) = uStack_58;
                                *(int *)((long)p + 0x690) = (int)uStack_78;
                                *(uint *)((long)p + 0x694) = uStack_84;
                                *(int *)((long)p + 0x698) = (int)uStack_80;
                                *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                                *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                                *(int *)((long)p + 0x678) = (int)uStack_40;
                                goto LAB_00106917;
                              }
LAB_00107a56:
                              uVar21 = 0;
                              if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010997d;
                            }
                            else {
LAB_0010997d:
                              uVar21 = (ulong)(byte)*uStack_58;
                              uStack_58 = (uint *)((long)uStack_58 + 1);
                            }
                            uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                          }
                          uVar22 = uVar22 << ((byte)uVar46 & 7);
                          uVar46 = uVar46 & 0x7ffffff8;
                        }
                        for (; (int)uVar46 < 0x10; uVar46 = uVar46 + 8) {
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar22;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_00107511;
                            }
LAB_0010840f:
                            uVar21 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010aaea;
                          }
                          else {
LAB_0010aaea:
                            uVar21 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                        }
                        uVar17 = uVar22 << 0x10;
                        iVar45 = uVar46 - 0x10;
                        if (uVar22 >> 0x30 != 0) {
                          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                          *(ulong *)((long)p + 0x58) = uVar17;
                          *(int *)((long)p + 0x60) = iVar45;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          **(long **)((long)p + 0x108) = (long)uStack_58 - *(long *)((long)p + 0x20)
                          ;
                          **(undefined8 **)((long)p + 0x118) = 0;
                          goto LAB_0010aad2;
                        }
                        while( true ) {
                          iVar36 = (int)uStack_40;
                          if (0xf < iVar45) break;
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar17;
                              *(int *)((long)p + 0x60) = iVar45;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = iVar36;
                              goto LAB_0010656d;
                            }
LAB_001081de:
                            uVar21 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109f42;
                          }
                          else {
LAB_00109f42:
                            uVar21 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          cVar31 = (char)iVar45;
                          iVar45 = iVar45 + 8;
                          uVar17 = uVar17 | uVar21 << (0x38U - cVar31 & 0x3f);
                        }
                        uVar21 = uVar17 << 0x10;
                        uVar46 = iVar45 - 0x10;
                        if ((short)(uVar17 >> 0x30) != -1) {
                          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          **(long **)((long)p + 0x108) = (long)uStack_58 - *(long *)((long)p + 0x20)
                          ;
                          **(undefined8 **)((long)p + 0x118) = 0;
                          goto LAB_00109fc9;
                        }
                        if ((*(uint *)((long)p + 0x71c) & 0xfffffffe) == 2) {
                          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          **(long **)((long)p + 0x108) = (long)uStack_58 - *(long *)((long)p + 0x20)
                          ;
                          **(ulong **)((long)p + 0x118) =
                               (ulong)(uint)(iVar36 - *(int *)((long)p + 0x67c));
                          *(int *)((long)p + 0x67c) = iVar36;
                          *(int *)((long)p + 0x690) = (int)uStack_78;
                          *(uint *)((long)p + 0x694) = uStack_84;
                          *(int *)((long)p + 0x698) = (int)uStack_80;
                          *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                          *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                          *(int *)((long)p + 0x678) = iVar36;
                          *(undefined4 *)((long)p + 8) = 0x213;
                          return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                        }
                      }
                    } while( true );
                  }
                  uVar29 = (uVar30 - 2 & 7) + 2;
                  uStack_4c = (uVar30 - 2 >> 3) + 1;
                  if (uVar29 == 9) {
                    pqVar37 = (quasi_adaptive_huffman_data_model *)
                              ((long)p + (ulong)((uint)(6 < uStack_78._4_4_) * 0x90) + 0x438);
                    pdVar26 = *(decoder_tables **)
                               ((long)p + (ulong)((uint)(6 < uStack_78._4_4_) * 0x90) + 0x4a0);
                    iVar45 = 9;
                    if ((int)uVar46 < 0x18) {
                      if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                        uVar28 = *uStack_58;
                        uVar46 = uVar46 + 0x20;
                        uVar21 = uVar21 | (ulong)(uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                                  (uVar28 & 0xff00) << 8 | uVar28 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        uStack_58 = uStack_58 + 1;
                      }
                      else {
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(int *)((long)p + 0x6d4) = iVar45;
                            *(uint *)((long)p + 0x6d8) = uStack_4c;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00108f87;
                          }
LAB_00108ef0:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) {
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                      }
                    }
                    uVar28 = (uint)(ushort)(uVar21 >> 0x30);
                    if (uVar28 < pdVar26->m_table_max_code) {
                      uVar29 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar28 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar36 = pdVar26->m_decode_start_code_size - 0x41;
                      do {
                        iVar44 = iVar36;
                        iVar36 = iVar44 + 1;
                      } while (pdVar26->m_max_codes[iVar44 + 0x40U] <= uVar28);
                      uVar29 = (int)(uVar21 >> (-(char)(iVar44 + 1) & 0x3fU)) +
                               pdVar26->m_val_ptrs[iVar44 + 0x40U];
                      uVar28 = 0;
                      if (uVar29 < pqVar37->m_total_syms) {
                        uVar28 = uVar29;
                      }
                      uVar29 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar28];
                      uVar28 = iVar44 + 0x41;
                    }
                    uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
                    puVar4 = (pqVar37->m_sym_freq).m_p + uVar29;
                    *puVar4 = *puVar4 + 1;
                    uVar46 = uVar46 - uVar28;
                    puVar1 = &pqVar37->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                    }
                    uVar29 = uVar29 + iVar45;
                    uVar28 = 0;
                    if (uVar29 == 0x102) {
                      do {
                        while (uVar29 = uVar46, (int)uVar29 < 1) {
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar29;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6d4) = uVar28;
                              *(uint *)((long)p + 0x6d8) = uStack_4c;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_0010718f;
                            }
LAB_00108111:
                            uVar22 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010a653;
                          }
                          else {
LAB_0010a653:
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar29 & 0x3f);
                          uVar46 = uVar29 + 8;
                        }
                        uVar22 = uVar21 * 2;
                        if (-1 < (long)uVar21) break;
                        uVar28 = uVar28 + 1;
                        uVar21 = uVar22;
                        uVar46 = uVar29 - 1;
                      } while (uVar28 < 3);
                      iVar45 = uVar29 - 1;
                      while( true ) {
                        bVar5 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar28);
                        uVar46 = iVar45 - (uint)bVar5;
                        if ((int)(uint)bVar5 <= iVar45) break;
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar22;
                            *(int *)((long)p + 0x60) = iVar45;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar28;
                            *(uint *)((long)p + 0x6d8) = uStack_4c;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00107382;
                          }
LAB_00108332:
                          uVar21 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010a748;
                        }
                        else {
LAB_0010a748:
                          uVar21 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        cVar31 = (char)iVar45;
                        iVar45 = iVar45 + 8;
                        uVar22 = uVar22 | uVar21 << (0x38U - cVar31 & 0x3f);
                      }
                      uVar21 = uVar22 << (bVar5 & 0x3f);
                      uVar29 = (int)(uVar22 >> (-bVar5 & 0x3f)) +
                               *(int *)(s_huge_match_base_len + (ulong)uVar28 * 4);
                    }
                  }
                  uVar28 = (uint)(byte)CLZDecompBase::m_lzx_position_extra_bits[uStack_4c];
                  if (uVar28 < 3) {
                    for (; (int)uVar46 < (int)uVar28; uVar46 = uVar46 + 8) {
                      if (uStack_58 == *(uint **)((long)p + 0x30)) {
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          *(uint *)((long)p + 0x6d4) = uVar29;
                          *(uint *)((long)p + 0x6d8) = uStack_4c;
                          *(uint *)((long)p + 0x6e0) = uVar28;
                          *(int *)((long)p + 0x690) = (int)uStack_78;
                          *(uint *)((long)p + 0x694) = uStack_84;
                          *(int *)((long)p + 0x698) = (int)uStack_80;
                          *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                          *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          goto LAB_00106323;
                        }
LAB_00107dfb:
                        uVar22 = 0;
                        if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109e3d;
                      }
                      else {
LAB_00109e3d:
                        uVar22 = (ulong)(byte)*uStack_58;
                        uStack_58 = (uint *)((long)uStack_58 + 1);
                      }
                      uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    iVar45 = (int)(uVar21 >> (-(byte)uVar28 & 0x3f));
                    if (uVar28 == 0) {
                      iVar45 = 0;
                    }
                    uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
                    uVar46 = uVar46 - uVar28;
                    iVar36 = (int)uStack_78;
                  }
                  else {
                    iVar45 = 0;
                    if (4 < (byte)CLZDecompBase::m_lzx_position_extra_bits[uStack_4c]) {
                      while( true ) {
                        iVar36 = uVar28 - 4;
                        if (iVar36 <= (int)uVar46) break;
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar29;
                            *(uint *)((long)p + 0x6d8) = uStack_4c;
                            *(uint *)((long)p + 0x6e0) = uVar28;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00106d8e;
                          }
LAB_00107bed:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010a9b0;
                        }
                        else {
LAB_0010a9b0:
                          uVar22 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        cVar31 = (char)uVar46;
                        uVar46 = uVar46 + 8;
                        uVar21 = uVar21 | uVar22 << (0x38U - cVar31 & 0x3f);
                      }
                      iVar45 = (int)(uVar21 >> (0x44U - (char)uVar28 & 0x3f)) << 4;
                      if (iVar36 == 0) {
                        iVar45 = 0;
                      }
                      uVar21 = uVar21 << ((byte)iVar36 & 0x3f);
                      uVar46 = uVar46 - iVar36;
                    }
                    pqVar37 = (quasi_adaptive_huffman_data_model *)((long)p + 0x558);
                    pdVar26 = *(decoder_tables **)((long)p + 0x5c0);
                    if ((int)uVar46 < 0x18) {
                      if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                        uVar28 = *uStack_58;
                        uVar46 = uVar46 + 0x20;
                        uVar21 = uVar21 | (ulong)(uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                                  (uVar28 & 0xff00) << 8 | uVar28 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        uStack_58 = uStack_58 + 1;
                      }
                      else {
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar29;
                            *(uint *)((long)p + 0x6d8) = uStack_4c;
                            *(int *)((long)p + 0x6dc) = iVar45;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00108e9c;
                          }
LAB_00108df5:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) {
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                      }
                    }
                    uVar28 = (uint)(ushort)(uVar21 >> 0x30);
                    if (uVar28 < pdVar26->m_table_max_code) {
                      uVar30 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar28 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar36 = pdVar26->m_decode_start_code_size - 0x41;
                      do {
                        iVar44 = iVar36;
                        iVar36 = iVar44 + 1;
                      } while (pdVar26->m_max_codes[iVar44 + 0x40U] <= uVar28);
                      uVar30 = (int)(uVar21 >> (-(char)(iVar44 + 1) & 0x3fU)) +
                               pdVar26->m_val_ptrs[iVar44 + 0x40U];
                      uVar28 = 0;
                      if (uVar30 < pqVar37->m_total_syms) {
                        uVar28 = uVar30;
                      }
                      uVar30 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar28];
                      uVar28 = iVar44 + 0x41;
                    }
                    uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
                    puVar4 = (pqVar37->m_sym_freq).m_p + uVar30;
                    *puVar4 = *puVar4 + 1;
                    puVar1 = &pqVar37->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                    }
                    iVar45 = uVar30 + iVar45;
                    uVar46 = uVar46 - uVar28;
                    iVar36 = (int)uStack_78;
                  }
                  uStack_78._0_4_ =
                       iVar45 + *(int *)(CLZDecompBase::m_lzx_position_base + (ulong)uStack_4c * 4);
                  uVar22 = (ulong)(6 < uStack_78._4_4_) * 3 + 7;
                  uStack_80 = (uint *)CONCAT44((int)uStack_80,uStack_84);
                  uStack_84 = iVar36;
                }
                else {
                  *puVar16 = uVar6 - (uVar6 >> 5);
                  puVar16 = (ushort *)((long)p + (ulong)uVar30 * 2 + 0x618);
                  for (uVar39 = uVar39 - uStack_68._4_4_; uVar39 < 0x1000000; uVar39 = uVar39 << 8)
                  {
                    *(ushort **)((long)p + 0xd0) = puVar16;
                    uVar22 = uVar21;
                    for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                      if (uStack_58 == *(uint **)((long)p + 0x30)) {
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar28;
                          *(uint *)((long)p + 0xbc) = uVar39;
                          *(ulong *)((long)p + 0x58) = uVar22;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = uStack_58;
                          *(uint *)((long)p + 0x6d4) = uVar29;
                          *(int *)((long)p + 0x690) = (int)uStack_78;
                          *(uint *)((long)p + 0x694) = uStack_84;
                          *(int *)((long)p + 0x698) = (int)uStack_80;
                          *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                          *(uint *)((long)p + 0x6a0) = uVar30;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          goto LAB_0010628d;
                        }
LAB_00107d7d:
                        uVar21 = 0;
                        if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109d57;
                      }
                      else {
LAB_00109d57:
                        uVar21 = (ulong)(byte)*uStack_58;
                        uStack_58 = (uint *)((long)uStack_58 + 1);
                      }
                      uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar21 = uVar22 << 8;
                    uVar46 = uVar46 - 8;
                    puVar16 = *(ushort **)((long)p + 0xd0);
                    uVar28 = uVar28 << 8 | (uint)(byte)(uVar22 >> 0x38);
                  }
                  uVar6 = *puVar16;
                  uStack_68._4_4_ = (uVar39 >> 0xb) * (uint)uVar6;
                  uStack_68._0_4_ = uVar28 - uStack_68._4_4_;
                  if (uVar28 < uStack_68._4_4_) {
                    *puVar16 = (short)(0x800 - uVar6 >> 5) + uVar6;
                    uStack_78 = CONCAT44(uVar30,(int)uStack_78);
                    pqVar37 = (quasi_adaptive_huffman_data_model *)
                              ((long)p + (ulong)((uint)(6 < uVar30) * 0x90) + 0x318);
                    pdVar26 = *(decoder_tables **)
                               ((long)p + (ulong)((uint)(6 < uVar30) * 0x90) + 0x380);
                    if ((int)uVar46 < 0x18) {
                      if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                        uVar29 = *uStack_58;
                        uVar46 = uVar46 + 0x20;
                        uVar21 = uVar21 | (ulong)(uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 |
                                                  (uVar29 & 0xff00) << 8 | uVar29 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        uStack_58 = uStack_58 + 1;
                      }
                      else {
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                            *(uint *)((long)p + 0xb8) = uVar28;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar29;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uVar30;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_0010b52f;
                          }
LAB_0010b44a:
                          uVar22 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) {
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                        }
                        uStack_78 = CONCAT44(uVar30,(int)uStack_78);
                      }
                    }
                    uVar29 = (uint)(ushort)(uVar21 >> 0x30);
                    if (uVar29 < pdVar26->m_table_max_code) {
                      uVar29 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar30 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar45 = pdVar26->m_decode_start_code_size - 0x41;
                      do {
                        iVar36 = iVar45;
                        iVar45 = iVar36 + 1;
                      } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar29);
                      uVar30 = (int)(uVar21 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                               pdVar26->m_val_ptrs[iVar36 + 0x40U];
                      uVar29 = 0;
                      if (uVar30 < pqVar37->m_total_syms) {
                        uVar29 = uVar30;
                      }
                      uVar29 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar29];
                      uVar30 = iVar36 + 0x41;
                    }
                    uVar21 = uVar21 << ((byte)uVar30 & 0x3f);
                    puVar4 = (pqVar37->m_sym_freq).m_p + uVar29;
                    *puVar4 = *puVar4 + 1;
                    uVar46 = uVar46 - uVar30;
                    puVar1 = &pqVar37->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                    }
                    uVar29 = uVar29 + 2;
                    uVar30 = 0;
                    if (uVar29 == 0x102) {
                      do {
                        while (uVar29 = uVar46, (int)uVar29 < 1) {
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar28;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar29;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6d4) = uVar30;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_001073ef;
                            }
LAB_001083a5:
                            uVar22 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010b653;
                          }
                          else {
LAB_0010b653:
                            uVar22 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar29 & 0x3f);
                          uVar46 = uVar29 + 8;
                        }
                        uVar22 = uVar21 * 2;
                        if (-1 < (long)uVar21) break;
                        uVar30 = uVar30 + 1;
                        uVar21 = uVar22;
                        uVar46 = uVar29 - 1;
                      } while (uVar30 < 3);
                      iVar45 = uVar29 - 1;
                      while( true ) {
                        bVar5 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar30);
                        uVar46 = iVar45 - (uint)bVar5;
                        if ((int)(uint)bVar5 <= iVar45) break;
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar28;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar22;
                            *(int *)((long)p + 0x60) = iVar45;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar30;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_001063b4;
                          }
LAB_00107e6c:
                          uVar21 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109f26;
                        }
                        else {
LAB_00109f26:
                          uVar21 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        cVar31 = (char)iVar45;
                        iVar45 = iVar45 + 8;
                        uVar22 = uVar22 | uVar21 << (0x38U - cVar31 & 0x3f);
                      }
                      uVar21 = uVar22 << (bVar5 & 0x3f);
                      uVar29 = (int)(uVar22 >> (-bVar5 & 0x3f)) +
                               *(int *)(s_huge_match_base_len + (ulong)uVar30 * 4);
                    }
                    uVar30 = uStack_84;
                    puVar16 = (ushort *)((long)p + (uStack_78 >> 0x20) * 2 + 0x648);
                    uStack_84 = (int)uStack_78;
                    for (; uStack_68._4_4_ < 0x1000000; uStack_68._4_4_ = uStack_68._4_4_ << 8) {
                      *(ushort **)((long)p + 0xd0) = puVar16;
                      uVar22 = uVar21;
                      for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar28;
                            *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar22;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar29;
                            *(uint *)((long)p + 0x690) = uStack_84;
                            *(uint *)((long)p + 0x694) = uVar30;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00106dfb;
                          }
LAB_00107c66:
                          uStack_78 = (ulong)uStack_78._4_4_ << 0x20;
                          uVar21 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010b987;
                        }
                        else {
LAB_0010b987:
                          uVar21 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar21 = uVar22 << 8;
                      uVar46 = uVar46 - 8;
                      puVar16 = *(ushort **)((long)p + 0xd0);
                      uVar28 = uVar28 << 8 | (uint)(byte)(uVar22 >> 0x38);
                    }
                    uVar6 = *puVar16;
                    uVar39 = (uStack_68._4_4_ >> 0xb) * (uint)uVar6;
                    uStack_68._0_4_ = uVar28 - uVar39;
                    if (uVar28 < uVar39) {
                      *puVar16 = (short)(0x800 - uVar6 >> 5) + uVar6;
                      puVar16 = (ushort *)((long)p + (ulong)uStack_78._4_4_ * 2 + 0x660);
                      uStack_78._0_4_ = (int)uStack_80;
                      for (; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                        *(ushort **)((long)p + 0xd0) = puVar16;
                        uVar22 = uVar21;
                        for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar28;
                              *(uint *)((long)p + 0xbc) = uVar39;
                              *(ulong *)((long)p + 0x58) = uVar22;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6d4) = uVar29;
                              *(uint *)((long)p + 0x690) = uStack_84;
                              *(uint *)((long)p + 0x694) = uVar30;
                              *(int *)((long)p + 0x698) = (int)uStack_78;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_00105f0b;
                            }
LAB_001078ff:
                            uVar21 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_001097e1;
                          }
                          else {
LAB_001097e1:
                            uVar21 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                        }
                        uVar21 = uVar22 << 8;
                        uVar46 = uVar46 - 8;
                        puVar16 = *(ushort **)((long)p + 0xd0);
                        uVar28 = uVar28 << 8 | (uint)(byte)(uVar22 >> 0x38);
                      }
                      uVar6 = *puVar16;
                      uStack_68._4_4_ = (uVar39 >> 0xb) * (uint)uVar6;
                      uStack_68._0_4_ = uVar28 - uStack_68._4_4_;
                      if (uVar28 < uStack_68._4_4_) {
                        *puVar16 = (short)(0x800 - uVar6 >> 5) + uVar6;
                        uStack_68._0_4_ = uVar28;
                        iVar45 = uStack_80._4_4_;
                        uStack_80._4_4_ = (int)uStack_78;
                      }
                      else {
                        *puVar16 = uVar6 - (uVar6 >> 5);
                        uStack_68._4_4_ = uVar39 - uStack_68._4_4_;
                        iVar45 = (int)uStack_78;
                      }
                      uStack_78._0_4_ = iVar45;
                      uStack_80 = (uint *)CONCAT44(uStack_80._4_4_,uVar30);
                    }
                    else {
                      *puVar16 = uVar6 - (uVar6 >> 5);
                      uStack_68._4_4_ = uStack_68._4_4_ - uVar39;
                      uStack_78._0_4_ = uVar30;
                    }
                    uVar22 = (ulong)((uint)(6 < uStack_78._4_4_) * 3 + 8);
                  }
                  else {
                    *puVar16 = uVar6 - (uVar6 >> 5);
                    puVar16 = (ushort *)((long)p + (ulong)uVar30 * 2 + 0x630);
                    for (uVar39 = uVar39 - uStack_68._4_4_; uVar39 < 0x1000000; uVar39 = uVar39 << 8
                        ) {
                      *(ushort **)((long)p + 0xd0) = puVar16;
                      uVar22 = uVar21;
                      for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                        if (uStack_58 == *(uint **)((long)p + 0x30)) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                            *(uint *)((long)p + 0xbc) = uVar39;
                            *(ulong *)((long)p + 0x58) = uVar22;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = uStack_58;
                            *(uint *)((long)p + 0x6d4) = uVar29;
                            *(int *)((long)p + 0x690) = (int)uStack_78;
                            *(uint *)((long)p + 0x694) = uStack_84;
                            *(int *)((long)p + 0x698) = (int)uStack_80;
                            *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                            *(uint *)((long)p + 0x6a0) = uVar30;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            goto LAB_00106d21;
                          }
LAB_00107b73:
                          uVar21 = 0;
                          if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010b383;
                        }
                        else {
LAB_0010b383:
                          uVar21 = (ulong)(byte)*uStack_58;
                          uStack_58 = (uint *)((long)uStack_58 + 1);
                        }
                        uVar22 = uVar22 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar21 = uVar22 << 8;
                      uVar46 = uVar46 - 8;
                      puVar16 = *(ushort **)((long)p + 0xd0);
                      uStack_68._0_4_ = (uint)uStack_68 << 8 | (uint)(byte)(uVar22 >> 0x38);
                    }
                    uVar6 = *puVar16;
                    uStack_68._4_4_ = (uVar39 >> 0xb) * (uint)uVar6;
                    uVar28 = (uint)uStack_68 - uStack_68._4_4_;
                    if ((uint)uStack_68 < uStack_68._4_4_) {
                      *puVar16 = (short)(0x800 - uVar6 >> 5) + uVar6;
                      pqVar37 = (quasi_adaptive_huffman_data_model *)
                                ((long)p + (ulong)((uint)(6 < uVar30) * 0x90) + 0x318);
                      pdVar26 = *(decoder_tables **)
                                 ((long)p + (ulong)((uint)(6 < uVar30) * 0x90) + 0x380);
                      uStack_78._4_4_ = uVar30;
                      if ((int)uVar46 < 0x18) {
                        if (uStack_58 + 1 < *(uint **)((long)p + 0x30)) {
                          uVar28 = *uStack_58;
                          uVar46 = uVar46 + 0x20;
                          uVar21 = uVar21 | (ulong)(uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                                    (uVar28 & 0xff00) << 8 | uVar28 << 0x18) <<
                                            (-(char)uVar46 & 0x3fU);
                          uStack_58 = uStack_58 + 1;
                        }
                        else {
                          for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar37;
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6d4) = uVar29;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_00108ce3;
                            }
LAB_00108c4f:
                            uVar22 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) {
                              uVar22 = (ulong)(byte)*uStack_58;
                              uStack_58 = (uint *)((long)uStack_58 + 1);
                            }
                            uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar46 & 0x3f);
                          }
                        }
                      }
                      uVar28 = (uint)(ushort)(uVar21 >> 0x30);
                      if (uVar28 < pdVar26->m_table_max_code) {
                        uVar29 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                                 & 0xffff;
                        uVar28 = pdVar26->m_lookup[uVar21 >> (-(char)pdVar26->m_table_bits & 0x3fU)]
                                 >> 0x10;
                      }
                      else {
                        iVar45 = pdVar26->m_decode_start_code_size - 0x41;
                        do {
                          iVar36 = iVar45;
                          iVar45 = iVar36 + 1;
                        } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar28);
                        uVar29 = (int)(uVar21 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                                 pdVar26->m_val_ptrs[iVar36 + 0x40U];
                        uVar28 = 0;
                        if (uVar29 < pqVar37->m_total_syms) {
                          uVar28 = uVar29;
                        }
                        uVar29 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar28];
                        uVar28 = iVar36 + 0x41;
                      }
                      uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
                      puVar4 = (pqVar37->m_sym_freq).m_p + uVar29;
                      *puVar4 = *puVar4 + 1;
                      uVar46 = uVar46 - uVar28;
                      puVar1 = &pqVar37->m_symbols_until_update;
                      *puVar1 = *puVar1 - 1;
                      if (*puVar1 == 0) {
                        quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
                      }
                      uVar29 = uVar29 + 2;
                      uVar28 = 0;
                      if (uVar29 == 0x102) {
                        do {
                          while (uVar29 = uVar46, (int)uVar29 < 1) {
                            if (uStack_58 == *(uint **)((long)p + 0x30)) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                                *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                                *(ulong *)((long)p + 0x58) = uVar21;
                                *(uint *)((long)p + 0x60) = uVar29;
                                *(uint **)((long)p + 0x28) = uStack_58;
                                *(uint *)((long)p + 0x6d4) = uVar28;
                                *(int *)((long)p + 0x690) = (int)uStack_78;
                                *(uint *)((long)p + 0x694) = uStack_84;
                                *(int *)((long)p + 0x698) = (int)uStack_80;
                                *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                                *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                                *(int *)((long)p + 0x678) = (int)uStack_40;
                                goto LAB_00106e68;
                              }
LAB_00107ccf:
                              uVar22 = 0;
                              if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010a4d2;
                            }
                            else {
LAB_0010a4d2:
                              uVar22 = (ulong)(byte)*uStack_58;
                              uStack_58 = (uint *)((long)uStack_58 + 1);
                            }
                            uVar21 = uVar21 | uVar22 << (0x38U - (char)uVar29 & 0x3f);
                            uVar46 = uVar29 + 8;
                          }
                          uVar22 = uVar21 * 2;
                          if (-1 < (long)uVar21) break;
                          uVar28 = uVar28 + 1;
                          uVar21 = uVar22;
                          uVar46 = uVar29 - 1;
                        } while (uVar28 < 3);
                        iVar45 = uVar29 - 1;
                        while( true ) {
                          bVar5 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar28);
                          uVar46 = iVar45 - (uint)bVar5;
                          if ((int)(uint)bVar5 <= iVar45) break;
                          if (uStack_58 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                              *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar22;
                              *(int *)((long)p + 0x60) = iVar45;
                              *(uint **)((long)p + 0x28) = uStack_58;
                              *(uint *)((long)p + 0x6d4) = uVar28;
                              *(int *)((long)p + 0x690) = (int)uStack_78;
                              *(uint *)((long)p + 0x694) = uStack_84;
                              *(int *)((long)p + 0x698) = (int)uStack_80;
                              *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                              *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              goto LAB_00106628;
                            }
LAB_00107974:
                            uVar21 = 0;
                            if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_00109943;
                          }
                          else {
LAB_00109943:
                            uVar21 = (ulong)(byte)*uStack_58;
                            uStack_58 = (uint *)((long)uStack_58 + 1);
                          }
                          cVar31 = (char)iVar45;
                          iVar45 = iVar45 + 8;
                          uVar22 = uVar22 | uVar21 << (0x38U - cVar31 & 0x3f);
                        }
                        uVar21 = uVar22 << (bVar5 & 0x3f);
                        uVar29 = (int)(uVar22 >> (-bVar5 & 0x3f)) +
                                 *(int *)(s_huge_match_base_len + (ulong)uVar28 * 4);
                      }
                      uVar30 = (uint)(6 < uStack_78._4_4_) * 3 + 8;
                    }
                    else {
                      *puVar16 = uVar6 - (uVar6 >> 5);
                      uStack_68._4_4_ = uVar39 - uStack_68._4_4_;
                      uVar30 = (uint)(6 < uVar30) * 2 + 9;
                      uStack_68._0_4_ = uVar28;
                    }
                    uVar22 = (ulong)uVar30;
                  }
                }
                iVar45 = (int)uStack_40;
                uVar17 = uStack_40 & 0xffffffff;
                if ((uVar17 < (ulong)(long)(int)uStack_78) ||
                   (uStack_40 = (ulong)(iVar45 + uVar29), uVar43 < uStack_40)) {
                  *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                  *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
                  *(ulong *)((long)p + 0x58) = uVar21;
                  *(uint *)((long)p + 0x60) = uVar46;
                  *(uint **)((long)p + 0x28) = uStack_58;
                  **(long **)((long)p + 0x108) = (long)uStack_58 - *(long *)((long)p + 0x20);
                  **(undefined8 **)((long)p + 0x118) = 0;
                  goto LAB_0010b8d4;
                }
                uVar28 = iVar45 - (int)uStack_78;
                if ((int)uStack_78 == 1) {
                  if ((7 < uVar29) || (uVar29 != 0)) {
                    memset(puVar8 + uVar17,(uint)(byte)puVar8[uVar28],(ulong)uVar29);
                  }
                }
                else if ((uVar29 < 8) || ((int)uStack_78 < (int)uVar29)) {
                  if (0 < (int)uVar29) {
                    iVar45 = uVar29 + 1;
                    puVar27 = puVar8;
                    do {
                      puVar27[uVar17] = puVar27[uVar28];
                      iVar45 = iVar45 + -1;
                      puVar27 = puVar27 + 1;
                    } while (1 < iVar45);
                  }
                }
                else {
                  memcpy(puVar8 + uVar17,puVar8 + uVar28,(ulong)uVar29);
                }
                goto LAB_00109240;
              }
              if (uStack_58 == *(uint **)((long)p + 0x30)) goto code_r0x0010ac3c;
LAB_0010a0f0:
              uVar21 = (ulong)(byte)*uStack_58;
              uStack_58 = (uint *)((long)uStack_58 + 1);
            } while( true );
          }
LAB_00106a2b:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x2ae;
        }
      }
      else if (iVar45 < 0x2ea) {
        if (iVar45 != 0x2cd) {
          if (iVar45 == 0x2e4) {
LAB_0010621c:
            *(undefined4 *)((long)p + 8) = 0x2e4;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          goto switchD_00105f66_caseD_458;
        }
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uVar30 = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar22 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          goto LAB_0010859b;
        }
LAB_001075f0:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2cd;
      }
      else if (iVar45 == 0x2ea) {
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80 = *(uint **)((long)p + 0x698);
          uVar30 = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uVar28 = *(uint *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_0010b0d1;
        }
LAB_0010b14e:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2ea;
      }
      else {
        if (iVar45 != 0x304) goto switchD_00105f66_caseD_458;
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uVar28 = *(uint *)((long)p + 0x6d0);
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_00109096;
        }
LAB_0010913d:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x304;
      }
    }
    else if (iVar45 < 0x3ae) {
      if (iVar45 < 0x34d) {
        if (iVar45 < 0x32f) {
          if (iVar45 == 0x318) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar32 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar32;
            uVar21 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar21;
            if (uVar21 == 0) {
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80 = *(uint **)((long)p + 0x698);
              uVar22 = (ulong)*(uint *)((long)p + 0x6a0);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              uStack_40 = 0;
              goto LAB_00109240;
            }
            uVar43 = *puVar7;
            if (uVar21 < *puVar7) {
              uVar43 = uVar21;
            }
            *(ulong *)((long)p + 0x6c0) = uVar43;
            if ((*(byte *)((long)p + 0x144) & 2) == 0) {
              memcpy(puVar8,pvVar32,uVar43);
            }
            else {
              uVar43 = *(ulong *)((long)p + 0x6c0);
              if (uVar43 != 0) {
                uVar21 = 0;
                do {
                  sVar50 = uVar43 - uVar21;
                  if (0x1fff < sVar50) {
                    sVar50 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x110) + uVar21),
                         (void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50);
                  uVar15 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50,
                                   *(uint *)((long)p + 0xf8));
                  *(uint *)((long)p + 0xf8) = uVar15;
                  uVar21 = uVar21 + sVar50;
                  uVar43 = *(ulong *)((long)p + 0x6c0);
                } while (uVar21 < uVar43);
              }
            }
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = *(undefined8 *)((long)p + 0x6c0);
            *(undefined4 *)((long)p + 8) = 0x318;
            goto LAB_00108ab8;
          }
          if (iVar45 == 0x329) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uVar29 = *(uint *)((long)p + 0x6d4);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uVar30 = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uVar39 = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar22 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              goto LAB_001082bf;
            }
LAB_00107315:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x329;
          }
          else {
            if (iVar45 != 0x32c) goto switchD_00105f66_caseD_458;
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uVar29 = *(uint *)((long)p + 0x6d4);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uVar30 = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar28 = *(uint *)((long)p + 0xb8);
              uVar39 = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar22 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              goto LAB_00107d7d;
            }
LAB_0010628d:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x32c;
          }
        }
        else if (iVar45 < 0x33f) {
          if (iVar45 == 0x32f) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uVar29 = *(uint *)((long)p + 0x6d4);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
              uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
              uVar30 = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uVar39 = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar22 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              goto LAB_00107b73;
            }
LAB_00106d21:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x32f;
          }
          else {
            if (iVar45 != 0x336) goto switchD_00105f66_caseD_458;
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
              uVar29 = *(uint *)((long)p + 0x6d4);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80 = *(uint **)((long)p + 0x698);
              uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
              pdVar26 = pqVar37->m_pDecode_tables;
              goto LAB_00108c4f;
            }
LAB_00108ce3:
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x336;
          }
        }
        else if (iVar45 == 0x33f) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar28 = *(uint *)((long)p + 0x6d4);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_00107ccf;
          }
LAB_00106e68:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x33f;
        }
        else {
          if (iVar45 != 0x344) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar28 = *(uint *)((long)p + 0x6d4);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar22 = *(ulong *)((long)p + 0x58);
            iVar45 = *(int *)((long)p + 0x60);
            goto LAB_00107974;
          }
LAB_00106628:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x344;
        }
      }
      else if (iVar45 < 0x35f) {
        if (iVar45 == 0x34d) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar29 = *(uint *)((long)p + 0x6d4);
            uStack_78 = (ulong)*(uint *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80 = *(uint **)((long)p + 0x698);
            uVar30 = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar28 = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
            pdVar26 = pqVar37->m_pDecode_tables;
            goto LAB_0010b44a;
          }
LAB_0010b52f:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x34d;
        }
        else if (iVar45 == 0x356) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar30 = *(uint *)((long)p + 0x6d4);
            uStack_78._0_4_ = *(undefined4 *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(undefined4 *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar28 = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_001083a5;
          }
LAB_001073ef:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x356;
        }
        else {
          if (iVar45 != 0x35b) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar30 = *(uint *)((long)p + 0x6d4);
            uStack_78._0_4_ = *(undefined4 *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(undefined4 *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar28 = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar22 = *(ulong *)((long)p + 0x58);
            iVar45 = *(int *)((long)p + 0x60);
            goto LAB_00107e6c;
          }
LAB_001063b4:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x35b;
        }
      }
      else if (iVar45 < 899) {
        if (iVar45 == 0x35f) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar29 = *(uint *)((long)p + 0x6d4);
            uStack_84 = *(int *)((long)p + 0x690);
            uVar30 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(int *)((long)p + 0x698);
            uStack_80._4_4_ = *(int *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar28 = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar22 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            goto LAB_00107c66;
          }
LAB_00106dfb:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x35f;
        }
        else {
          if (iVar45 != 0x368) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar29 = *(uint *)((long)p + 0x6d4);
            uStack_84 = *(int *)((long)p + 0x690);
            uVar30 = *(int *)((long)p + 0x694);
            uStack_78._0_4_ = *(int *)((long)p + 0x698);
            uStack_80._4_4_ = *(int *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar28 = *(uint *)((long)p + 0xb8);
            uVar39 = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar22 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            goto LAB_001078ff;
          }
LAB_00105f0b:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x368;
        }
      }
      else if (iVar45 == 899) {
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uVar29 = *(uint *)((long)p + 0x6d4);
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80 = *(uint **)((long)p + 0x698);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_0010ba41;
        }
LAB_0010bb4c:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 899;
      }
      else {
        if (iVar45 != 0x3a5) goto switchD_00105f66_caseD_458;
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          iVar45 = *(int *)((long)p + 0x6d4);
          uStack_4c = *(uint *)((long)p + 0x6d8);
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_00108ef0;
        }
LAB_00108f87:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3a5;
      }
    }
    else if (iVar45 < 0x442) {
      if (iVar45 < 0x3cb) {
        if (iVar45 == 0x3ae) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar28 = *(uint *)((long)p + 0x6d4);
            uStack_4c = *(uint *)((long)p + 0x6d8);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_00108111;
          }
LAB_0010718f:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3ae;
        }
        else if (iVar45 == 0x3b3) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar28 = *(uint *)((long)p + 0x6d4);
            uStack_4c = *(uint *)((long)p + 0x6d8);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar22 = *(ulong *)((long)p + 0x58);
            iVar45 = *(int *)((long)p + 0x60);
            goto LAB_00108332;
          }
LAB_00107382:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3b3;
        }
        else {
          if (iVar45 != 0x3c4) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar29 = *(uint *)((long)p + 0x6d4);
            uStack_4c = *(uint *)((long)p + 0x6d8);
            uVar28 = *(uint *)((long)p + 0x6e0);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            goto LAB_00107dfb;
          }
LAB_00106323:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3c4;
        }
      }
      else {
        if (0x3f3 < iVar45) {
          if (iVar45 == 0x3f4) {
LAB_0010b8d4:
            *(undefined4 *)((long)p + 8) = 0x3f4;
            return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
          }
          if (iVar45 == 0x40e) {
            lVar51 = *(long *)((long)p + 0x100);
            lVar9 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar51;
            *(long *)((long)p + 0x28) = lVar51;
            *(long *)((long)p + 0x38) = lVar9;
            *(long *)((long)p + 0x30) = lVar51 + lVar9;
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar32 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar32;
            uVar21 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar21;
            if (uVar21 == 0) {
              iVar45 = *(int *)((long)p + 0x6d4);
              uStack_78._0_4_ = *(int *)((long)p + 0x690);
              uStack_84 = *(int *)((long)p + 0x694);
              uStack_80 = *(uint **)((long)p + 0x698);
              uVar22 = (ulong)*(uint *)((long)p + 0x6a0);
              uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
              uStack_58 = *(uint **)((long)p + 0x28);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              uStack_40 = 0;
              if (iVar45 == 1) goto LAB_00109240;
              puVar27 = *(undefined1 **)((long)p + 0x6e8);
              uStack_40 = 0;
              do {
                puVar25 = puVar27 + 1;
                puVar8[uStack_40] = *puVar27;
                puVar27 = puVar25;
                if (puVar25 == puVar8 + uVar43) {
                  puVar27 = puVar8;
                }
                uStack_40 = uStack_40 + 1;
                if (iVar45 + -1 == (int)uStack_40) goto LAB_00109240;
              } while( true );
            }
            uVar43 = *puVar7;
            if (uVar21 < *puVar7) {
              uVar43 = uVar21;
            }
            *(ulong *)((long)p + 0x6c0) = uVar43;
            if ((*(byte *)((long)p + 0x144) & 2) == 0) {
              memcpy(puVar8,pvVar32,uVar43);
            }
            else {
              uVar43 = *(ulong *)((long)p + 0x6c0);
              if (uVar43 != 0) {
                uVar21 = 0;
                do {
                  sVar50 = uVar43 - uVar21;
                  if (0x1fff < sVar50) {
                    sVar50 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x110) + uVar21),
                         (void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50);
                  uVar15 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50,
                                   *(uint *)((long)p + 0xf8));
                  *(uint *)((long)p + 0xf8) = uVar15;
                  uVar21 = uVar21 + sVar50;
                  uVar43 = *(ulong *)((long)p + 0x6c0);
                } while (uVar21 < uVar43);
              }
            }
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            **(undefined8 **)((long)p + 0x118) = *(undefined8 *)((long)p + 0x6c0);
            *(undefined4 *)((long)p + 8) = 0x40e;
            goto LAB_00108ab8;
          }
          goto switchD_00105f66_caseD_458;
        }
        if (iVar45 == 0x3cb) {
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar29 = *(uint *)((long)p + 0x6d4);
            uStack_4c = *(uint *)((long)p + 0x6d8);
            uVar28 = *(uint *)((long)p + 0x6e0);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
            uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            goto LAB_00107bed;
          }
LAB_00106d8e:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3cb;
        }
        else {
          if (iVar45 != 0x3d4) goto switchD_00105f66_caseD_458;
          lVar51 = *(long *)((long)p + 0x100);
          lVar9 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar51;
          *(long *)((long)p + 0x28) = lVar51;
          *(long *)((long)p + 0x38) = lVar9;
          *(long *)((long)p + 0x30) = lVar51 + lVar9;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
            uVar29 = *(uint *)((long)p + 0x6d4);
            uStack_4c = *(uint *)((long)p + 0x6d8);
            iVar45 = *(int *)((long)p + 0x6dc);
            uStack_78._0_4_ = *(int *)((long)p + 0x690);
            uStack_84 = *(int *)((long)p + 0x694);
            uStack_80 = *(uint **)((long)p + 0x698);
            uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
            uStack_58 = *(uint **)((long)p + 0x28);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
            pdVar26 = pqVar37->m_pDecode_tables;
            goto LAB_00108df5;
          }
LAB_00108e9c:
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3d4;
        }
      }
    }
    else {
      if (0x47b < iVar45) {
        if ((iVar45 == 0x47c) || (iVar45 == 0x482)) {
          **(undefined8 **)((long)p + 0x108) = 0;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x482;
        }
switchD_00105f66_caseD_458:
        return *(lzham_decompress_status_t *)((long)p + 0x160);
      }
      switch(iVar45) {
      case 0x457:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar32 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar32;
        uVar43 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar43;
        if (uVar43 != 0) {
          uVar21 = *puVar7;
          if (uVar43 < *puVar7) {
            uVar21 = uVar43;
          }
          *(ulong *)((long)p + 0x6c0) = uVar21;
          if ((*(byte *)((long)p + 0x144) & 2) == 0) {
            memcpy(puVar8,pvVar32,uVar21);
          }
          else {
            uVar43 = *(ulong *)((long)p + 0x6c0);
            if (uVar43 != 0) {
              uVar21 = 0;
              do {
                sVar50 = uVar43 - uVar21;
                if (0x1fff < sVar50) {
                  sVar50 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x110) + uVar21),
                       (void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50);
                uVar15 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar21),sVar50,
                                 *(uint *)((long)p + 0xf8));
                *(uint *)((long)p + 0xf8) = uVar15;
                uVar21 = uVar21 + sVar50;
                uVar43 = *(ulong *)((long)p + 0x6c0);
              } while (uVar21 < uVar43);
            }
          }
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          **(undefined8 **)((long)p + 0x118) = *(undefined8 *)((long)p + 0x6c0);
          *(undefined4 *)((long)p + 8) = 0x457;
          goto LAB_00108ab8;
        }
        uStack_78._0_4_ = *(int *)((long)p + 0x690);
        uStack_84 = *(int *)((long)p + 0x694);
        uStack_80 = *(uint **)((long)p + 0x698);
        uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
        uStack_40 = (ulong)*(uint *)((long)p + 0x678);
        uStack_68 = *(ulong *)((long)p + 0xb8);
        uStack_58 = *(uint **)((long)p + 0x28);
        uVar21 = *(ulong *)((long)p + 0x58);
        uVar46 = *(uint *)((long)p + 0x60);
LAB_0010bce2:
        uVar38 = uStack_68._4_4_;
        if (*(int *)((long)p + 0x160) == 3) {
          if ((uVar46 & 7) != 0) {
            for (; (int)uVar46 < 0; uVar46 = uVar46 + 8) {
              if (uStack_58 == *(uint **)((long)p + 0x30)) {
                if (*(char *)((long)p + 0x40) == '\0') {
                  *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                  *(undefined4 *)((long)p + 0xbc) = uVar38;
                  *(ulong *)((long)p + 0x58) = uVar21;
                  *(uint *)((long)p + 0x60) = uVar46;
                  *(uint **)((long)p + 0x28) = uStack_58;
                  *(int *)((long)p + 0x690) = (int)uStack_78;
                  *(uint *)((long)p + 0x694) = uStack_84;
                  *(int *)((long)p + 0x698) = (int)uStack_80;
                  *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                  *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                  *(int *)((long)p + 0x678) = (int)uStack_40;
                  goto LAB_00106c47;
                }
LAB_00107812:
                uStack_68 = (ulong)(uint)uStack_68;
                if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010be01;
                uVar43 = 0;
              }
              else {
LAB_0010be01:
                uVar43 = (ulong)(byte)*uStack_58;
                uStack_58 = (uint *)((long)uStack_58 + 1);
              }
              uVar21 = uVar21 | uVar43 << (0x38U - (char)uVar46 & 0x3f);
            }
            uVar21 = uVar21 << ((byte)uVar46 & 7);
            uVar46 = uVar46 & 0x7ffffff8;
          }
          for (; (int)uVar46 < 0x10; uVar46 = uVar46 + 8) {
            if (uStack_58 == *(uint **)((long)p + 0x30)) {
              if (*(char *)((long)p + 0x40) == '\0') {
                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                *(undefined4 *)((long)p + 0xbc) = uVar38;
                *(ulong *)((long)p + 0x58) = uVar21;
                *(uint *)((long)p + 0x60) = uVar46;
                *(uint **)((long)p + 0x28) = uStack_58;
                *(int *)((long)p + 0x690) = (int)uStack_78;
                *(uint *)((long)p + 0x694) = uStack_84;
                *(int *)((long)p + 0x698) = (int)uStack_80;
                *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                *(int *)((long)p + 0x678) = (int)uStack_40;
                goto LAB_00106cb4;
              }
LAB_00107885:
              uStack_68 = (ulong)(uint)uStack_68;
              if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010bef9;
              uVar43 = 0;
            }
            else {
LAB_0010bef9:
              uVar43 = (ulong)(byte)*uStack_58;
              uStack_58 = (uint *)((long)uStack_58 + 1);
            }
            uVar21 = uVar21 | uVar43 << (0x38U - (char)uVar46 & 0x3f);
          }
          *(uint *)((long)p + 0x6cc) = (uint)(ushort)(uVar21 >> 0x30);
          uVar43 = uVar21 << 0x10;
          for (iVar45 = uVar46 - 0x10; iVar36 = (int)uStack_40, iVar45 < 0x10; iVar45 = iVar45 + 8)
          {
            if (uStack_58 == *(uint **)((long)p + 0x30)) {
              if (*(char *)((long)p + 0x40) == '\0') {
                *(uint *)((long)p + 0xb8) = (uint)uStack_68;
                *(undefined4 *)((long)p + 0xbc) = uVar38;
                *(ulong *)((long)p + 0x58) = uVar43;
                *(int *)((long)p + 0x60) = iVar45;
                *(uint **)((long)p + 0x28) = uStack_58;
                *(int *)((long)p + 0x690) = (int)uStack_78;
                *(uint *)((long)p + 0x694) = uStack_84;
                *(int *)((long)p + 0x698) = (int)uStack_80;
                *(int *)((long)p + 0x69c) = uStack_80._4_4_;
                *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
                *(int *)((long)p + 0x678) = iVar36;
                goto LAB_00106bda;
              }
LAB_0010776e:
              uStack_68 = (ulong)(uint)uStack_68;
              if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010c0b8;
              uVar21 = 0;
            }
            else {
LAB_0010c0b8:
              uVar21 = (ulong)(byte)*uStack_58;
              uStack_58 = (uint *)((long)uStack_58 + 1);
            }
            uVar43 = uVar43 | uVar21 << (0x38U - (char)iVar45 & 0x3f);
          }
          uVar21 = uVar43 << 0x10;
          uVar46 = iVar45 - 0x10;
          uVar28 = *(int *)((long)p + 0x6cc) << 0x10 | (uint)(ushort)(uVar43 >> 0x30);
          *(uint *)((long)p + 0x6cc) = uVar28;
          lVar51 = 0xf8;
          if ((*(byte *)((long)p + 0x144) & 2) != 0) {
            uVar15 = adler32(puVar8,uStack_40 & 0xffffffff,1);
            *(uint *)((long)p + 0xf8) = uVar15;
            if (*(uint *)((long)p + 0x6cc) == uVar15) goto LAB_0010c03b;
            uVar28 = 8;
            lVar51 = 0x160;
          }
          *(uint *)((long)p + lVar51) = uVar28;
        }
        else {
          iVar36 = (int)uStack_40;
        }
LAB_0010c03b:
        *(uint *)((long)p + 0xb8) = (uint)uStack_68;
        *(undefined4 *)((long)p + 0xbc) = uVar38;
        *(ulong *)((long)p + 0x58) = uVar21;
        *(uint *)((long)p + 0x60) = uVar46;
        *(uint **)((long)p + 0x28) = uStack_58;
        uVar18 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x18));
        **(uint64 **)((long)p + 0x108) = uVar18;
        **(ulong **)((long)p + 0x118) = (ulong)(uint)(iVar36 - *(int *)((long)p + 0x67c));
        *(int *)((long)p + 0x67c) = iVar36;
        *(undefined4 *)((long)p + 8) = 0x47c;
        return *(lzham_decompress_status_t *)((long)p + 0x160);
      case 0x458:
      case 0x459:
      case 0x45a:
      case 0x45b:
      case 0x45c:
      case 0x45e:
        goto switchD_00105f66_caseD_458;
      case 0x45d:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uVar38 = *(undefined4 *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          goto LAB_00107812;
        }
LAB_00106c47:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x45d;
        break;
      case 0x45f:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uVar38 = *(undefined4 *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          goto LAB_00107885;
        }
LAB_00106cb4:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x45f;
        break;
      case 0x460:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uVar38 = *(undefined4 *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar43 = *(ulong *)((long)p + 0x58);
          iVar45 = *(int *)((long)p + 0x60);
          goto LAB_0010776e;
        }
LAB_00106bda:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x460;
        break;
      default:
        if (iVar45 != 0x442) goto switchD_00105f66_caseD_458;
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          uStack_78._0_4_ = *(int *)((long)p + 0x690);
          uStack_84 = *(int *)((long)p + 0x694);
          uStack_80._0_4_ = *(undefined4 *)((long)p + 0x698);
          uStack_80._4_4_ = *(undefined4 *)((long)p + 0x69c);
          uStack_78._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_68._4_4_ = *(uint *)((long)p + 0xbc);
          uStack_58 = *(uint **)((long)p + 0x28);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          goto LAB_001086ae;
        }
LAB_00106b6d:
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x442;
      }
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  lVar51 = 1L << (*(byte *)((long)p + 0x13c) & 0x3f);
  this = (symbol_codec *)((long)p + 0x18);
  uVar46 = (uint)lVar51;
  uVar28 = uVar46 - 1;
  __dest = *(byte **)((long)p + 0xf0);
  iVar45 = *(int *)((long)p + 8);
  plVar40 = (lzham_decompressor *)p;
  if (iVar45 < 0x318) {
    if (iVar45 < 0x22b) {
      if (iVar45 < 0x1e2) {
        if (iVar45 < 0x19a) {
          if (iVar45 == 0) {
            uVar30 = 0;
            if ((ulong)*(uint *)((long)p + 0x148) != 0) {
              memcpy(__dest,*(void **)((long)p + 0x150),(ulong)*(uint *)((long)p + 0x148));
              uVar29 = (((lzham_decompressor *)p)->m_params).m_num_seed_bytes;
              uVar30 = 0;
              if (uVar29 < uVar46) {
                ((lzham_decompressor *)p)->m_seed_bytes_to_ignore_when_flushing = uVar29;
                uVar30 = uVar29;
              }
            }
            uStack_68 = 0;
            bVar54 = symbol_codec::start_decoding
                               (this,((lzham_decompressor *)p)->m_pIn_buf,
                                *((lzham_decompressor *)p)->m_pIn_buf_size,
                                ((lzham_decompressor *)p)->m_no_more_input_bytes_flag,
                                (need_bytes_func_ptr)0x0,(void *)0x0);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            uStack_84 = (((lzham_decompressor *)p)->m_codec).m_arith_value;
            uStack_88 = (((lzham_decompressor *)p)->m_codec).m_arith_length;
            uStack_80 = (uint *)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next;
            bVar47 = (((lzham_decompressor *)p)->m_codec).m_bit_buf;
            uVar29 = (((lzham_decompressor *)p)->m_codec).m_bit_count;
            iVar45 = 0;
            iVar44 = 0;
            iVar36 = 0;
            iStack_a4 = 0;
            uStack_a0._4_4_ = 0;
            iStack_8c = 0;
            plVar40 = (lzham_decompressor *)p;
            iVar49 = 0;
            uStack_a0._0_4_ = 0;
            if (((((lzham_decompressor *)p)->m_params).m_decompress_flags & 4) != 0) {
              for (; uStack_a0._4_4_ = iVar49, (int)uVar29 < 8; uVar29 = uVar29 + 8) {
                if (uStack_80 == (uint *)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end) {
                  if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
                    (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                    (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                    (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                    (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                    (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                    ((lzham_decompressor *)p)->m_match_hist0 = iVar36;
                    ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                    ((lzham_decompressor *)p)->m_match_hist2 = iVar44;
                    ((lzham_decompressor *)p)->m_match_hist3 = iVar45;
                    ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                    ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
                    goto LAB_0010daf4;
                  }
LAB_0010e971:
                  if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end)
                  goto LAB_0010f58c;
                  uVar43 = 0;
                }
                else {
LAB_0010f58c:
                  uVar43 = (ulong)(byte)*uStack_80;
                  uStack_80 = (uint *)((long)uStack_80 + 1);
                }
                bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
                iVar49 = uStack_a0._4_4_;
              }
              ((lzham_decompressor *)p)->m_z_cmf = (uint)(byte)(bVar47 >> 0x38);
              uVar43 = bVar47 << 8;
              for (iVar49 = uVar29 - 8; iVar49 < 8; iVar49 = iVar49 + 8) {
                if (uStack_80 == (uint *)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end) {
                  if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
                    (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                    (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                    (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
                    (((lzham_decompressor *)p)->m_codec).m_bit_count = iVar49;
                    (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                    ((lzham_decompressor *)p)->m_match_hist0 = iVar36;
                    ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                    ((lzham_decompressor *)p)->m_match_hist2 = iVar44;
                    ((lzham_decompressor *)p)->m_match_hist3 = iVar45;
                    ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                    ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
                    goto LAB_0010c9c9;
                  }
LAB_0010e642:
                  if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end)
                  goto LAB_0010f6f4;
                  uVar21 = 0;
                }
                else {
LAB_0010f6f4:
                  uVar21 = (ulong)(byte)*uStack_80;
                  uStack_80 = (uint *)((long)uStack_80 + 1);
                }
                uVar43 = uVar43 | uVar21 << (0x38U - (char)iVar49 & 0x3f);
              }
              uVar29 = (uint)(byte)(uVar43 >> 0x38);
              ((lzham_decompressor *)p)->m_z_flg = uVar29;
              if ((((lzham_decompressor *)p)->m_z_cmf & 0xf) != 0xe) {
                return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
              }
              if ((((lzham_decompressor *)p)->m_z_cmf << 8 | uVar29) % 0x1f != 0) {
                return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
              }
              bVar47 = uVar43 << 8;
              uVar29 = iVar49 - 8;
              iStack_a4 = iVar44;
              plVar40 = (lzham_decompressor *)p;
              iStack_8c = iVar36;
              uStack_a0._0_4_ = iVar45;
              if ((uVar43 >> 0x38 & 0x20) != 0) {
                if ((((lzham_decompressor *)p)->m_params).m_pSeed_bytes == (void *)0x0) {
                  return LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES;
                }
                ((lzham_decompressor *)p)->m_z_dict_adler32 = 0;
                ((lzham_decompressor *)p)->m_tmp = 0;
                while (bVar48 = bVar47, plVar40->m_tmp < 4) {
                  for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
                    if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                      psVar13 = &plVar40->m_codec;
                      plVar40 = (lzham_decompressor *)p;
                      if (psVar13->m_decode_buf_eof == false) {
                        (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                        (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                        (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
                        (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                        (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80
                        ;
                        ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                        ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                        ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                        ((lzham_decompressor *)p)->m_match_hist3 = iVar45;
                        ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                        ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
                        goto LAB_0010d4a7;
                      }
LAB_0010e50a:
                      p = plVar40;
                      if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110bf4;
                      uVar43 = 0;
                    }
                    else {
LAB_00110bf4:
                      uVar43 = (ulong)(byte)*uStack_80;
                      uStack_80 = (uint *)((long)uStack_80 + 1);
                    }
                    cVar31 = (char)uVar29;
                    bVar48 = bVar48 | uVar43 << (0x38U - cVar31 & 0x3f);
                  }
                  bVar47 = bVar48 << 8;
                  uVar29 = uVar29 - 8;
                  plVar40->m_z_dict_adler32 =
                       plVar40->m_z_dict_adler32 << 8 | (uint)(byte)(bVar48 >> 0x38);
                  plVar40->m_tmp = plVar40->m_tmp + 1;
                }
                uVar15 = adler32((plVar40->m_params).m_pSeed_bytes,
                                 (ulong)(plVar40->m_params).m_num_seed_bytes,1);
                plVar40 = (lzham_decompressor *)p;
                uStack_a0._0_4_ = iVar45;
                if (uVar15 != ((lzham_decompressor *)p)->m_z_dict_adler32) {
                  return LZHAM_DECOMP_STATUS_FAILED_BAD_SEED_BYTES;
                }
              }
            }
            uVar15 = (plVar40->m_params).m_table_max_update_interval;
            uVar53 = (plVar40->m_params).m_table_update_interval_slow_rate;
            if (uVar53 == 0 && uVar15 == 0) {
              uVar39 = (plVar40->m_params).m_table_update_rate;
              uVar24 = 0x14;
              if (uVar39 < 0x14) {
                uVar24 = uVar39;
              }
              uVar43 = 7;
              if (uVar39 != 0) {
                uVar43 = (ulong)(uVar24 - 1);
              }
              uVar15 = (uint)*(ushort *)(g_table_update_settings + uVar43 * 4);
              uVar53 = (uint)*(ushort *)(g_table_update_settings + uVar43 * 4 + 2);
            }
            pqVar37 = &plVar40->m_lit_table;
            bVar54 = quasi_adaptive_huffman_data_model::init2
                               (pqVar37,plVar40->m_malloc_context,false,0x100,uVar15,uVar53,
                                (uint16 *)0x0);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar54 = quasi_adaptive_huffman_data_model::assign(&plVar40->m_delta_lit_table,pqVar37);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar54 = quasi_adaptive_huffman_data_model::init2
                               (&plVar40->m_main_table,plVar40->m_malloc_context,false,
                                (plVar40->m_lzBase).m_num_lzx_slots * 8 - 6,uVar15,uVar53,
                                (uint16 *)0x0);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            puVar8 = &plVar40->field_0x318;
            bVar54 = quasi_adaptive_huffman_data_model::init2
                               ((quasi_adaptive_huffman_data_model *)puVar8,
                                plVar40->m_malloc_context,false,0x101,uVar15,uVar53,(uint16 *)0x0);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar54 = quasi_adaptive_huffman_data_model::assign
                               ((quasi_adaptive_huffman_data_model *)&plVar40->field_0x3a8,
                                (quasi_adaptive_huffman_data_model *)puVar8);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            puVar8 = &plVar40->field_0x438;
            bVar54 = quasi_adaptive_huffman_data_model::init2
                               ((quasi_adaptive_huffman_data_model *)puVar8,
                                plVar40->m_malloc_context,false,0xfa,uVar15,uVar53,(uint16 *)0x0);
            if (!bVar54) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar54 = quasi_adaptive_huffman_data_model::assign
                               ((quasi_adaptive_huffman_data_model *)&plVar40->field_0x4c8,
                                (quasi_adaptive_huffman_data_model *)puVar8);
            if (bVar54) {
              bVar54 = quasi_adaptive_huffman_data_model::init2
                                 (&plVar40->m_dist_lsb_table,plVar40->m_malloc_context,false,0x10,
                                  uVar15,uVar53,(uint16 *)0x0);
              uVar21 = (ulong)uVar30;
              p = plVar40;
              if (bVar54) goto LAB_0011088d;
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
          }
          if (iVar45 == 0x188) {
            lVar9 = *(long *)((long)p + 0x100);
            lVar10 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar9;
            *(long *)((long)p + 0x28) = lVar9;
            *(long *)((long)p + 0x38) = lVar10;
            *(long *)((long)p + 0x30) = lVar9 + lVar10;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
              iVar36 = *(int *)((long)p + 0x690);
              uStack_a0._4_4_ = *(int *)((long)p + 0x694);
              iVar44 = *(int *)((long)p + 0x698);
              iVar45 = *(int *)((long)p + 0x69c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar30 = *(uint *)((long)p + 0x678);
              uStack_84 = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uStack_80 = *(uint **)((long)p + 0x28);
              bVar47 = *(bit_buf_t *)((long)p + 0x58);
              uVar29 = *(uint *)((long)p + 0x60);
              goto LAB_0010e971;
            }
LAB_0010daf4:
            *((lzham_decompressor *)p)->m_pIn_buf_size =
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
            *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
            ((lzham_decompressor *)p)->m_state = 0x188;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar45 == 0x189) {
            lVar9 = *(long *)((long)p + 0x100);
            lVar10 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar9;
            *(long *)((long)p + 0x28) = lVar9;
            *(long *)((long)p + 0x38) = lVar10;
            *(long *)((long)p + 0x30) = lVar9 + lVar10;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
              iVar36 = *(int *)((long)p + 0x690);
              uStack_a0._4_4_ = *(int *)((long)p + 0x694);
              iVar44 = *(int *)((long)p + 0x698);
              iVar45 = *(int *)((long)p + 0x69c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar30 = *(uint *)((long)p + 0x678);
              uStack_84 = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uStack_80 = *(uint **)((long)p + 0x28);
              uVar43 = *(ulong *)((long)p + 0x58);
              iVar49 = *(int *)((long)p + 0x60);
              goto LAB_0010e642;
            }
LAB_0010c9c9:
            *((lzham_decompressor *)p)->m_pIn_buf_size =
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
            *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
            ((lzham_decompressor *)p)->m_state = 0x189;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
        else if (iVar45 < 0x1d8) {
          if (iVar45 == 0x19a) {
            lVar9 = *(long *)((long)p + 0x100);
            lVar10 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar9;
            *(long *)((long)p + 0x28) = lVar9;
            *(long *)((long)p + 0x38) = lVar10;
            *(long *)((long)p + 0x30) = lVar9 + lVar10;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
              iStack_8c = *(int *)((long)p + 0x690);
              uStack_a0._4_4_ = *(int *)((long)p + 0x694);
              iStack_a4 = *(int *)((long)p + 0x698);
              iVar45 = *(int *)((long)p + 0x69c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar30 = *(uint *)((long)p + 0x678);
              uStack_84 = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uStack_80 = *(uint **)((long)p + 0x28);
              bVar48 = *(bit_buf_t *)((long)p + 0x58);
              uVar29 = *(uint *)((long)p + 0x60);
              goto LAB_0010e50a;
            }
LAB_0010d4a7:
            *((lzham_decompressor *)p)->m_pIn_buf_size =
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
            *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
            ((lzham_decompressor *)p)->m_state = 0x19a;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar45 == 0x1d2) {
            lVar9 = *(long *)((long)p + 0x100);
            lVar10 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar9;
            *(long *)((long)p + 0x28) = lVar9;
            *(long *)((long)p + 0x38) = lVar10;
            *(long *)((long)p + 0x30) = lVar9 + lVar10;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
              iStack_8c = *(int *)((long)p + 0x690);
              uStack_a0._4_4_ = *(int *)((long)p + 0x694);
              iStack_a4 = *(int *)((long)p + 0x698);
              uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar21 = (ulong)*(uint *)((long)p + 0x678);
              uStack_84 = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uStack_80 = *(uint **)((long)p + 0x28);
              bVar47 = *(ulong *)((long)p + 0x58);
              uVar29 = *(uint *)((long)p + 0x60);
              goto LAB_0010e045;
            }
LAB_0010c4c9:
            *((lzham_decompressor *)p)->m_pIn_buf_size =
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
            *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
            ((lzham_decompressor *)p)->m_state = 0x1d2;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
        else {
          if (iVar45 == 0x1d8) {
            lVar9 = *(long *)((long)p + 0x100);
            lVar10 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar9;
            *(long *)((long)p + 0x28) = lVar9;
            *(long *)((long)p + 0x38) = lVar10;
            *(long *)((long)p + 0x30) = lVar9 + lVar10;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
              iStack_8c = *(int *)((long)p + 0x690);
              uStack_a0._4_4_ = *(int *)((long)p + 0x694);
              iStack_a4 = *(int *)((long)p + 0x698);
              uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar21 = (ulong)*(uint *)((long)p + 0x678);
              uStack_84 = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uStack_80 = *(uint **)((long)p + 0x28);
              bVar47 = *(ulong *)((long)p + 0x58);
              uVar29 = *(uint *)((long)p + 0x60);
              goto LAB_0010e573;
            }
LAB_0010d514:
            *((lzham_decompressor *)p)->m_pIn_buf_size =
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
            *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
            ((lzham_decompressor *)p)->m_state = 0x1d8;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar45 == 0x1e0) {
            lVar9 = *(long *)((long)p + 0x100);
            lVar10 = **(long **)((long)p + 0x108);
            *(long *)((long)p + 0x20) = lVar9;
            *(long *)((long)p + 0x28) = lVar9;
            *(long *)((long)p + 0x38) = lVar10;
            *(long *)((long)p + 0x30) = lVar9 + lVar10;
            *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
            if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
              iStack_8c = *(int *)((long)p + 0x690);
              uStack_a0._4_4_ = *(int *)((long)p + 0x694);
              iStack_a4 = *(int *)((long)p + 0x698);
              uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar21 = (ulong)*(uint *)((long)p + 0x678);
              uStack_84 = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uStack_80 = *(uint **)((long)p + 0x28);
              bVar48 = *(bit_buf_t *)((long)p + 0x58);
              uVar29 = *(uint *)((long)p + 0x60);
              goto LAB_0010e0b2;
            }
LAB_0010cdd7:
            *((lzham_decompressor *)p)->m_pIn_buf_size =
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
                 (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
            *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
            ((lzham_decompressor *)p)->m_state = 0x1e0;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
      }
      else if (iVar45 < 0x1f1) {
        if (iVar45 == 0x1e2) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar48 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e8b2;
          }
LAB_0010da87:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x1e2;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar45 == 0x1e8) {
LAB_00110ce8:
          ((lzham_decompressor *)p)->m_state = 0x1e8;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
        }
        if (iVar45 == 0x1eb) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            uVar43 = *(ulong *)((long)p + 0x58);
            iVar45 = *(int *)((long)p + 0x60);
            goto LAB_0010e6a4;
          }
LAB_0010ca5c:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x1eb;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else if (iVar45 < 0x213) {
        if (iVar45 == 0x1f1) {
LAB_0011022d:
          ((lzham_decompressor *)p)->m_state = 0x1f1;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
        }
        if (iVar45 == 0x1fc) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          *(long *)((long)p + 0x6b0) = *(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0);
          *(long *)((long)p + 0x6b8) = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          goto LAB_0010ee85;
        }
      }
      else {
        if (iVar45 == 0x213) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uVar29 = *(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          goto LAB_0010eec3;
        }
        if (iVar45 == 0x228) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar30 = *(uint *)((long)p + 0x6f0);
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar47 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e116;
          }
LAB_0010ce5f:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x228;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
    }
    else if (iVar45 < 0x283) {
      if (iVar45 < 0x24a) {
        if (iVar45 == 0x22b) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar43 = (ulong)*(uint *)((long)p + 0x6f0);
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar47 = *(bit_buf_t *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e708;
          }
LAB_0010d7ee:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x22b;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar45 == 0x235) {
LAB_0010faac:
          plVar40->m_state = 0x235;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_RAW_BLOCK;
        }
        if (iVar45 == 0x23b) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar22 = (ulong)*(uint *)((long)p + 0x6f0);
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar48 = *(bit_buf_t *)((long)p + 0x58);
            uVar30 = *(uint *)((long)p + 0x60);
            goto LAB_0010e4aa;
          }
LAB_0010c93e:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x23b;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else if (iVar45 < 0x26b) {
        if (iVar45 == 0x24a) {
          *(undefined4 *)((long)p + 8) = 0x24a;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar45 == 0x252) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          *(long *)((long)p + 0x6b0) = *(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0);
          *(long *)((long)p + 0x6b8) = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          goto LAB_0010fd0e;
        }
      }
      else {
        if (iVar45 == 0x26b) {
LAB_0010f1d6:
          ((lzham_decompressor *)p)->m_state = 0x26b;
          return LZHAM_DECOMP_STATUS_FAILED_EXPECTED_MORE_RAW_BYTES;
        }
        if (iVar45 == 0x26f) {
          uVar22 = (ulong)*(uint *)((long)p + 0x6f0);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          lVar9 = *(long *)((long)p + 0x100);
          uVar43 = **(ulong **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(ulong *)((long)p + 0x38) = uVar43;
          *(ulong *)((long)p + 0x30) = lVar9 + uVar43;
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          uVar43 = **(ulong **)((long)p + 0x108);
          sVar52 = 0;
          goto LAB_0010f09e;
        }
      }
    }
    else if (iVar45 < 0x2cd) {
      if (iVar45 < 0x2a3) {
        if (iVar45 == 0x283) {
          *(undefined4 *)((long)p + 8) = 0x283;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar45 == 0x294) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          *(long *)((long)p + 0x6b0) = *(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0);
          *(long *)((long)p + 0x6b8) = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          goto LAB_0010eaaa;
        }
      }
      else {
        if (iVar45 == 0x2a3) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uVar30 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar48 = *(bit_buf_t *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010ea30;
          }
LAB_0010dbe5:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x2a3;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar45 == 0x2ae) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uVar15 = *(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            uVar43 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e90f;
          }
LAB_0010cee7:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x2ae;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
    }
    else if (iVar45 < 0x2ea) {
      if (iVar45 == 0x2cd) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uVar24 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar48 = *(bit_buf_t *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          plVar41 = (lzham_decompressor *)p;
          goto LAB_0010e9d3;
        }
LAB_0010db78:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x2cd;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x2e4) {
        *(undefined4 *)((long)p + 8) = 0x2e4;
        return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
      }
    }
    else {
      if (iVar45 == 0x2ea) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_00111283;
        }
LAB_001113ae:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x2ea;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x304) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d0);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_0010f237;
        }
LAB_0010f2de:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x304;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
  }
  else if (iVar45 < 0x3ae) {
    if (iVar45 < 0x34d) {
      if (iVar45 < 0x32f) {
        if (iVar45 == 0x318) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          *(long *)((long)p + 0x6b0) = *(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0);
          *(long *)((long)p + 0x6b8) = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          goto LAB_0010d5ee;
        }
        if (iVar45 == 0x329) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar24 = *(uint *)((long)p + 0x6d4);
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar30 = *(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uVar39 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar48 = *(bit_buf_t *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e76f;
          }
LAB_0010d85b:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x329;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar45 == 0x32c) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar24 = *(uint *)((long)p + 0x6d4);
            iStack_8c = *(int *)((long)p + 0x690);
            iVar45 = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uVar20 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar48 = *(bit_buf_t *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e34f;
          }
LAB_0010c78a:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x32c;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else if (iVar45 < 0x33f) {
        if (iVar45 == 0x32f) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar24 = *(uint *)((long)p + 0x6d4);
            iStack_8c = *(int *)((long)p + 0x690);
            iVar45 = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uStack_84 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar48 = *(bit_buf_t *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            goto LAB_0010e17d;
          }
LAB_0010d22b:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x32f;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar45 == 0x336) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar24 = *(uint *)((long)p + 0x6d4);
            iStack_8c = *(int *)((long)p + 0x690);
            iVar45 = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uVar30 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar47 = *(ulong *)((long)p + 0x58);
            uVar29 = *(uint *)((long)p + 0x60);
            pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
            pdVar26 = pqVar37->m_pDecode_tables;
            plVar41 = (lzham_decompressor *)p;
            goto LAB_0010ebdb;
          }
LAB_0010ec70:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x336;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else {
        if (iVar45 == 0x33f) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar39 = *(uint *)((long)p + 0x6d4);
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uVar30 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            bVar47 = *(ulong *)((long)p + 0x58);
            uVar24 = *(uint *)((long)p + 0x60);
            goto LAB_0010e2e1;
          }
LAB_0010d372:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x33f;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar45 == 0x344) {
          lVar9 = *(long *)((long)p + 0x100);
          lVar10 = **(long **)((long)p + 0x108);
          *(long *)((long)p + 0x20) = lVar9;
          *(long *)((long)p + 0x28) = lVar9;
          *(long *)((long)p + 0x38) = lVar10;
          *(long *)((long)p + 0x30) = lVar9 + lVar10;
          *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
          if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
            uVar39 = *(uint *)((long)p + 0x6d4);
            iStack_8c = *(int *)((long)p + 0x690);
            uStack_a0._4_4_ = *(int *)((long)p + 0x694);
            iStack_a4 = *(int *)((long)p + 0x698);
            uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar21 = (ulong)*(uint *)((long)p + 0x678);
            uVar30 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uStack_80 = *(uint **)((long)p + 0x28);
            uVar43 = *(ulong *)((long)p + 0x58);
            iVar45 = *(int *)((long)p + 0x60);
            goto LAB_0010dfde;
          }
LAB_0010cb13:
          *((lzham_decompressor *)p)->m_pIn_buf_size =
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
               (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
          *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
          ((lzham_decompressor *)p)->m_state = 0x344;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
    }
    else if (iVar45 < 0x35f) {
      if (iVar45 == 0x34d) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          iStack_8c = *(int *)((long)p + 0x690);
          iVar45 = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0 = (ulong)*(uint *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          plVar41 = (lzham_decompressor *)p;
          goto LAB_00111ed4;
        }
LAB_00111f6e:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x34d;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x356) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar39 = *(uint *)((long)p + 0x6d4);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar24 = *(uint *)((long)p + 0x60);
          goto LAB_0010e84b;
        }
LAB_0010d935:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x356;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x35b) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar39 = *(uint *)((long)p + 0x6d4);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          uVar43 = *(ulong *)((long)p + 0x58);
          iVar45 = *(int *)((long)p + 0x60);
          goto LAB_0010e43c;
        }
LAB_0010c8ab:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x35b;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else if (iVar45 < 899) {
      if (iVar45 == 0x35f) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          iVar36 = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          iVar45 = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          uVar43 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          goto LAB_0010e278;
        }
LAB_0010d305:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x35f;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x368) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          iVar36 = *(int *)((long)p + 0x690);
          iStack_a4 = *(int *)((long)p + 0x694);
          uStack_88 = *(int *)((long)p + 0x698);
          iVar45 = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar30 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          uVar43 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          goto LAB_0010df74;
        }
LAB_0010c562:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x368;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else {
      if (iVar45 == 899) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          plVar41 = (lzham_decompressor *)p;
          goto LAB_00112092;
        }
LAB_00112118:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 899;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x3a5) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar15 = *(uint *)((long)p + 0x6d4);
          uStack_58._4_4_ = *(uint *)((long)p + 0x6d8);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          plVar41 = (lzham_decompressor *)p;
          goto LAB_0010efc5;
        }
LAB_0010f071:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x3a5;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
  }
  else if (iVar45 < 0x442) {
    if (iVar45 < 0x3cb) {
      if (iVar45 == 0x3ae) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar39 = *(uint *)((long)p + 0x6d4);
          uStack_58._4_4_ = *(uint *)((long)p + 0x6d8);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar30 = *(uint *)((long)p + 0x60);
          goto LAB_0010e5e5;
        }
LAB_0010d6ce:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x3ae;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x3b3) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar39 = *(uint *)((long)p + 0x6d4);
          uStack_58._4_4_ = *(uint *)((long)p + 0x6d8);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          uVar43 = *(ulong *)((long)p + 0x58);
          iVar45 = *(int *)((long)p + 0x60);
          goto LAB_0010e7da;
        }
LAB_0010d8c8:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x3b3;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x3c4) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          uStack_58._4_4_ = *(uint *)((long)p + 0x6d8);
          uVar30 = *(uint *)((long)p + 0x6e0);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          goto LAB_0010e3cb;
        }
LAB_0010c81d:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x3c4;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else if (iVar45 < 0x3f4) {
      if (iVar45 == 0x3cb) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          uStack_58._4_4_ = *(uint *)((long)p + 0x6d8);
          uVar30 = *(uint *)((long)p + 0x6e0);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          goto LAB_0010e1fd;
        }
LAB_0010d298:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x3cb;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar45 == 0x3d4) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          uVar24 = *(uint *)((long)p + 0x6d4);
          uStack_58._4_4_ = *(uint *)((long)p + 0x6d8);
          uVar15 = *(uint *)((long)p + 0x6dc);
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uStack_6c = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(ulong *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          pqVar37 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar26 = pqVar37->m_pDecode_tables;
          goto LAB_0010ed88;
        }
LAB_0010ee33:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x3d4;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else {
      if (iVar45 == 0x3f4) {
        *(undefined4 *)((long)p + 8) = 0x3f4;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
      }
      if (iVar45 == 0x40e) {
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        *(long *)((long)p + 0x6b0) = *(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0);
        *(long *)((long)p + 0x6b8) = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        goto LAB_0010cb9f;
      }
    }
  }
  else {
    if (iVar45 < 0x47c) {
      switch(iVar45) {
      case 0x457:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        *(long *)((long)p + 0x6b0) = *(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0);
        *(long *)((long)p + 0x6b8) = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
LAB_001126e6:
        uVar43 = plVar40->m_flush_num_bytes_remaining;
        if (uVar43 != 0) {
          uVar21 = *plVar40->m_pOut_buf_size;
          if (uVar43 < *plVar40->m_pOut_buf_size) {
            uVar21 = uVar43;
          }
          plVar40->m_flush_n = uVar21;
          if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
            ppuVar2 = &plVar40->m_pOut_buf;
            ppuVar3 = &plVar40->m_pFlush_src;
            plVar40 = (lzham_decompressor *)p;
            memcpy(*ppuVar2,*ppuVar3,uVar21);
          }
          else {
            uVar43 = plVar40->m_flush_n;
            if (uVar43 != 0) {
              uVar21 = 0;
              do {
                sVar50 = uVar43 - uVar21;
                if (0x1fff < sVar50) {
                  sVar50 = 0x2000;
                }
                memcpy(plVar40->m_pOut_buf + uVar21,plVar40->m_pFlush_src + uVar21,sVar50);
                plVar40 = (lzham_decompressor *)p;
                uVar15 = adler32(((lzham_decompressor *)p)->m_pFlush_src + uVar21,sVar50,
                                 ((lzham_decompressor *)p)->m_decomp_adler32);
                plVar40->m_decomp_adler32 = uVar15;
                uVar21 = uVar21 + sVar50;
                uVar43 = plVar40->m_flush_n;
                p = plVar40;
              } while (uVar21 < uVar43);
            }
          }
          *plVar40->m_pIn_buf_size =
               (long)(plVar40->m_codec).m_pDecode_buf_next - (long)(plVar40->m_codec).m_pDecode_buf;
          *plVar40->m_pOut_buf_size = plVar40->m_flush_n;
          plVar40->m_state = 0x457;
LAB_00110369:
          return (uint)(plVar40->m_flush_n == 0);
        }
        iStack_8c = plVar40->m_match_hist0;
        uStack_a0._4_4_ = plVar40->m_match_hist1;
        iStack_a4 = plVar40->m_match_hist2;
        uStack_a0._0_4_ = plVar40->m_match_hist3;
        uStack_68 = (ulong)plVar40->m_cur_state;
        uVar15 = plVar40->m_dst_ofs;
        uStack_84 = (plVar40->m_codec).m_arith_value;
        uStack_88 = (plVar40->m_codec).m_arith_length;
        uStack_80 = (uint *)(plVar40->m_codec).m_pDecode_buf_next;
        bVar47 = (plVar40->m_codec).m_bit_buf;
        uVar29 = (plVar40->m_codec).m_bit_count;
LAB_00112793:
        if (plVar40->m_status == LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
          if ((uVar29 & 7) != 0) {
            for (; (int)uVar29 < 0; uVar29 = uVar29 + 8) {
              if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
                  (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                  (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                  (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                  (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                  (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                  ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                  ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                  ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                  ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                  ((lzham_decompressor *)p)->m_dst_ofs = uVar15;
                  goto LAB_0010d14e;
                }
LAB_0010dea5:
                if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end)
                goto LAB_00112932;
                uVar43 = 0;
                plVar40 = (lzham_decompressor *)p;
              }
              else {
LAB_00112932:
                uVar43 = (ulong)(byte)*uStack_80;
                uStack_80 = (uint *)((long)uStack_80 + 1);
                plVar40 = (lzham_decompressor *)p;
              }
              bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
              p = plVar40;
            }
            bVar47 = bVar47 << ((byte)uVar29 & 7);
            uVar29 = uVar29 & 0x7ffffff8;
          }
          for (; (int)uVar29 < 0x10; uVar29 = uVar29 + 8) {
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
              if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = uVar15;
                goto LAB_0010d1be;
              }
LAB_0010df09:
              if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end)
              goto LAB_001129fc;
              uVar43 = 0;
              plVar40 = (lzham_decompressor *)p;
            }
            else {
LAB_001129fc:
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
              plVar40 = (lzham_decompressor *)p;
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
            p = plVar40;
          }
          plVar40->m_file_src_file_adler32 = (uint)(ushort)(bVar47 >> 0x30);
          bVar48 = bVar47 << 0x10;
          for (iVar45 = uVar29 - 0x10; iVar45 < 0x10; iVar45 = iVar45 + 8) {
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
              if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = iVar45;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = uVar15;
                goto LAB_0010d0de;
              }
LAB_0010de41:
              if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end)
              goto LAB_00112b56;
              uVar43 = 0;
              plVar40 = (lzham_decompressor *)p;
            }
            else {
LAB_00112b56:
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
              plVar40 = (lzham_decompressor *)p;
            }
            bVar48 = bVar48 | uVar43 << (0x38U - (char)iVar45 & 0x3f);
            p = plVar40;
          }
          bVar47 = bVar48 << 0x10;
          uVar29 = iVar45 - 0x10;
          uVar46 = plVar40->m_file_src_file_adler32 << 0x10 | (uint)(ushort)(bVar48 >> 0x30);
          plVar40->m_file_src_file_adler32 = uVar46;
          if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
            plVar40->m_decomp_adler32 = uVar46;
          }
          else if (uVar46 != plVar40->m_decomp_adler32) {
            plVar40->m_status = LZHAM_DECOMP_STATUS_FAILED_ADLER32;
          }
        }
        (plVar40->m_codec).m_arith_value = uStack_84;
        (plVar40->m_codec).m_arith_length = uStack_88;
        (plVar40->m_codec).m_bit_buf = bVar47;
        (plVar40->m_codec).m_bit_count = uVar29;
        (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
        uVar18 = symbol_codec::stop_decoding(this);
        *plVar40->m_pIn_buf_size = uVar18;
        *plVar40->m_pOut_buf_size = 0;
        plVar40->m_dst_highwater_ofs = uVar15;
        plVar40->m_state = 0x47c;
        return plVar40->m_status;
      case 0x458:
      case 0x459:
      case 0x45a:
      case 0x45b:
      case 0x45c:
      case 0x45e:
        goto switchD_0010c5b7_caseD_458;
      case 0x45d:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar15 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(bit_buf_t *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          goto LAB_0010dea5;
        }
LAB_0010d14e:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x45d;
        break;
      case 0x45f:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar15 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(bit_buf_t *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
          goto LAB_0010df09;
        }
LAB_0010d1be:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x45f;
        break;
      case 0x460:
        lVar51 = *(long *)((long)p + 0x100);
        lVar9 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar51;
        *(long *)((long)p + 0x28) = lVar51;
        *(long *)((long)p + 0x38) = lVar9;
        *(long *)((long)p + 0x30) = lVar51 + lVar9;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar9 != 0)) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar15 = *(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar48 = *(bit_buf_t *)((long)p + 0x58);
          iVar45 = *(int *)((long)p + 0x60);
          goto LAB_0010de41;
        }
LAB_0010d0de:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x460;
        break;
      default:
        if (iVar45 != 0x442) goto switchD_0010c5b7_caseD_458;
        lVar9 = *(long *)((long)p + 0x100);
        lVar10 = **(long **)((long)p + 0x108);
        *(long *)((long)p + 0x20) = lVar9;
        *(long *)((long)p + 0x28) = lVar9;
        *(long *)((long)p + 0x38) = lVar10;
        *(long *)((long)p + 0x30) = lVar9 + lVar10;
        *(char *)((long)p + 0x40) = *(char *)((long)p + 0x120);
        if ((*(char *)((long)p + 0x120) != '\0') || (lVar10 != 0)) {
          iStack_8c = *(int *)((long)p + 0x690);
          uStack_a0._4_4_ = *(int *)((long)p + 0x694);
          iStack_a4 = *(int *)((long)p + 0x698);
          uStack_a0._0_4_ = *(int *)((long)p + 0x69c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar21 = (ulong)*(uint *)((long)p + 0x678);
          uStack_84 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uStack_80 = *(uint **)((long)p + 0x28);
          bVar47 = *(bit_buf_t *)((long)p + 0x58);
          uVar29 = *(uint *)((long)p + 0x60);
LAB_0010ea91:
          p = plVar40;
          if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0011285d;
          uVar43 = 0;
          do {
            cVar31 = (char)uVar29;
            uVar29 = uVar29 + 8;
            bVar47 = bVar47 | uVar43 << (0x38U - cVar31 & 0x3f);
LAB_00112600:
            if (-1 < (int)uVar29) {
              bVar47 = bVar47 << ((byte)uVar29 & 7);
              uVar29 = uVar29 & 0x7ffffff8;
LAB_00112619:
              plVar40->m_block_index = plVar40->m_block_index + 1;
              uVar30 = (uint)uVar21;
              if (plVar40->m_status != LZHAM_DECOMP_STATUS_NOT_FINISHED) {
                if (uVar30 != 0) {
                  (plVar40->m_codec).m_arith_value = uStack_84;
                  (plVar40->m_codec).m_arith_length = uStack_88;
                  (plVar40->m_codec).m_bit_buf = bVar47;
                  (plVar40->m_codec).m_bit_count = uVar29;
                  (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  plVar40->m_match_hist0 = iStack_8c;
                  plVar40->m_match_hist1 = uStack_a0._4_4_;
                  plVar40->m_match_hist2 = iStack_a4;
                  plVar40->m_match_hist3 = (int)uStack_a0;
                  plVar40->m_cur_state = (uint)uStack_68;
                  plVar40->m_dst_ofs = uVar30;
                  plVar40->m_pFlush_src =
                       plVar40->m_pDecomp_buf +
                       (ulong)plVar40->m_dst_highwater_ofs +
                       (ulong)plVar40->m_seed_bytes_to_ignore_when_flushing;
                  plVar40->m_flush_num_bytes_remaining =
                       (ulong)(uVar30 - (plVar40->m_dst_highwater_ofs +
                                        plVar40->m_seed_bytes_to_ignore_when_flushing));
                  plVar40->m_seed_bytes_to_ignore_when_flushing = 0;
                  plVar40->m_dst_highwater_ofs = uVar28 & uVar30;
                  goto LAB_001126e6;
                }
                uVar15 = 0;
                goto LAB_00112793;
              }
LAB_0011088d:
              for (; (int)uVar29 < 2; uVar29 = uVar29 + 8) {
                if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                  psVar13 = &plVar40->m_codec;
                  plVar40 = (lzham_decompressor *)p;
                  if (psVar13->m_decode_buf_eof == false) {
                    (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                    (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                    (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                    (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                    (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                    ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                    ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                    ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                    ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                    ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                    ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                    goto LAB_0010c4c9;
                  }
LAB_0010e045:
                  uVar43 = 0;
                  p = plVar40;
                  if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010f92d;
                }
                else {
LAB_0010f92d:
                  uVar43 = (ulong)(byte)*uStack_80;
                  uStack_80 = (uint *)((long)uStack_80 + 1);
                }
                bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
              }
              uVar43 = bVar47 >> 0x3e;
              plVar40->m_block_type = (uint)(bVar47 >> 0x3e);
              bVar47 = bVar47 << 2;
              uVar29 = uVar29 - 2;
              uVar30 = 0;
              switch(uVar43) {
              case 1:
                goto switchD_001108df_caseD_1;
              case 2:
                for (; (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
                  if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                    psVar13 = &plVar40->m_codec;
                    plVar40 = (lzham_decompressor *)p;
                    if (psVar13->m_decode_buf_eof == false) {
                      (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                      (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                      (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                      (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                      (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                      ((lzham_decompressor *)p)->m_num_raw_bytes_remaining = uVar30;
                      ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                      ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                      ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                      ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                      ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                      ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                      goto LAB_0010ce5f;
                    }
LAB_0010e116:
                    uVar43 = 0;
                    p = plVar40;
                    if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010f96a;
                  }
                  else {
LAB_0010f96a:
                    uVar43 = (ulong)(byte)*uStack_80;
                    uStack_80 = (uint *)((long)uStack_80 + 1);
                  }
                  bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
                }
                uVar43 = bVar47 >> 0x28;
                bVar47 = bVar47 << 0x18;
                for (uVar29 = uVar29 - 0x18; uVar39 = (uint)uVar43, (int)uVar29 < 8;
                    uVar29 = uVar29 + 8) {
                  if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                    psVar13 = &plVar40->m_codec;
                    plVar40 = (lzham_decompressor *)p;
                    if (psVar13->m_decode_buf_eof == false) {
                      (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                      (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                      (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                      (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                      (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                      ((lzham_decompressor *)p)->m_num_raw_bytes_remaining = uVar39;
                      ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                      ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                      ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                      ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                      ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                      ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                      goto LAB_0010d7ee;
                    }
LAB_0010e708:
                    uVar22 = 0;
                    p = plVar40;
                    if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010fac4;
                  }
                  else {
LAB_0010fac4:
                    uVar22 = (ulong)(byte)*uStack_80;
                    uStack_80 = (uint *)((long)uStack_80 + 1);
                  }
                  bVar47 = bVar47 | uVar22 << (0x38U - (char)uVar29 & 0x3f);
                }
                bVar48 = bVar47 << 8;
                uVar30 = uVar29 - 8;
                if ((((uint)(uVar43 >> 0x10) ^ (uint)(uVar43 >> 8) ^ uVar39) & 0xff) !=
                    (uint)(byte)(bVar47 >> 0x38)) {
                  (plVar40->m_codec).m_arith_value = uStack_84;
                  (plVar40->m_codec).m_arith_length = uStack_88;
                  (plVar40->m_codec).m_bit_buf = bVar48;
                  (plVar40->m_codec).m_bit_count = uVar30;
                  (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  *plVar40->m_pIn_buf_size =
                       (long)uStack_80 - (long)(plVar40->m_codec).m_pDecode_buf;
                  *plVar40->m_pOut_buf_size = 0;
                  goto LAB_0010faac;
                }
                uVar22 = (ulong)(uVar39 + 1);
                if ((uVar29 & 7) != 0) {
                  for (; (int)uVar30 < 0; uVar30 = uVar30 + 8) {
                    if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                      psVar13 = &plVar40->m_codec;
                      plVar40 = (lzham_decompressor *)p;
                      if (psVar13->m_decode_buf_eof == false) {
                        (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                        (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                        (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
                        (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar30;
                        (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80
                        ;
                        ((lzham_decompressor *)p)->m_num_raw_bytes_remaining = (uint)uVar22;
                        ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                        ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                        ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                        ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                        ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                        ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                        goto LAB_0010c93e;
                      }
LAB_0010e4aa:
                      uVar43 = 0;
                      p = plVar40;
                      if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010fb86;
                    }
                    else {
LAB_0010fb86:
                      uVar43 = (ulong)(byte)*uStack_80;
                      uStack_80 = (uint *)((long)uStack_80 + 1);
                    }
                    bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar30 & 0x3f);
                  }
                  bVar48 = bVar48 << ((byte)uVar30 & 7);
                  uVar30 = uVar30 & 0x7ffffff8;
                }
                do {
                  uVar15 = (uint)uVar22;
                  bVar47 = bVar48 << 8;
                  uVar29 = uVar30 - 8;
                  plVar41 = (lzham_decompressor *)p;
                  if ((int)uVar30 < 8) goto LAB_0010fd98;
                  uVar39 = (int)uVar21 + 1;
                  uVar43 = (ulong)uVar39;
                  __dest[uVar21] = (byte)(bVar48 >> 0x38);
                  uVar30 = uVar29;
                  if (uVar28 < uVar39) {
                    (plVar40->m_codec).m_arith_value = uStack_84;
                    (plVar40->m_codec).m_arith_length = uStack_88;
                    (plVar40->m_codec).m_bit_buf = bVar47;
                    (plVar40->m_codec).m_bit_count = uVar29;
                    (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                    plVar40->m_num_raw_bytes_remaining = uVar15;
                    plVar40->m_match_hist0 = iStack_8c;
                    plVar40->m_match_hist1 = uStack_a0._4_4_;
                    plVar40->m_match_hist2 = iStack_a4;
                    plVar40->m_match_hist3 = (int)uStack_a0;
                    plVar40->m_cur_state = (uint)uStack_68;
                    plVar40->m_dst_ofs = uVar39;
                    plVar40->m_pFlush_src =
                         plVar40->m_pDecomp_buf +
                         (ulong)plVar40->m_dst_highwater_ofs +
                         (ulong)plVar40->m_seed_bytes_to_ignore_when_flushing;
                    plVar40->m_flush_num_bytes_remaining =
                         (ulong)(uVar46 - (plVar40->m_dst_highwater_ofs +
                                          plVar40->m_seed_bytes_to_ignore_when_flushing));
                    plVar40->m_seed_bytes_to_ignore_when_flushing = 0;
                    plVar40->m_dst_highwater_ofs = 0;
LAB_0010fd0e:
                    uVar43 = plVar40->m_flush_num_bytes_remaining;
                    if (uVar43 != 0) {
                      uVar21 = *plVar40->m_pOut_buf_size;
                      if (uVar43 < *plVar40->m_pOut_buf_size) {
                        uVar21 = uVar43;
                      }
                      plVar40->m_flush_n = uVar21;
                      if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
                        ppuVar2 = &plVar40->m_pOut_buf;
                        ppuVar3 = &plVar40->m_pFlush_src;
                        plVar40 = (lzham_decompressor *)p;
                        memcpy(*ppuVar2,*ppuVar3,uVar21);
                      }
                      else {
                        uVar43 = plVar40->m_flush_n;
                        if (uVar43 != 0) {
                          uVar21 = 0;
                          do {
                            sVar50 = uVar43 - uVar21;
                            if (0x1fff < sVar50) {
                              sVar50 = 0x2000;
                            }
                            memcpy(plVar40->m_pOut_buf + uVar21,plVar40->m_pFlush_src + uVar21,
                                   sVar50);
                            plVar40 = (lzham_decompressor *)p;
                            uVar15 = adler32(((lzham_decompressor *)p)->m_pFlush_src + uVar21,sVar50
                                             ,((lzham_decompressor *)p)->m_decomp_adler32);
                            plVar40->m_decomp_adler32 = uVar15;
                            uVar21 = uVar21 + sVar50;
                            uVar43 = plVar40->m_flush_n;
                            p = plVar40;
                          } while (uVar21 < uVar43);
                        }
                      }
                      *plVar40->m_pIn_buf_size =
                           (long)(plVar40->m_codec).m_pDecode_buf_next -
                           (long)(plVar40->m_codec).m_pDecode_buf;
                      *plVar40->m_pOut_buf_size = plVar40->m_flush_n;
                      plVar40->m_state = 0x252;
                      goto LAB_00110369;
                    }
                    uVar15 = plVar40->m_num_raw_bytes_remaining;
                    iStack_8c = plVar40->m_match_hist0;
                    uStack_a0._4_4_ = plVar40->m_match_hist1;
                    iStack_a4 = plVar40->m_match_hist2;
                    uStack_a0._0_4_ = plVar40->m_match_hist3;
                    uStack_68 = (ulong)plVar40->m_cur_state;
                    uStack_84 = (plVar40->m_codec).m_arith_value;
                    uStack_88 = (plVar40->m_codec).m_arith_length;
                    uStack_80 = (uint *)(plVar40->m_codec).m_pDecode_buf_next;
                    bVar47 = (plVar40->m_codec).m_bit_buf;
                    uVar43 = 0;
                    uVar30 = (plVar40->m_codec).m_bit_count;
                  }
                  uVar22 = (ulong)(uVar15 - 1);
                  uVar21 = uVar43;
                  bVar48 = bVar47;
                } while (uVar15 - 1 != 0);
                uVar22 = 0;
                plVar41 = (lzham_decompressor *)p;
LAB_0010fd98:
                (plVar40->m_codec).m_arith_value = uStack_84;
                (plVar40->m_codec).m_arith_length = uStack_88;
                (plVar40->m_codec).m_bit_buf = bVar48;
                (plVar40->m_codec).m_bit_count = uVar30;
                (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                while ((int)uVar22 != 0) {
                  sVar52 = (long)(plVar40->m_codec).m_pDecode_buf_next -
                           (long)(plVar40->m_codec).m_pDecode_buf;
                  uVar43 = *plVar40->m_pIn_buf_size - sVar52;
                  p = plVar40;
                  plVar40 = plVar41;
LAB_0010f09e:
                  uVar29 = (uint)uVar22;
                  uVar15 = (uint)uVar21;
                  if (uVar43 == 0) {
                    *((lzham_decompressor *)p)->m_pIn_buf_size = sVar52;
                    *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
                    if (((lzham_decompressor *)p)->m_no_more_input_bytes_flag != true) {
                      ((lzham_decompressor *)p)->m_num_raw_bytes_remaining = uVar29;
                      ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                      ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                      ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                      ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                      ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                      ((lzham_decompressor *)p)->m_dst_ofs = uVar15;
                      ((lzham_decompressor *)p)->m_state = 0x26f;
                      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                    }
                    goto LAB_0010f1d6;
                  }
                  uVar30 = uVar29;
                  if (uVar43 < uVar22) {
                    uVar30 = (uint)uVar43;
                  }
                  uVar39 = uVar46 - uVar15;
                  if (uVar30 <= uVar46 - uVar15) {
                    uVar39 = uVar30;
                  }
                  memcpy(__dest + uVar21,((lzham_decompressor *)p)->m_pIn_buf + sVar52,(ulong)uVar39
                        );
                  uVar22 = (ulong)(uVar29 - uVar39);
                  puVar11 = plVar40->m_pIn_buf;
                  sVar12 = *plVar40->m_pIn_buf_size;
                  bVar54 = plVar40->m_no_more_input_bytes_flag;
                  (plVar40->m_codec).m_pDecode_buf = puVar11;
                  (plVar40->m_codec).m_pDecode_buf_next = puVar11 + uVar39 + sVar52;
                  (plVar40->m_codec).m_decode_buf_size = sVar12;
                  (plVar40->m_codec).m_pDecode_buf_end = puVar11 + sVar12;
                  (plVar40->m_codec).m_decode_buf_eof = bVar54;
                  uVar30 = uVar15 + uVar39;
                  if (uVar28 < uVar30) {
                    plVar40->m_num_raw_bytes_remaining = uVar29 - uVar39;
                    plVar40->m_match_hist0 = iStack_8c;
                    plVar40->m_match_hist1 = uStack_a0._4_4_;
                    plVar40->m_match_hist2 = iStack_a4;
                    plVar40->m_match_hist3 = (int)uStack_a0;
                    plVar40->m_cur_state = (uint)uStack_68;
                    plVar40->m_dst_ofs = uVar30;
                    plVar40->m_pFlush_src =
                         plVar40->m_pDecomp_buf +
                         (ulong)plVar40->m_dst_highwater_ofs +
                         (ulong)plVar40->m_seed_bytes_to_ignore_when_flushing;
                    plVar40->m_flush_num_bytes_remaining =
                         (ulong)(uVar46 - (plVar40->m_dst_highwater_ofs +
                                          plVar40->m_seed_bytes_to_ignore_when_flushing));
                    plVar40->m_seed_bytes_to_ignore_when_flushing = 0;
                    plVar40->m_dst_highwater_ofs = 0;
LAB_0010eaaa:
                    uVar43 = plVar40->m_flush_num_bytes_remaining;
                    if (uVar43 != 0) {
                      uVar21 = *plVar40->m_pOut_buf_size;
                      if (uVar43 < *plVar40->m_pOut_buf_size) {
                        uVar21 = uVar43;
                      }
                      plVar40->m_flush_n = uVar21;
                      if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
                        memcpy(plVar40->m_pOut_buf,plVar40->m_pFlush_src,uVar21);
                      }
                      else {
                        uVar43 = plVar40->m_flush_n;
                        if (uVar43 != 0) {
                          uVar21 = 0;
                          do {
                            sVar50 = uVar43 - uVar21;
                            if (0x1fff < sVar50) {
                              sVar50 = 0x2000;
                            }
                            memcpy(plVar40->m_pOut_buf + uVar21,plVar40->m_pFlush_src + uVar21,
                                   sVar50);
                            uVar15 = adler32(plVar40->m_pFlush_src + uVar21,sVar50,
                                             plVar40->m_decomp_adler32);
                            plVar40->m_decomp_adler32 = uVar15;
                            uVar21 = uVar21 + sVar50;
                            uVar43 = plVar40->m_flush_n;
                          } while (uVar21 < uVar43);
                        }
                      }
                      *plVar40->m_pIn_buf_size =
                           (long)(plVar40->m_codec).m_pDecode_buf_next -
                           (long)(plVar40->m_codec).m_pDecode_buf;
                      *plVar40->m_pOut_buf_size = plVar40->m_flush_n;
                      plVar40->m_state = 0x294;
                      goto LAB_00110369;
                    }
                    uVar22 = (ulong)plVar40->m_num_raw_bytes_remaining;
                    iStack_8c = plVar40->m_match_hist0;
                    uStack_a0._4_4_ = plVar40->m_match_hist1;
                    iStack_a4 = plVar40->m_match_hist2;
                    uStack_a0._0_4_ = plVar40->m_match_hist3;
                    uStack_68 = (ulong)plVar40->m_cur_state;
                    uVar21 = 0;
                    plVar41 = plVar40;
                  }
                  else {
                    uVar21 = (ulong)uVar30;
                    plVar41 = plVar40;
                  }
                }
                uStack_84 = (plVar40->m_codec).m_arith_value;
                uStack_88 = (plVar40->m_codec).m_arith_length;
                uStack_80 = (uint *)(plVar40->m_codec).m_pDecode_buf_next;
                bVar47 = (plVar40->m_codec).m_bit_buf;
                uVar29 = (plVar40->m_codec).m_bit_count;
                p = plVar41;
                goto LAB_00112619;
              case 3:
                plVar40->m_status = LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
                goto LAB_00112619;
              default:
                for (; (int)uVar29 < 2; uVar29 = uVar29 + 8) {
                  if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                    psVar13 = &plVar40->m_codec;
                    plVar40 = (lzham_decompressor *)p;
                    if (psVar13->m_decode_buf_eof == false) {
                      (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                      (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                      (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                      (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                      (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                      ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                      ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                      ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                      ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                      ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                      ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                      goto LAB_0010d514;
                    }
LAB_0010e573:
                    uVar43 = 0;
                    p = plVar40;
                    if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110af6;
                  }
                  else {
LAB_00110af6:
                    uVar43 = (ulong)(byte)*uStack_80;
                    uStack_80 = (uint *)((long)uStack_80 + 1);
                  }
                  bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
                }
                uVar30 = (uint)(bVar47 >> 0x3e);
                plVar40->m_tmp = uVar30;
                bVar48 = bVar47 << 2;
                uVar29 = uVar29 - 2;
                if (bVar47 >> 0x3e == 2) {
                  lzham_decompressor::reset_all_tables(plVar40);
                  plVar40 = (lzham_decompressor *)p;
                  p = plVar40;
                }
                else if (uVar30 == 1) {
                  lzham_decompressor::reset_huffman_table_update_rates(plVar40);
                  plVar40 = (lzham_decompressor *)p;
                  p = plVar40;
                }
                if ((uVar29 & 7) != 0) {
                  for (; (int)uVar29 < 0; uVar29 = uVar29 + 8) {
                    if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                      psVar13 = &plVar40->m_codec;
                      plVar40 = (lzham_decompressor *)p;
                      if (psVar13->m_decode_buf_eof == false) {
                        (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                        (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                        (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
                        (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                        (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80
                        ;
                        ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                        ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                        ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                        ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                        ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                        ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                        goto LAB_0010cdd7;
                      }
LAB_0010e0b2:
                      uVar43 = 0;
                      p = plVar40;
                      if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010f94d;
                    }
                    else {
LAB_0010f94d:
                      uVar43 = (ulong)(byte)*uStack_80;
                      uStack_80 = (uint *)((long)uStack_80 + 1);
                    }
                    bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
                  }
                  bVar48 = bVar48 << ((byte)uVar29 & 7);
                  uVar29 = uVar29 & 0x7ffffff8;
                }
                for (; (int)uVar29 < 0x10; uVar29 = uVar29 + 8) {
                  if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                    psVar13 = &plVar40->m_codec;
                    plVar40 = (lzham_decompressor *)p;
                    if (psVar13->m_decode_buf_eof == false) {
                      (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                      (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                      (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
                      (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                      (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                      ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                      ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                      ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                      ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                      ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                      ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                      goto LAB_0010da87;
                    }
LAB_0010e8b2:
                    uVar43 = 0;
                    p = plVar40;
                    if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110d00;
                  }
                  else {
LAB_00110d00:
                    uVar43 = (ulong)(byte)*uStack_80;
                    uStack_80 = (uint *)((long)uStack_80 + 1);
                  }
                  bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
                }
                uVar43 = bVar48 << 0x10;
                iVar45 = uVar29 - 0x10;
                if (bVar48 >> 0x30 != 0) {
                  (plVar40->m_codec).m_arith_value = uStack_84;
                  (plVar40->m_codec).m_arith_length = uStack_88;
                  (plVar40->m_codec).m_bit_buf = uVar43;
                  (plVar40->m_codec).m_bit_count = iVar45;
                  (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  *plVar40->m_pIn_buf_size =
                       (long)uStack_80 - (long)(plVar40->m_codec).m_pDecode_buf;
                  *plVar40->m_pOut_buf_size = 0;
                  p = plVar40;
                  goto LAB_00110ce8;
                }
                while( true ) {
                  uVar30 = (uint)uVar21;
                  uVar15 = (uint)uStack_68;
                  if (0xf < iVar45) break;
                  if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                    psVar13 = &plVar40->m_codec;
                    plVar40 = (lzham_decompressor *)p;
                    if (psVar13->m_decode_buf_eof == false) {
                      (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                      (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                      (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
                      (((lzham_decompressor *)p)->m_codec).m_bit_count = iVar45;
                      (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                      ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                      ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                      ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                      ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                      ((lzham_decompressor *)p)->m_cur_state = uVar15;
                      ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
                      goto LAB_0010ca5c;
                    }
LAB_0010e6a4:
                    uVar22 = 0;
                    p = plVar40;
                    if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110109;
                  }
                  else {
LAB_00110109:
                    uVar22 = (ulong)(byte)*uStack_80;
                    uStack_80 = (uint *)((long)uStack_80 + 1);
                  }
                  cVar31 = (char)iVar45;
                  iVar45 = iVar45 + 8;
                  uVar43 = uVar43 | uVar22 << (0x38U - cVar31 & 0x3f);
                }
                bVar47 = uVar43 << 0x10;
                uVar29 = iVar45 - 0x10;
                if ((short)(uVar43 >> 0x30) != -1) {
                  (plVar40->m_codec).m_arith_value = uStack_84;
                  (plVar40->m_codec).m_arith_length = uStack_88;
                  (plVar40->m_codec).m_bit_buf = bVar47;
                  (plVar40->m_codec).m_bit_count = uVar29;
                  (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  *plVar40->m_pIn_buf_size =
                       (long)uStack_80 - (long)(plVar40->m_codec).m_pDecode_buf;
                  *plVar40->m_pOut_buf_size = 0;
                  p = plVar40;
                  goto LAB_0011022d;
                }
                if ((plVar40->m_tmp & 0xfffffffe) == 2) {
                  (plVar40->m_codec).m_arith_value = uStack_84;
                  (plVar40->m_codec).m_arith_length = uStack_88;
                  (plVar40->m_codec).m_bit_buf = bVar47;
                  (plVar40->m_codec).m_bit_count = uVar29;
                  (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  if (uVar30 == 0) {
                    *plVar40->m_pIn_buf_size =
                         (long)(plVar40->m_codec).m_pDecode_buf_next -
                         (long)(plVar40->m_codec).m_pDecode_buf;
                    *plVar40->m_pOut_buf_size = (ulong)-plVar40->m_dst_highwater_ofs;
                    plVar40->m_match_hist0 = iStack_8c;
                    plVar40->m_match_hist1 = uStack_a0._4_4_;
                    plVar40->m_match_hist2 = iStack_a4;
                    plVar40->m_match_hist3 = (int)uStack_a0;
                    plVar40->m_cur_state = uVar15;
                    plVar40->m_dst_ofs = 0;
                    plVar40->m_dst_highwater_ofs = 0;
                    plVar40->m_state = 0x213;
                    return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                  }
                  plVar40->m_match_hist0 = iStack_8c;
                  plVar40->m_match_hist1 = uStack_a0._4_4_;
                  plVar40->m_match_hist2 = iStack_a4;
                  plVar40->m_match_hist3 = (int)uStack_a0;
                  plVar40->m_cur_state = uVar15;
                  plVar40->m_dst_ofs = uVar30;
                  plVar40->m_pFlush_src =
                       plVar40->m_pDecomp_buf +
                       (ulong)plVar40->m_dst_highwater_ofs +
                       (ulong)plVar40->m_seed_bytes_to_ignore_when_flushing;
                  plVar40->m_flush_num_bytes_remaining =
                       (ulong)(uVar30 - (plVar40->m_dst_highwater_ofs +
                                        plVar40->m_seed_bytes_to_ignore_when_flushing));
                  plVar40->m_seed_bytes_to_ignore_when_flushing = 0;
                  plVar40->m_dst_highwater_ofs = uVar30 & uVar28;
LAB_0010ee85:
                  uVar43 = plVar40->m_flush_num_bytes_remaining;
                  if (uVar43 != 0) {
                    uVar21 = *plVar40->m_pOut_buf_size;
                    if (uVar43 < *plVar40->m_pOut_buf_size) {
                      uVar21 = uVar43;
                    }
                    plVar40->m_flush_n = uVar21;
                    if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
                      ppuVar2 = &plVar40->m_pOut_buf;
                      ppuVar3 = &plVar40->m_pFlush_src;
                      plVar40 = (lzham_decompressor *)p;
                      memcpy(*ppuVar2,*ppuVar3,uVar21);
                    }
                    else {
                      uVar43 = plVar40->m_flush_n;
                      if (uVar43 != 0) {
                        uVar21 = 0;
                        do {
                          sVar50 = uVar43 - uVar21;
                          if (0x1fff < sVar50) {
                            sVar50 = 0x2000;
                          }
                          memcpy(plVar40->m_pOut_buf + uVar21,plVar40->m_pFlush_src + uVar21,sVar50)
                          ;
                          plVar40 = (lzham_decompressor *)p;
                          uVar15 = adler32(((lzham_decompressor *)p)->m_pFlush_src + uVar21,sVar50,
                                           ((lzham_decompressor *)p)->m_decomp_adler32);
                          plVar40->m_decomp_adler32 = uVar15;
                          uVar21 = uVar21 + sVar50;
                          uVar43 = plVar40->m_flush_n;
                          p = plVar40;
                        } while (uVar21 < uVar43);
                      }
                    }
                    *plVar40->m_pIn_buf_size =
                         (long)(plVar40->m_codec).m_pDecode_buf_next -
                         (long)(plVar40->m_codec).m_pDecode_buf;
                    *plVar40->m_pOut_buf_size = plVar40->m_flush_n;
                    plVar40->m_state = 0x1fc;
                    goto LAB_00110369;
                  }
                  uVar30 = plVar40->m_dst_ofs;
                  iStack_8c = plVar40->m_match_hist0;
                  uStack_a0._4_4_ = plVar40->m_match_hist1;
                  iStack_a4 = plVar40->m_match_hist2;
                  uStack_a0._0_4_ = plVar40->m_match_hist3;
                  uVar29 = plVar40->m_cur_state;
LAB_0010eec3:
                  uVar21 = (ulong)uVar30;
                  uStack_68 = (ulong)uVar29;
                  uStack_84 = (plVar40->m_codec).m_arith_value;
                  uStack_88 = (plVar40->m_codec).m_arith_length;
                  uStack_80 = (uint *)(plVar40->m_codec).m_pDecode_buf_next;
                  bVar47 = (plVar40->m_codec).m_bit_buf;
                  uVar29 = (plVar40->m_codec).m_bit_count;
                }
                goto LAB_00112619;
              }
            }
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) goto LAB_0011287a;
LAB_0011285d:
            uVar43 = (ulong)(byte)*uStack_80;
            uStack_80 = (uint *)((long)uStack_80 + 1);
          } while( true );
        }
LAB_0010d06e:
        *((lzham_decompressor *)p)->m_pIn_buf_size =
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next -
             (long)(((lzham_decompressor *)p)->m_codec).m_pDecode_buf;
        *((lzham_decompressor *)p)->m_pOut_buf_size = 0;
        ((lzham_decompressor *)p)->m_state = 0x442;
      }
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
    if ((iVar45 == 0x47c) || (iVar45 == 0x482)) {
      **(undefined8 **)((long)p + 0x108) = 0;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x482;
    }
  }
switchD_0010c5b7_caseD_458:
  return *(lzham_decompress_status_t *)((long)p + 0x160);
switchD_0010a165_caseD_1:
  uStack_68._0_4_ = 0;
  for (; uVar22 = uVar21, uVar28 < 4; uVar28 = uVar28 + 1) {
    for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
      if (uStack_58 == *(uint **)((long)p + 0x30)) {
        if (*(char *)((long)p + 0x40) == '\0') {
          *(uint *)((long)p + 0xb8) = (uint)uStack_68;
          *(uint *)((long)p + 0xbc) = uVar28;
          *(ulong *)((long)p + 0x58) = uVar22;
          *(uint *)((long)p + 0x60) = uVar46;
          *(uint **)((long)p + 0x28) = uStack_58;
          *(int *)((long)p + 0x690) = (int)uStack_78;
          *(uint *)((long)p + 0x694) = uStack_84;
          *(int *)((long)p + 0x698) = (int)uStack_80;
          *(int *)((long)p + 0x69c) = uStack_80._4_4_;
          *(uint *)((long)p + 0x6a0) = uStack_78._4_4_;
          *(int *)((long)p + 0x678) = (int)uStack_40;
          goto LAB_0010765d;
        }
LAB_001085fc:
        uVar21 = 0;
        if (uStack_58 < *(uint **)((long)p + 0x30)) goto LAB_0010aceb;
      }
      else {
LAB_0010aceb:
        uVar21 = (ulong)(byte)*uStack_58;
        uStack_58 = (uint *)((long)uStack_58 + 1);
      }
      cVar31 = (char)uVar46;
      uVar22 = uVar22 | uVar21 << (0x38U - cVar31 & 0x3f);
    }
    uVar21 = uVar22 << 8;
    uVar46 = uVar46 - 8;
    uStack_68._0_4_ = (uint)uStack_68 << 8 | (uint)(byte)(uVar22 >> 0x38);
  }
  *(int *)((long)p + 0x6a4) = (int)uStack_40;
  uVar22 = 0;
  uStack_68._4_4_ = 0xffffffff;
  uStack_80 = (uint *)0x100000001;
  uStack_84 = 1;
  uStack_78._0_4_ = 1;
  uVar17 = uVar21;
  goto LAB_0010abc7;
code_r0x0010ac3c:
  if (*(char *)((long)p + 0x40) == '\0') {
    *(uint *)((long)p + 0xb8) = (uint)uStack_68;
    *(uint *)((long)p + 0xbc) = uStack_68._4_4_;
    *(ulong *)((long)p + 0x58) = uVar17;
    *(uint *)((long)p + 0x60) = uVar46;
    *(uint **)((long)p + 0x28) = uStack_58;
    *(int *)((long)p + 0x690) = (int)uStack_78;
    *(uint *)((long)p + 0x694) = uStack_84;
    *(int *)((long)p + 0x698) = (int)uStack_80;
    *(int *)((long)p + 0x69c) = uStack_80._4_4_;
    *(int *)((long)p + 0x6a0) = (int)uVar22;
    *(int *)((long)p + 0x678) = (int)uStack_40;
    goto LAB_00106a2b;
  }
  goto LAB_001084a5;
LAB_0011287a:
  psVar13 = &plVar40->m_codec;
  plVar40 = (lzham_decompressor *)p;
  if (psVar13->m_decode_buf_eof == false) {
    (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
    (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
    (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
    (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
    (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
    ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
    ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
    ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
    ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
    ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
    ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
    goto LAB_0010d06e;
  }
  goto LAB_0010ea91;
switchD_001108df_caseD_1:
  uStack_84 = 0;
  for (; bVar48 = bVar47, uVar30 < 4; uVar30 = uVar30 + 1) {
    for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
      if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
        psVar13 = &plVar40->m_codec;
        plVar40 = (lzham_decompressor *)p;
        if (psVar13->m_decode_buf_eof == false) {
          (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
          (((lzham_decompressor *)p)->m_codec).m_arith_length = uVar30;
          (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
          (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
          (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
          ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
          ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
          ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
          ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
          ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
          ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
          goto LAB_0010dbe5;
        }
LAB_0010ea30:
        uVar43 = 0;
        p = plVar40;
        if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110f14;
      }
      else {
LAB_00110f14:
        uVar43 = (ulong)(byte)*uStack_80;
        uStack_80 = (uint *)((long)uStack_80 + 1);
      }
      cVar31 = (char)uVar29;
      bVar48 = bVar48 | uVar43 << (0x38U - cVar31 & 0x3f);
    }
    bVar47 = bVar48 << 8;
    uVar29 = uVar29 - 8;
    uStack_84 = uStack_84 << 8 | (uint)(byte)(bVar48 >> 0x38);
  }
  plVar40->m_start_block_dst_ofs = (uint)uVar21;
  uStack_a0._0_4_ = 1;
  uVar15 = 0;
  uStack_88 = 0xffffffff;
  iStack_a4 = 1;
  uStack_a0._4_4_ = 1;
  iStack_8c = 1;
  uVar43 = bVar47;
  for (; (int)uVar29 < 2; uVar29 = uVar29 + 8) {
    if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
      psVar13 = &plVar40->m_codec;
      plVar40 = (lzham_decompressor *)p;
      if (psVar13->m_decode_buf_eof == false) {
        (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
        (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
        (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
        (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
        (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
        ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
        ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
        ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
        ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
        ((lzham_decompressor *)p)->m_cur_state = uVar15;
        ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
        goto LAB_0010cee7;
      }
LAB_0010e90f:
      uVar22 = 0;
      p = plVar40;
      if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110342;
    }
    else {
LAB_00110342:
      uVar22 = (ulong)(byte)*uStack_80;
      uStack_80 = (uint *)((long)uStack_80 + 1);
    }
    cVar31 = (char)uVar29;
    uVar43 = uVar43 | uVar22 << (0x38U - cVar31 & 0x3f);
  }
  bVar47 = uVar43 << 2;
  uVar29 = uVar29 - 2;
  if (uVar43 >> 0x3e == 2) {
    lzham_decompressor::reset_all_tables(plVar40);
    plVar40 = (lzham_decompressor *)p;
    p = plVar40;
  }
  else if ((uint)(uVar43 >> 0x3e) == 1) {
    lzham_decompressor::reset_huffman_table_update_rates(plVar40);
    plVar40 = (lzham_decompressor *)p;
    p = plVar40;
  }
LAB_0010f3d4:
  paVar19 = plVar40->m_is_match_model + uVar15;
  uStack_68 = (ulong)uVar15;
  plVar41 = plVar40;
  plVar40 = (lzham_decompressor *)p;
  uVar24 = uStack_84;
  for (; p = plVar40, uStack_88 < 0x1000000; uStack_88 = uStack_88 << 8) {
    (plVar41->m_codec).m_pSaved_model = paVar19;
    bVar48 = bVar47;
    for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
      if (uStack_80 == (uint *)(plVar41->m_codec).m_pDecode_buf_end) {
        psVar13 = &plVar41->m_codec;
        plVar41 = (lzham_decompressor *)p;
        if (psVar13->m_decode_buf_eof == false) {
          (((lzham_decompressor *)p)->m_codec).m_arith_value = uVar24;
          (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
          (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
          (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
          (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
          ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
          ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
          ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
          ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
          ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
          ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
          goto LAB_0010db78;
        }
LAB_0010e9d3:
        uVar43 = 0;
        p = plVar41;
        if (uStack_80 < (plVar41->m_codec).m_pDecode_buf_end) goto LAB_001111d3;
      }
      else {
LAB_001111d3:
        uVar43 = (ulong)(byte)*uStack_80;
        uStack_80 = (uint *)((long)uStack_80 + 1);
      }
      bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
    }
    bVar47 = bVar48 << 8;
    uVar29 = uVar29 - 8;
    paVar19 = (adaptive_bit_model *)(plVar41->m_codec).m_pSaved_model;
    uVar24 = uVar24 << 8 | (uint)(byte)(bVar48 >> 0x38);
    plVar40 = (lzham_decompressor *)p;
  }
  uVar6 = paVar19->m_bit_0_prob;
  uVar20 = (uStack_88 >> 0xb) * (uint)uVar6;
  uVar30 = (uint)uVar21;
  uStack_84 = uVar24 - uVar20;
  if (uVar24 < uVar20) {
    paVar19->m_bit_0_prob = (short)(0x800 - uVar6 >> 5) + uVar6;
    uStack_84 = uVar24;
    uVar39 = uVar20;
  }
  else {
    paVar19->m_bit_0_prob = uVar6 - (uVar6 >> 5);
    uVar39 = uStack_88 - uVar20;
  }
  if (uVar24 < uVar20) {
    uStack_88 = uVar39;
    if ((uint)uStack_68 < 7) {
      pqVar37 = &plVar41->m_lit_table;
      pdVar26 = (plVar41->m_lit_table).m_pDecode_tables;
      if ((int)uVar29 < 0x18) {
        if (uStack_80 + 1 < (plVar41->m_codec).m_pDecode_buf_end) {
          uVar39 = *uStack_80;
          uVar29 = uVar29 + 0x20;
          bVar47 = bVar47 | (ulong)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 |
                                    (uVar39 & 0xff00) << 8 | uVar39 << 0x18) <<
                            (-(char)uVar29 & 0x3fU);
          uStack_80 = uStack_80 + 1;
          plVar41 = plVar40;
        }
        else {
          for (; plVar41 = plVar40, uStack_88 = uVar39, (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
            if ((plVar40->m_codec).m_decode_buf_eof == false) {
              (plVar40->m_codec).m_pSaved_huff_model = pqVar37;
              (plVar40->m_codec).m_arith_value = uStack_84;
              (plVar40->m_codec).m_arith_length = uVar39;
              (plVar40->m_codec).m_bit_buf = bVar47;
              (plVar40->m_codec).m_bit_count = uVar29;
              (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              plVar40->m_match_hist0 = iStack_8c;
              plVar40->m_match_hist1 = uStack_a0._4_4_;
              plVar40->m_match_hist2 = iStack_a4;
              plVar40->m_match_hist3 = (int)uStack_a0;
              plVar40->m_cur_state = (uint)uStack_68;
              plVar40->m_dst_ofs = uVar30;
              p = plVar40;
              goto LAB_001113ae;
            }
LAB_00111283:
            uVar43 = 0;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) {
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
          }
        }
      }
      plVar40 = plVar41;
      uVar39 = (uint)(ushort)(bVar47 >> 0x30);
      if (uVar39 < pdVar26->m_table_max_code) {
        uVar43 = (ulong)(pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] &
                        0xffff);
        uVar39 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar45 = pdVar26->m_decode_start_code_size - 0x41;
        do {
          iVar36 = iVar45;
          iVar45 = iVar36 + 1;
        } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar39);
        uVar24 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                 pdVar26->m_val_ptrs[iVar36 + 0x40U];
        uVar39 = 0;
        if (uVar24 < pqVar37->m_total_syms) {
          uVar39 = uVar24;
        }
        uVar43 = (ulong)pdVar26->m_sorted_symbol_order[(int)uVar39];
        uVar39 = iVar36 + 0x41;
      }
      bVar47 = bVar47 << ((byte)uVar39 & 0x3f);
      puVar4 = (pqVar37->m_sym_freq).m_p + uVar43;
      *puVar4 = *puVar4 + 1;
      uVar29 = uVar29 - uVar39;
      puVar1 = &pqVar37->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        plVar40 = (lzham_decompressor *)p;
        quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
        p = plVar40;
      }
    }
    else {
      uVar24 = (uint)__dest[uVar30 - iStack_8c & uVar28];
      pqVar37 = &plVar41->m_delta_lit_table;
      pdVar26 = (plVar41->m_delta_lit_table).m_pDecode_tables;
      if ((int)uVar29 < 0x18) {
        if (uStack_80 + 1 < (plVar40->m_codec).m_pDecode_buf_end) {
          uVar39 = *uStack_80;
          uVar29 = uVar29 + 0x20;
          bVar47 = bVar47 | (ulong)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 |
                                    (uVar39 & 0xff00) << 8 | uVar39 << 0x18) <<
                            (-(char)uVar29 & 0x3fU);
          uStack_80 = uStack_80 + 1;
        }
        else {
          for (; uStack_88 = uVar39, (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
            if ((plVar40->m_codec).m_decode_buf_eof == false) {
              (plVar40->m_codec).m_pSaved_huff_model = pqVar37;
              (plVar40->m_codec).m_arith_value = uStack_84;
              (plVar40->m_codec).m_arith_length = uVar39;
              (plVar40->m_codec).m_bit_buf = bVar47;
              (plVar40->m_codec).m_bit_count = uVar29;
              (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              plVar40->m_rep_lit0 = uVar24;
              plVar40->m_match_hist0 = iStack_8c;
              plVar40->m_match_hist1 = uStack_a0._4_4_;
              plVar40->m_match_hist2 = iStack_a4;
              plVar40->m_match_hist3 = (int)uStack_a0;
              plVar40->m_cur_state = (uint)uStack_68;
              plVar40->m_dst_ofs = uVar30;
              p = plVar40;
              goto LAB_0010f2de;
            }
LAB_0010f237:
            uVar43 = 0;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) {
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
          }
        }
      }
      uVar39 = (uint)(ushort)(bVar47 >> 0x30);
      if (uVar39 < pdVar26->m_table_max_code) {
        uVar20 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] & 0xffff;
        uVar39 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar45 = pdVar26->m_decode_start_code_size - 0x41;
        do {
          iVar36 = iVar45;
          iVar45 = iVar36 + 1;
        } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar39);
        uVar20 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                 pdVar26->m_val_ptrs[iVar36 + 0x40U];
        uVar39 = 0;
        if (uVar20 < pqVar37->m_total_syms) {
          uVar39 = uVar20;
        }
        uVar20 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar39];
        uVar39 = iVar36 + 0x41;
      }
      bVar47 = bVar47 << ((byte)uVar39 & 0x3f);
      puVar4 = (pqVar37->m_sym_freq).m_p + uVar20;
      *puVar4 = *puVar4 + 1;
      uVar29 = uVar29 - uVar39;
      puVar1 = &pqVar37->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        plVar40 = (lzham_decompressor *)p;
        quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
        p = plVar40;
      }
      uVar43 = (ulong)(uVar20 ^ uVar24);
    }
    __dest[uVar30] = (byte)uVar43;
    uVar15 = (uint)(byte)s_literal_next_state[uStack_68];
    uVar30 = uVar30 + 1;
    if (uVar28 < uVar30) {
      (plVar40->m_codec).m_arith_value = uStack_84;
      (plVar40->m_codec).m_arith_length = uStack_88;
      (plVar40->m_codec).m_bit_buf = bVar47;
      (plVar40->m_codec).m_bit_count = uVar29;
      (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
      plVar40->m_match_hist0 = iStack_8c;
      plVar40->m_match_hist1 = uStack_a0._4_4_;
      plVar40->m_match_hist2 = iStack_a4;
      plVar40->m_match_hist3 = (int)uStack_a0;
      plVar40->m_cur_state = uVar15;
      plVar40->m_dst_ofs = uVar30;
      plVar40->m_pFlush_src =
           plVar40->m_pDecomp_buf +
           (ulong)plVar40->m_dst_highwater_ofs +
           (ulong)plVar40->m_seed_bytes_to_ignore_when_flushing;
      plVar40->m_flush_num_bytes_remaining =
           (ulong)(uVar46 - (plVar40->m_dst_highwater_ofs +
                            plVar40->m_seed_bytes_to_ignore_when_flushing));
      plVar40->m_seed_bytes_to_ignore_when_flushing = 0;
      plVar40->m_dst_highwater_ofs = 0;
LAB_0010d5ee:
      uVar43 = plVar40->m_flush_num_bytes_remaining;
      if (uVar43 != 0) {
        uVar21 = *plVar40->m_pOut_buf_size;
        if (uVar43 < *plVar40->m_pOut_buf_size) {
          uVar21 = uVar43;
        }
        plVar40->m_flush_n = uVar21;
        if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
          ppuVar2 = &plVar40->m_pOut_buf;
          ppuVar3 = &plVar40->m_pFlush_src;
          plVar40 = (lzham_decompressor *)p;
          memcpy(*ppuVar2,*ppuVar3,uVar21);
        }
        else {
          uVar43 = plVar40->m_flush_n;
          if (uVar43 != 0) {
            uVar21 = 0;
            do {
              sVar50 = uVar43 - uVar21;
              if (0x1fff < sVar50) {
                sVar50 = 0x2000;
              }
              memcpy(plVar40->m_pOut_buf + uVar21,plVar40->m_pFlush_src + uVar21,sVar50);
              plVar40 = (lzham_decompressor *)p;
              uVar15 = adler32(((lzham_decompressor *)p)->m_pFlush_src + uVar21,sVar50,
                               ((lzham_decompressor *)p)->m_decomp_adler32);
              plVar40->m_decomp_adler32 = uVar15;
              uVar21 = uVar21 + sVar50;
              uVar43 = plVar40->m_flush_n;
              p = plVar40;
            } while (uVar21 < uVar43);
          }
        }
        *plVar40->m_pIn_buf_size =
             (long)(plVar40->m_codec).m_pDecode_buf_next - (long)(plVar40->m_codec).m_pDecode_buf;
        *plVar40->m_pOut_buf_size = plVar40->m_flush_n;
        plVar40->m_state = 0x318;
        goto LAB_00110369;
      }
      iStack_8c = plVar40->m_match_hist0;
      uStack_a0._4_4_ = plVar40->m_match_hist1;
      iStack_a4 = plVar40->m_match_hist2;
      uStack_a0._0_4_ = plVar40->m_match_hist3;
      uVar15 = plVar40->m_cur_state;
      uStack_84 = (plVar40->m_codec).m_arith_value;
      uStack_88 = (plVar40->m_codec).m_arith_length;
      uStack_80 = (uint *)(plVar40->m_codec).m_pDecode_buf_next;
      bVar47 = (plVar40->m_codec).m_bit_buf;
      uVar29 = (plVar40->m_codec).m_bit_count;
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)uVar30;
    }
    goto LAB_0010f3d4;
  }
  paVar19 = plVar41->m_is_rep_model + uStack_68;
  uVar24 = 1;
  for (; plVar40 = plVar41, uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
    (plVar40->m_codec).m_pSaved_model = paVar19;
    bVar48 = bVar47;
    for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
      if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
        psVar13 = &plVar40->m_codec;
        plVar40 = (lzham_decompressor *)p;
        if (psVar13->m_decode_buf_eof == false) {
          (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
          (((lzham_decompressor *)p)->m_codec).m_arith_length = uVar39;
          (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
          (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
          (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
          ((lzham_decompressor *)p)->m_match_len = uVar24;
          ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
          ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
          ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
          ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
          ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
          ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
          goto LAB_0010d85b;
        }
LAB_0010e76f:
        uVar43 = 0;
        p = plVar40;
        if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00111901;
      }
      else {
LAB_00111901:
        uVar43 = (ulong)(byte)*uStack_80;
        uStack_80 = (uint *)((long)uStack_80 + 1);
      }
      bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
    }
    bVar47 = bVar48 << 8;
    uVar29 = uVar29 - 8;
    paVar19 = (adaptive_bit_model *)(plVar40->m_codec).m_pSaved_model;
    uStack_84 = uStack_84 << 8 | (uint)(byte)(bVar48 >> 0x38);
    plVar41 = plVar40;
  }
  uVar6 = paVar19->m_bit_0_prob;
  uStack_88 = (uVar39 >> 0xb) * (uint)uVar6;
  uVar20 = uStack_84 - uStack_88;
  if (uStack_88 <= uStack_84) {
    paVar19->m_bit_0_prob = uVar6 - (uVar6 >> 5);
    paVar19 = plVar40->m_is_rep0_model + uStack_68;
    uVar21 = (ulong)uVar30;
    iVar45 = uStack_a0._4_4_;
    for (uStack_88 = uVar39 - uStack_88; uStack_88 < 0x1000000; uStack_88 = uStack_88 << 8) {
      (plVar40->m_codec).m_pSaved_model = paVar19;
      bVar48 = bVar47;
      for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
        if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
          psVar13 = &plVar40->m_codec;
          plVar40 = (lzham_decompressor *)p;
          if (psVar13->m_decode_buf_eof == false) {
            (((lzham_decompressor *)p)->m_codec).m_arith_value = uVar20;
            (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
            (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
            (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
            (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
            ((lzham_decompressor *)p)->m_match_len = uVar24;
            ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
            ((lzham_decompressor *)p)->m_match_hist1 = iVar45;
            ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
            ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
            ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
            ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
            goto LAB_0010c78a;
          }
LAB_0010e34f:
          uVar43 = 0;
          p = plVar40;
          if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010fef0;
        }
        else {
LAB_0010fef0:
          uVar43 = (ulong)(byte)*uStack_80;
          uStack_80 = (uint *)((long)uStack_80 + 1);
        }
        bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
      }
      bVar47 = bVar48 << 8;
      uVar29 = uVar29 - 8;
      paVar19 = (adaptive_bit_model *)(plVar40->m_codec).m_pSaved_model;
      uVar20 = uVar20 << 8 | (uint)(byte)(bVar48 >> 0x38);
    }
    uVar6 = paVar19->m_bit_0_prob;
    uVar30 = (uStack_88 >> 0xb) * (uint)uVar6;
    uStack_84 = uVar20 - uVar30;
    if (uVar20 < uVar30) {
      paVar19->m_bit_0_prob = (short)(0x800 - uVar6 >> 5) + uVar6;
      uStack_84 = uVar20;
      uStack_88 = uVar30;
    }
    else {
      paVar19->m_bit_0_prob = uVar6 - (uVar6 >> 5);
      uStack_88 = uStack_88 - uVar30;
    }
    if (uVar20 < uVar30) {
      uStack_a0 = CONCAT44(iVar45,(int)uStack_a0);
      bVar54 = 6 < (uint)uStack_68;
      pqVar37 = (quasi_adaptive_huffman_data_model *)(&plVar40->field_0x318 + (uint)bVar54 * 0x90);
      pdVar26 = *(decoder_tables **)(&plVar40->field_0x380 + (uint)bVar54 * 0x90);
      plVar41 = (lzham_decompressor *)p;
      if ((int)uVar29 < 0x18) {
        if (uStack_80 + 1 < (plVar40->m_codec).m_pDecode_buf_end) {
          uVar30 = *uStack_80;
          uVar29 = uVar29 + 0x20;
          bVar47 = bVar47 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                    (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                            (-(char)uVar29 & 0x3fU);
          uStack_80 = uStack_80 + 1;
          plVar40 = (lzham_decompressor *)p;
        }
        else {
          for (; (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
            if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_pSaved_huff_model = pqVar37;
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar24;
              ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
              ((lzham_decompressor *)p)->m_match_hist1 = iVar45;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
              goto LAB_00111f6e;
            }
LAB_00111ed4:
            uVar43 = 0;
            if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end) {
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
          }
          uStack_a0 = CONCAT44(iVar45,(int)uStack_a0);
          plVar40 = (lzham_decompressor *)p;
        }
      }
      uVar30 = (uint)uVar21;
      uVar39 = (uint)(ushort)(bVar47 >> 0x30);
      if (uVar39 < pdVar26->m_table_max_code) {
        uVar24 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] & 0xffff;
        uVar39 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar45 = pdVar26->m_decode_start_code_size - 0x41;
        do {
          iVar36 = iVar45;
          iVar45 = iVar36 + 1;
        } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar39);
        uVar24 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                 pdVar26->m_val_ptrs[iVar36 + 0x40U];
        uVar39 = 0;
        if (uVar24 < pqVar37->m_total_syms) {
          uVar39 = uVar24;
        }
        uVar24 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar39];
        uVar39 = iVar36 + 0x41;
      }
      bVar47 = bVar47 << ((byte)uVar39 & 0x3f);
      puVar4 = (pqVar37->m_sym_freq).m_p + uVar24;
      *puVar4 = *puVar4 + 1;
      uVar29 = uVar29 - uVar39;
      puVar1 = &pqVar37->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      p = plVar41;
      if (*puVar1 == 0) {
        plVar40 = plVar41;
        quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
        p = plVar40;
      }
      uVar24 = uVar24 + 2;
      uVar39 = 0;
      if (uVar24 == 0x102) {
        do {
          while (uVar24 = uVar29, (int)uVar24 < 1) {
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
              psVar13 = &plVar40->m_codec;
              plVar40 = (lzham_decompressor *)p;
              if (psVar13->m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar24;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_len = uVar39;
                ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
                goto LAB_0010d935;
              }
LAB_0010e84b:
              uVar43 = 0;
              p = plVar40;
              if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00111cbb;
            }
            else {
LAB_00111cbb:
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar24 & 0x3f);
            uVar29 = uVar24 + 8;
          }
          uVar43 = bVar47 * 2;
          if (-1 < (long)bVar47) break;
          uVar39 = uVar39 + 1;
          bVar47 = uVar43;
          uVar29 = uVar24 - 1;
        } while (uVar39 < 3);
        iVar45 = uVar24 - 1;
        while( true ) {
          bVar5 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar39);
          uVar29 = iVar45 - (uint)bVar5;
          if ((int)(uint)bVar5 <= iVar45) break;
          if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
            psVar13 = &plVar40->m_codec;
            plVar40 = (lzham_decompressor *)p;
            if (psVar13->m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = iVar45;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar39;
              ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
              ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
              goto LAB_0010c8ab;
            }
LAB_0010e43c:
            uVar21 = 0;
            p = plVar40;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_001100ea;
          }
          else {
LAB_001100ea:
            uVar21 = (ulong)(byte)*uStack_80;
            uStack_80 = (uint *)((long)uStack_80 + 1);
          }
          cVar31 = (char)iVar45;
          iVar45 = iVar45 + 8;
          uVar43 = uVar43 | uVar21 << (0x38U - cVar31 & 0x3f);
        }
        bVar47 = uVar43 << (bVar5 & 0x3f);
        uVar24 = (int)(uVar43 >> (-bVar5 & 0x3f)) +
                 *(int *)(s_huge_match_base_len + (ulong)uVar39 * 4);
      }
      paVar19 = plVar40->m_is_rep1_model + uStack_68;
      iVar45 = (int)uStack_a0;
      iVar36 = iStack_8c;
      for (; uVar20 = (uint)uStack_68, uStack_88 < 0x1000000; uStack_88 = uStack_88 << 8) {
        (plVar40->m_codec).m_pSaved_model = paVar19;
        uVar43 = bVar47;
        for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
          if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
            psVar13 = &plVar40->m_codec;
            plVar40 = (lzham_decompressor *)p;
            if (psVar13->m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar24;
              ((lzham_decompressor *)p)->m_match_hist0 = iVar36;
              ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = iVar45;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
              goto LAB_0010d305;
            }
LAB_0010e278:
            uVar21 = 0;
            p = plVar40;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00111fd2;
          }
          else {
LAB_00111fd2:
            uVar21 = (ulong)(byte)*uStack_80;
            uStack_80 = (uint *)((long)uStack_80 + 1);
          }
          uVar43 = uVar43 | uVar21 << (0x38U - (char)uVar29 & 0x3f);
        }
        bVar47 = uVar43 << 8;
        uVar29 = uVar29 - 8;
        paVar19 = (adaptive_bit_model *)(plVar40->m_codec).m_pSaved_model;
        uStack_84 = uStack_84 << 8 | (uint)(byte)(uVar43 >> 0x38);
      }
      uVar6 = paVar19->m_bit_0_prob;
      uVar39 = (uStack_88 >> 0xb) * (uint)uVar6;
      if (uStack_84 < uVar39) {
        paVar19->m_bit_0_prob = (short)(0x800 - uVar6 >> 5) + uVar6;
        paVar19 = plVar40->m_is_rep2_model + uStack_68;
        uStack_88 = iStack_a4;
        iStack_a4 = uStack_a0._4_4_;
        for (; uVar20 = (uint)uStack_68, uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
          (plVar40->m_codec).m_pSaved_model = paVar19;
          uVar43 = bVar47;
          for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
              psVar13 = &plVar40->m_codec;
              plVar40 = (lzham_decompressor *)p;
              if (psVar13->m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uVar39;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_len = uVar24;
                ((lzham_decompressor *)p)->m_match_hist0 = iVar36;
                ((lzham_decompressor *)p)->m_match_hist1 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist2 = uStack_88;
                ((lzham_decompressor *)p)->m_match_hist3 = iVar45;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = uVar30;
                goto LAB_0010c562;
              }
LAB_0010df74:
              uVar21 = 0;
              p = plVar40;
              if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010f797;
            }
            else {
LAB_0010f797:
              uVar21 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            uVar43 = uVar43 | uVar21 << (0x38U - (char)uVar29 & 0x3f);
          }
          bVar47 = uVar43 << 8;
          uVar29 = uVar29 - 8;
          paVar19 = (adaptive_bit_model *)(plVar40->m_codec).m_pSaved_model;
          uStack_84 = uStack_84 << 8 | (uint)(byte)(uVar43 >> 0x38);
        }
        uVar6 = paVar19->m_bit_0_prob;
        uVar42 = (uVar39 >> 0xb) * (uint)uVar6;
        if (uStack_84 < uVar42) {
          paVar19->m_bit_0_prob = (short)(0x800 - uVar6 >> 5) + uVar6;
          uStack_a0._0_4_ = uStack_88;
          iStack_8c = iVar45;
          uStack_88 = uVar42;
        }
        else {
          paVar19->m_bit_0_prob = uVar6 - (uVar6 >> 5);
          iStack_8c = uStack_88;
          uStack_88 = uVar39 - uVar42;
          uStack_84 = uStack_84 - uVar42;
          uStack_a0._0_4_ = iVar45;
        }
      }
      else {
        paVar19->m_bit_0_prob = uVar6 - (uVar6 >> 5);
        iStack_8c = uStack_a0._4_4_;
        uStack_88 = uStack_88 - uVar39;
        uStack_84 = uStack_84 - uVar39;
        uStack_a0._0_4_ = iVar45;
      }
      uVar21 = (ulong)uVar30;
      uVar15 = (uint)(6 < uVar20) * 3 + 8;
      uStack_a0._4_4_ = iVar36;
    }
    else {
      paVar19 = plVar40->m_is_rep0_single_byte_model + uStack_68;
      for (; uStack_88 < 0x1000000; uStack_88 = uStack_88 << 8) {
        (plVar40->m_codec).m_pSaved_model = paVar19;
        bVar48 = bVar47;
        for (; (int)uVar29 < 8; uVar29 = uVar29 + 8) {
          if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
            psVar13 = &plVar40->m_codec;
            plVar40 = (lzham_decompressor *)p;
            if (psVar13->m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar48;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar24;
              ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
              ((lzham_decompressor *)p)->m_match_hist1 = iVar45;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
              goto LAB_0010d22b;
            }
LAB_0010e17d:
            uVar43 = 0;
            p = plVar40;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00111a99;
          }
          else {
LAB_00111a99:
            uVar43 = (ulong)(byte)*uStack_80;
            uStack_80 = (uint *)((long)uStack_80 + 1);
          }
          bVar48 = bVar48 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
        }
        bVar47 = bVar48 << 8;
        uVar29 = uVar29 - 8;
        paVar19 = (adaptive_bit_model *)(plVar40->m_codec).m_pSaved_model;
        uStack_84 = uStack_84 << 8 | (uint)(byte)(bVar48 >> 0x38);
      }
      uVar6 = paVar19->m_bit_0_prob;
      uVar39 = (uStack_88 >> 0xb) * (uint)uVar6;
      uVar30 = uStack_84 - uVar39;
      if (uStack_84 < uVar39) {
        paVar19->m_bit_0_prob = (short)(0x800 - uVar6 >> 5) + uVar6;
        uStack_88 = uVar39;
        uVar30 = uStack_84;
      }
      else {
        paVar19->m_bit_0_prob = uVar6 - (uVar6 >> 5);
        uStack_88 = uStack_88 - uVar39;
      }
      uVar20 = (uint)uStack_68;
      uStack_a0._4_4_ = iVar45;
      if (uStack_84 < uVar39) {
        pqVar37 = (quasi_adaptive_huffman_data_model *)
                  (&plVar40->field_0x318 + (uint)(6 < uVar20) * 0x90);
        pdVar26 = *(decoder_tables **)(&plVar40->field_0x380 + (uint)(6 < uVar20) * 0x90);
        plVar41 = (lzham_decompressor *)p;
        if ((int)uVar29 < 0x18) {
          if (uStack_80 + 1 < (plVar40->m_codec).m_pDecode_buf_end) {
            uVar39 = *uStack_80;
            uVar29 = uVar29 + 0x20;
            bVar47 = bVar47 | (ulong)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 |
                                      (uVar39 & 0xff00) << 8 | uVar39 << 0x18) <<
                              (-(char)uVar29 & 0x3fU);
            uStack_80 = uStack_80 + 1;
            plVar40 = (lzham_decompressor *)p;
          }
          else {
            for (; plVar40 = (lzham_decompressor *)p, uStack_a0._4_4_ = iVar45, (int)uVar29 < 0x18;
                uVar29 = uVar29 + 8) {
              if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_pSaved_huff_model = pqVar37;
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uVar30;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_len = uVar24;
                ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                ((lzham_decompressor *)p)->m_match_hist1 = iVar45;
                ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                goto LAB_0010ec70;
              }
LAB_0010ebdb:
              uVar43 = 0;
              if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end) {
                uVar43 = (ulong)(byte)*uStack_80;
                uStack_80 = (uint *)((long)uStack_80 + 1);
              }
              bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
            }
          }
        }
        uVar39 = (uint)(ushort)(bVar47 >> 0x30);
        if (uVar39 < pdVar26->m_table_max_code) {
          uVar24 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] & 0xffff;
          uVar39 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar45 = pdVar26->m_decode_start_code_size - 0x41;
          do {
            iVar36 = iVar45;
            iVar45 = iVar36 + 1;
          } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar39);
          uVar24 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                   pdVar26->m_val_ptrs[iVar36 + 0x40U];
          uVar39 = 0;
          if (uVar24 < pqVar37->m_total_syms) {
            uVar39 = uVar24;
          }
          uVar24 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar39];
          uVar39 = iVar36 + 0x41;
        }
        bVar47 = bVar47 << ((byte)uVar39 & 0x3f);
        puVar4 = (pqVar37->m_sym_freq).m_p + uVar24;
        *puVar4 = *puVar4 + 1;
        uVar29 = uVar29 - uVar39;
        puVar1 = &pqVar37->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        p = plVar41;
        if (*puVar1 == 0) {
          plVar40 = plVar41;
          quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
          p = plVar40;
        }
        uVar24 = uVar24 + 2;
        uVar39 = 0;
        if (uVar24 == 0x102) {
          do {
            while (uVar24 = uVar29, (int)uVar24 < 1) {
              if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
                psVar13 = &plVar40->m_codec;
                plVar40 = (lzham_decompressor *)p;
                if (psVar13->m_decode_buf_eof == false) {
                  (((lzham_decompressor *)p)->m_codec).m_arith_value = uVar30;
                  (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                  (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                  (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar24;
                  (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                  ((lzham_decompressor *)p)->m_match_len = uVar39;
                  ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                  ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                  ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                  ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                  ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                  ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                  goto LAB_0010d372;
                }
LAB_0010e2e1:
                uVar43 = 0;
                p = plVar40;
                if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00110409;
              }
              else {
LAB_00110409:
                uVar43 = (ulong)(byte)*uStack_80;
                uStack_80 = (uint *)((long)uStack_80 + 1);
              }
              bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar24 & 0x3f);
              uVar29 = uVar24 + 8;
            }
            uVar43 = bVar47 * 2;
            if (-1 < (long)bVar47) break;
            uVar39 = uVar39 + 1;
            bVar47 = uVar43;
            uVar29 = uVar24 - 1;
          } while (uVar39 < 3);
          iVar45 = uVar24 - 1;
          while( true ) {
            bVar5 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar39);
            uVar29 = iVar45 - (uint)bVar5;
            if ((int)(uint)bVar5 <= iVar45) break;
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
              psVar13 = &plVar40->m_codec;
              plVar40 = (lzham_decompressor *)p;
              if (psVar13->m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uVar30;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = iVar45;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_len = uVar39;
                ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                goto LAB_0010cb13;
              }
LAB_0010dfde:
              uVar22 = 0;
              p = plVar40;
              if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010f90e;
            }
            else {
LAB_0010f90e:
              uVar22 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            cVar31 = (char)iVar45;
            iVar45 = iVar45 + 8;
            uVar43 = uVar43 | uVar22 << (0x38U - cVar31 & 0x3f);
          }
          bVar47 = uVar43 << (bVar5 & 0x3f);
          uVar24 = (int)(uVar43 >> (-bVar5 & 0x3f)) +
                   *(int *)(s_huge_match_base_len + (ulong)uVar39 * 4);
        }
        uVar15 = (uint)(6 < (uint)uStack_68) * 3 + 8;
        uStack_84 = uVar30;
      }
      else {
        uVar15 = (uint)(6 < uVar20) * 2 + 9;
        uStack_84 = uVar30;
      }
    }
LAB_0011199f:
    uVar20 = (uint)uVar21;
    uVar39 = uVar20 - iStack_8c & uVar28;
    uVar43 = (ulong)uVar39;
    uVar30 = uVar20;
    if (uVar20 < uVar39) {
      uVar30 = uVar39;
    }
    pbVar33 = __dest + uVar43;
    uVar22 = uVar21;
    if (uVar28 < uVar30 + uVar24) {
      do {
        pbVar34 = pbVar33 + 1;
        uVar30 = (int)uVar22 + 1;
        uVar21 = (ulong)uVar30;
        __dest[uVar22] = *pbVar33;
        pbVar33 = pbVar34;
        if (pbVar34 == __dest + lVar51) {
          pbVar33 = __dest;
        }
        if (uVar28 < uVar30) {
          (plVar40->m_codec).m_arith_value = uStack_84;
          (plVar40->m_codec).m_arith_length = uStack_88;
          (plVar40->m_codec).m_bit_buf = bVar47;
          (plVar40->m_codec).m_bit_count = uVar29;
          (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
          plVar40->m_match_len = uVar24;
          plVar40->m_src_ofs = (uint)uVar43;
          plVar40->m_pCopy_src = pbVar33;
          plVar40->m_match_hist0 = iStack_8c;
          plVar40->m_match_hist1 = uStack_a0._4_4_;
          plVar40->m_match_hist2 = iStack_a4;
          plVar40->m_match_hist3 = (int)uStack_a0;
          plVar40->m_cur_state = uVar15;
          plVar40->m_dst_ofs = uVar30;
          plVar40->m_pFlush_src =
               plVar40->m_pDecomp_buf +
               (ulong)plVar40->m_dst_highwater_ofs +
               (ulong)plVar40->m_seed_bytes_to_ignore_when_flushing;
          plVar40->m_flush_num_bytes_remaining =
               (ulong)(uVar46 - (plVar40->m_dst_highwater_ofs +
                                plVar40->m_seed_bytes_to_ignore_when_flushing));
          plVar40->m_seed_bytes_to_ignore_when_flushing = 0;
          plVar40->m_dst_highwater_ofs = 0;
LAB_0010cb9f:
          uVar43 = plVar40->m_flush_num_bytes_remaining;
          if (uVar43 != 0) {
            uVar21 = *plVar40->m_pOut_buf_size;
            if (uVar43 < *plVar40->m_pOut_buf_size) {
              uVar21 = uVar43;
            }
            plVar40->m_flush_n = uVar21;
            if (((plVar40->m_params).m_decompress_flags & 2) == 0) {
              ppuVar2 = &plVar40->m_pOut_buf;
              ppuVar3 = &plVar40->m_pFlush_src;
              plVar40 = (lzham_decompressor *)p;
              memcpy(*ppuVar2,*ppuVar3,uVar21);
            }
            else {
              uVar43 = plVar40->m_flush_n;
              if (uVar43 != 0) {
                uVar21 = 0;
                do {
                  sVar50 = uVar43 - uVar21;
                  if (0x1fff < sVar50) {
                    sVar50 = 0x2000;
                  }
                  memcpy(plVar40->m_pOut_buf + uVar21,plVar40->m_pFlush_src + uVar21,sVar50);
                  plVar40 = (lzham_decompressor *)p;
                  uVar15 = adler32(((lzham_decompressor *)p)->m_pFlush_src + uVar21,sVar50,
                                   ((lzham_decompressor *)p)->m_decomp_adler32);
                  plVar40->m_decomp_adler32 = uVar15;
                  uVar21 = uVar21 + sVar50;
                  uVar43 = plVar40->m_flush_n;
                  p = plVar40;
                } while (uVar21 < uVar43);
              }
            }
            *plVar40->m_pIn_buf_size =
                 (long)(plVar40->m_codec).m_pDecode_buf_next -
                 (long)(plVar40->m_codec).m_pDecode_buf;
            *plVar40->m_pOut_buf_size = plVar40->m_flush_n;
            plVar40->m_state = 0x40e;
            goto LAB_00110369;
          }
          uVar24 = plVar40->m_match_len;
          uVar43 = (ulong)plVar40->m_src_ofs;
          pbVar33 = plVar40->m_pCopy_src;
          iStack_8c = plVar40->m_match_hist0;
          uStack_a0._4_4_ = plVar40->m_match_hist1;
          iStack_a4 = plVar40->m_match_hist2;
          uStack_a0._0_4_ = plVar40->m_match_hist3;
          uVar15 = plVar40->m_cur_state;
          uStack_84 = (plVar40->m_codec).m_arith_value;
          uStack_88 = (plVar40->m_codec).m_arith_length;
          uStack_80 = (uint *)(plVar40->m_codec).m_pDecode_buf_next;
          bVar47 = (plVar40->m_codec).m_bit_buf;
          uVar29 = (plVar40->m_codec).m_bit_count;
          uVar21 = 0;
        }
        uVar24 = uVar24 - 1;
        uVar22 = uVar21;
      } while (uVar24 != 0);
    }
    else {
      if (iStack_8c == 1) {
        if ((7 < uVar24) || (uVar24 != 0)) {
          plVar40 = (lzham_decompressor *)p;
          memset(__dest + uVar21,(uint)*pbVar33,(ulong)uVar24);
          p = plVar40;
        }
      }
      else if ((uVar24 < 8) || (iStack_8c < (int)uVar24)) {
        if (0 < (int)uVar24) {
          iVar45 = uVar24 + 1;
          pbVar33 = __dest;
          do {
            pbVar33[uVar21] = pbVar33[uVar43];
            iVar45 = iVar45 + -1;
            pbVar33 = pbVar33 + 1;
          } while (1 < iVar45);
        }
      }
      else {
        plVar40 = (lzham_decompressor *)p;
        memcpy(__dest + uVar21,pbVar33,(ulong)uVar24);
        p = plVar40;
      }
      uVar21 = (ulong)(uVar20 + uVar24);
    }
    goto LAB_0010f3d4;
  }
  paVar19->m_bit_0_prob = (short)(0x800 - uVar6 >> 5) + uVar6;
  pqVar37 = &plVar40->m_main_table;
  pdVar26 = (plVar40->m_main_table).m_pDecode_tables;
  uVar21 = (ulong)uVar30;
  plVar41 = (lzham_decompressor *)p;
  if ((int)uVar29 < 0x18) {
    if (uStack_80 + 1 < (plVar40->m_codec).m_pDecode_buf_end) {
      uVar30 = *uStack_80;
      uVar29 = uVar29 + 0x20;
      bVar47 = bVar47 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 |
                               uVar30 << 0x18) << (-(char)uVar29 & 0x3fU);
      uStack_80 = uStack_80 + 1;
      plVar40 = (lzham_decompressor *)p;
    }
    else {
      for (; plVar40 = (lzham_decompressor *)p, (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
        if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
          (((lzham_decompressor *)p)->m_codec).m_pSaved_huff_model = pqVar37;
          (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
          (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
          (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
          (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
          (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
          ((lzham_decompressor *)p)->m_match_len = uVar24;
          ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
          ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
          ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
          ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
          ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
          ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
          goto LAB_00112118;
        }
LAB_00112092:
        uVar43 = 0;
        if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end) {
          uVar43 = (ulong)(byte)*uStack_80;
          uStack_80 = (uint *)((long)uStack_80 + 1);
        }
        bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
      }
    }
  }
  uVar30 = (uint)(ushort)(bVar47 >> 0x30);
  if (uVar30 < pdVar26->m_table_max_code) {
    uVar30 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] & 0xffff;
    uVar39 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
  }
  else {
    iVar45 = pdVar26->m_decode_start_code_size - 0x41;
    do {
      iVar36 = iVar45;
      iVar45 = iVar36 + 1;
    } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar30);
    uVar39 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) + pdVar26->m_val_ptrs[iVar36 + 0x40U];
    uVar30 = 0;
    if (uVar39 < pqVar37->m_total_syms) {
      uVar30 = uVar39;
    }
    uVar39 = iVar36 + 0x41;
    uVar30 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar30];
  }
  bVar47 = bVar47 << ((byte)uVar39 & 0x3f);
  puVar4 = (pqVar37->m_sym_freq).m_p + uVar30;
  *puVar4 = *puVar4 + 1;
  uVar29 = uVar29 - uVar39;
  puVar1 = &pqVar37->m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  p = plVar41;
  if (*puVar1 == 0) {
    plVar40 = plVar41;
    quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
    p = plVar40;
  }
  if (1 < uVar30) {
    uVar24 = (uVar30 - 2 & 7) + 2;
    uStack_58._4_4_ = (uVar30 - 2 >> 3) + 1;
    if (uVar24 == 9) {
      bVar54 = 6 < (uint)uStack_68;
      pqVar37 = (quasi_adaptive_huffman_data_model *)(&plVar40->field_0x438 + (uint)bVar54 * 0x90);
      pdVar26 = *(decoder_tables **)(&plVar40->field_0x4a0 + (uint)bVar54 * 0x90);
      uVar15 = 9;
      plVar41 = (lzham_decompressor *)p;
      if ((int)uVar29 < 0x18) {
        if (uStack_80 + 1 < (plVar40->m_codec).m_pDecode_buf_end) {
          uVar30 = *uStack_80;
          uVar29 = uVar29 + 0x20;
          bVar47 = bVar47 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                    (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                            (-(char)uVar29 & 0x3fU);
          uStack_80 = uStack_80 + 1;
          plVar40 = (lzham_decompressor *)p;
        }
        else {
          for (; plVar40 = (lzham_decompressor *)p, (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
            if ((((lzham_decompressor *)p)->m_codec).m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_pSaved_huff_model = pqVar37;
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar15;
              ((lzham_decompressor *)p)->m_match_slot = uStack_58._4_4_;
              ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
              ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
              goto LAB_0010f071;
            }
LAB_0010efc5:
            uVar43 = 0;
            if (uStack_80 < (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_end) {
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
          }
        }
      }
      uVar30 = (uint)(ushort)(bVar47 >> 0x30);
      if (uVar30 < pdVar26->m_table_max_code) {
        uVar24 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] & 0xffff;
        uVar30 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar45 = pdVar26->m_decode_start_code_size - 0x41;
        do {
          iVar36 = iVar45;
          iVar45 = iVar36 + 1;
        } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar30);
        uVar39 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                 pdVar26->m_val_ptrs[iVar36 + 0x40U];
        uVar30 = 0;
        if (uVar39 < pqVar37->m_total_syms) {
          uVar30 = uVar39;
        }
        uVar24 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar30];
        uVar30 = iVar36 + 0x41;
      }
      bVar47 = bVar47 << ((byte)uVar30 & 0x3f);
      puVar4 = (pqVar37->m_sym_freq).m_p + uVar24;
      *puVar4 = *puVar4 + 1;
      uVar29 = uVar29 - uVar30;
      puVar1 = &pqVar37->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      p = plVar41;
      if (*puVar1 == 0) {
        plVar40 = plVar41;
        quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
        p = plVar40;
      }
      uVar24 = uVar24 + uVar15;
      uVar39 = 0;
      if (uVar24 == 0x102) {
        do {
          while (uVar30 = uVar29, (int)uVar30 < 1) {
            if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
              psVar13 = &plVar40->m_codec;
              plVar40 = (lzham_decompressor *)p;
              if (psVar13->m_decode_buf_eof == false) {
                (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
                (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
                (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
                (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar30;
                (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
                ((lzham_decompressor *)p)->m_match_len = uVar39;
                ((lzham_decompressor *)p)->m_match_slot = uStack_58._4_4_;
                ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
                ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
                ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
                ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
                ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
                ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
                goto LAB_0010d6ce;
              }
LAB_0010e5e5:
              uVar43 = 0;
              p = plVar40;
              if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_00112198;
            }
            else {
LAB_00112198:
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar30 & 0x3f);
            uVar29 = uVar30 + 8;
          }
          uVar43 = bVar47 * 2;
          if (-1 < (long)bVar47) break;
          uVar39 = uVar39 + 1;
          bVar47 = uVar43;
          uVar29 = uVar30 - 1;
        } while (uVar39 < 3);
        iVar45 = uVar30 - 1;
        while( true ) {
          bVar5 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar39);
          uVar29 = iVar45 - (uint)bVar5;
          if ((int)(uint)bVar5 <= iVar45) break;
          if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
            psVar13 = &plVar40->m_codec;
            plVar40 = (lzham_decompressor *)p;
            if (psVar13->m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = uVar43;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = iVar45;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar39;
              ((lzham_decompressor *)p)->m_match_slot = uStack_58._4_4_;
              ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
              ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
              goto LAB_0010d8c8;
            }
LAB_0010e7da:
            uVar22 = 0;
            p = plVar40;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_001122ea;
          }
          else {
LAB_001122ea:
            uVar22 = (ulong)(byte)*uStack_80;
            uStack_80 = (uint *)((long)uStack_80 + 1);
          }
          cVar31 = (char)iVar45;
          iVar45 = iVar45 + 8;
          uVar43 = uVar43 | uVar22 << (0x38U - cVar31 & 0x3f);
        }
        bVar47 = uVar43 << (bVar5 & 0x3f);
        uVar24 = (int)(uVar43 >> (-bVar5 & 0x3f)) +
                 *(int *)(s_huge_match_base_len + (ulong)uVar39 * 4);
      }
    }
    uVar30 = (uint)(byte)CLZDecompBase::m_lzx_position_extra_bits[uStack_58._4_4_];
    if (uVar30 < 3) {
      while( true ) {
        if ((int)uVar30 <= (int)uVar29) break;
        if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
          psVar13 = &plVar40->m_codec;
          plVar40 = (lzham_decompressor *)p;
          if (psVar13->m_decode_buf_eof == false) {
            (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
            (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
            (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
            (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
            (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
            ((lzham_decompressor *)p)->m_match_len = uVar24;
            ((lzham_decompressor *)p)->m_match_slot = uStack_58._4_4_;
            ((lzham_decompressor *)p)->m_num_extra_bits = uVar30;
            ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
            ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
            ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
            ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
            ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
            ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
            goto LAB_0010c81d;
          }
LAB_0010e3cb:
          uVar43 = 0;
          p = plVar40;
          if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0010ffd7;
        }
        else {
LAB_0010ffd7:
          uVar43 = (ulong)(byte)*uStack_80;
          uStack_80 = (uint *)((long)uStack_80 + 1);
        }
        cVar31 = (char)uVar29;
        uVar29 = uVar29 + 8;
        bVar47 = bVar47 | uVar43 << (0x38U - cVar31 & 0x3f);
      }
      iVar45 = (int)(bVar47 >> (-(byte)uVar30 & 0x3f));
      if (uVar30 == 0) {
        iVar45 = 0;
      }
      bVar47 = bVar47 << ((byte)uVar30 & 0x3f);
      uVar29 = uVar29 - uVar30;
      iVar36 = iStack_8c;
    }
    else {
      uVar15 = 0;
      if (4 < (byte)CLZDecompBase::m_lzx_position_extra_bits[uStack_58._4_4_]) {
        while( true ) {
          iVar45 = uVar30 - 4;
          if (iVar45 <= (int)uVar29) break;
          if (uStack_80 == (uint *)(plVar40->m_codec).m_pDecode_buf_end) {
            psVar13 = &plVar40->m_codec;
            plVar40 = (lzham_decompressor *)p;
            if (psVar13->m_decode_buf_eof == false) {
              (((lzham_decompressor *)p)->m_codec).m_arith_value = uStack_84;
              (((lzham_decompressor *)p)->m_codec).m_arith_length = uStack_88;
              (((lzham_decompressor *)p)->m_codec).m_bit_buf = bVar47;
              (((lzham_decompressor *)p)->m_codec).m_bit_count = uVar29;
              (((lzham_decompressor *)p)->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              ((lzham_decompressor *)p)->m_match_len = uVar24;
              ((lzham_decompressor *)p)->m_match_slot = uStack_58._4_4_;
              ((lzham_decompressor *)p)->m_num_extra_bits = uVar30;
              ((lzham_decompressor *)p)->m_match_hist0 = iStack_8c;
              ((lzham_decompressor *)p)->m_match_hist1 = uStack_a0._4_4_;
              ((lzham_decompressor *)p)->m_match_hist2 = iStack_a4;
              ((lzham_decompressor *)p)->m_match_hist3 = (int)uStack_a0;
              ((lzham_decompressor *)p)->m_cur_state = (uint)uStack_68;
              ((lzham_decompressor *)p)->m_dst_ofs = (uint)uVar21;
              goto LAB_0010d298;
            }
LAB_0010e1fd:
            uVar43 = 0;
            p = plVar40;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) goto LAB_0011241e;
          }
          else {
LAB_0011241e:
            uVar43 = (ulong)(byte)*uStack_80;
            uStack_80 = (uint *)((long)uStack_80 + 1);
          }
          cVar31 = (char)uVar29;
          uVar29 = uVar29 + 8;
          bVar47 = bVar47 | uVar43 << (0x38U - cVar31 & 0x3f);
        }
        uVar15 = (int)(bVar47 >> (0x44U - (char)uVar30 & 0x3f)) << 4;
        if (iVar45 == 0) {
          uVar15 = 0;
        }
        bVar47 = bVar47 << ((byte)iVar45 & 0x3f);
        uVar29 = uVar29 - iVar45;
      }
      pqVar37 = &plVar40->m_dist_lsb_table;
      pdVar26 = (plVar40->m_dist_lsb_table).m_pDecode_tables;
      if ((int)uVar29 < 0x18) {
        if (uStack_80 + 1 < (plVar40->m_codec).m_pDecode_buf_end) {
          uVar30 = *uStack_80;
          uVar29 = uVar29 + 0x20;
          bVar47 = bVar47 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                    (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                            (-(char)uVar29 & 0x3fU);
          uStack_80 = uStack_80 + 1;
        }
        else {
          uStack_6c = (uint)uVar21;
          for (; (int)uVar29 < 0x18; uVar29 = uVar29 + 8) {
            if ((plVar40->m_codec).m_decode_buf_eof == false) {
              (plVar40->m_codec).m_pSaved_huff_model = pqVar37;
              (plVar40->m_codec).m_arith_value = uStack_84;
              (plVar40->m_codec).m_arith_length = uStack_88;
              (plVar40->m_codec).m_bit_buf = bVar47;
              (plVar40->m_codec).m_bit_count = uVar29;
              (plVar40->m_codec).m_pDecode_buf_next = (uint8 *)uStack_80;
              plVar40->m_match_len = uVar24;
              plVar40->m_match_slot = uStack_58._4_4_;
              plVar40->m_extra_bits = uVar15;
              plVar40->m_match_hist0 = iStack_8c;
              plVar40->m_match_hist1 = uStack_a0._4_4_;
              plVar40->m_match_hist2 = iStack_a4;
              plVar40->m_match_hist3 = (int)uStack_a0;
              plVar40->m_cur_state = (uint)uStack_68;
              plVar40->m_dst_ofs = uStack_6c;
              p = plVar40;
              goto LAB_0010ee33;
            }
LAB_0010ed88:
            uVar43 = 0;
            if (uStack_80 < (plVar40->m_codec).m_pDecode_buf_end) {
              uVar43 = (ulong)(byte)*uStack_80;
              uStack_80 = (uint *)((long)uStack_80 + 1);
            }
            bVar47 = bVar47 | uVar43 << (0x38U - (char)uVar29 & 0x3f);
          }
          uVar21 = (ulong)uStack_6c;
        }
      }
      uVar30 = (uint)(ushort)(bVar47 >> 0x30);
      if (uVar30 < pdVar26->m_table_max_code) {
        uVar39 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] & 0xffff;
        uVar30 = pdVar26->m_lookup[bVar47 >> (-(char)pdVar26->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar45 = pdVar26->m_decode_start_code_size - 0x41;
        do {
          iVar36 = iVar45;
          iVar45 = iVar36 + 1;
        } while (pdVar26->m_max_codes[iVar36 + 0x40U] <= uVar30);
        uVar39 = (int)(bVar47 >> (-(char)(iVar36 + 1) & 0x3fU)) +
                 pdVar26->m_val_ptrs[iVar36 + 0x40U];
        uVar30 = 0;
        if (uVar39 < pqVar37->m_total_syms) {
          uVar30 = uVar39;
        }
        uVar39 = (uint)pdVar26->m_sorted_symbol_order[(int)uVar30];
        uVar30 = iVar36 + 0x41;
      }
      bVar47 = bVar47 << ((byte)uVar30 & 0x3f);
      puVar4 = (pqVar37->m_sym_freq).m_p + uVar39;
      *puVar4 = *puVar4 + 1;
      puVar1 = &pqVar37->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        plVar40 = (lzham_decompressor *)p;
        quasi_adaptive_huffman_data_model::update_tables(pqVar37,-1,false);
        p = plVar40;
      }
      iVar45 = uVar39 + uVar15;
      uVar29 = uVar29 - uVar30;
      iVar36 = iStack_8c;
    }
    iStack_8c = iVar45 + *(int *)(CLZDecompBase::m_lzx_position_base + (ulong)uStack_58._4_4_ * 4);
    uVar15 = (uint)(6 < (uint)uStack_68) * 3 + 7;
    uStack_a0._0_4_ = iStack_a4;
    iStack_a4 = uStack_a0._4_4_;
    uStack_a0._4_4_ = iVar36;
    goto LAB_0011199f;
  }
  uVar15 = 0;
  if (uVar30 != 0) {
    uStack_a0._0_4_ = 1;
    iStack_a4 = 1;
    uStack_a0._4_4_ = 1;
    iStack_8c = 1;
    goto LAB_0010f3d4;
  }
  if ((uVar29 & 7) != 0) goto LAB_00112600;
  goto LAB_00112619;
}

Assistant:

lzham_decompress_status_t LZHAM_CDECL lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            // In unbuffered mode, the caller is not allowed to move the output buffer and the output pointer MUST always point to the beginning of the output buffer.
            // Also, the output buffer size must indicate the full size of the output buffer. The decompressor will track the current output offset, and during partial/sync
            // flushes it'll report how many bytes it has written since the call. 
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();
      
      return status;
   }